

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void av1_rd_pick_inter_mode
               (AV1_COMP *cpi,TileDataEnc *tile_data,macroblock *x,RD_STATS *rd_cost,
               BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,int64_t best_rd_so_far)

{
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  CANDIDATE_MV (*paCVar1) [8];
  MV_REFERENCE_FRAME *pMVar2;
  CANDIDATE_MV *pCVar3;
  CANDIDATE_MV *pCVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  uint8_t uVar8;
  byte bVar9;
  REFERENCE_MODE RVar10;
  MODE MVar11;
  byte bVar12;
  PREDICTION_MODE PVar13;
  _Bool _Var14;
  _Bool _Var15;
  ushort uVar16;
  InterModesInfo *pIVar17;
  AV1_PRIMARY *pAVar18;
  TplDepFrame *pTVar19;
  TplDepStats *pTVar20;
  SequenceHeader *pSVar21;
  inter_modes_info *piVar22;
  int aiVar23 [2];
  MB_MODE_INFO *pMVar24;
  WinnerModeStats *pWVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  CANDIDATE_MV CVar30;
  CANDIDATE_MV CVar31;
  CANDIDATE_MV CVar32;
  AV1_COMMON *pAVar33;
  macroblockd_plane *pmVar34;
  PICK_MODE_CONTEXT *pPVar35;
  MB_MODE_INFO_EXT *pMVar36;
  ModeCosts *mode_costs;
  uint16_t (*pauVar37) [8];
  CANDIDATE_MV (*paCVar38) [8];
  BLOCK_SIZE BVar39;
  byte bVar40;
  byte bVar41;
  int8_t iVar42;
  InterpFilter IVar43;
  THR_MODES TVar44;
  byte bVar45;
  char cVar46;
  byte bVar47;
  int16_t iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  uint32_t uVar54;
  int_mv iVar55;
  int_mv iVar56;
  uint8_t *src;
  long lVar57;
  byte *pbVar58;
  YV12_BUFFER_CONFIG *pYVar59;
  long lVar60;
  RefCntBuffer *pRVar61;
  uint8_t *puVar62;
  MB_MODE_INFO *pMVar63;
  uint8_t *puVar64;
  MV_REFERENCE_FRAME *pMVar65;
  undefined4 *puVar66;
  void *pvVar67;
  undefined7 uVar75;
  undefined4 extraout_var;
  scale_factors *psVar68;
  int (*paiVar69) [8];
  int64_t iVar70;
  buf_2d *pbVar71;
  THR_MODES *pTVar72;
  int64_t *piVar73;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var74;
  BLOCK_SIZE bsize_00;
  bool bVar76;
  char cVar77;
  uint uVar78;
  undefined1 *puVar79;
  uint8_t *puVar80;
  int32_t *piVar81;
  MB_MODE_INFO *pMVar82;
  uint *puVar83;
  int **mvcost;
  ulong uVar84;
  undefined2 uVar85;
  uint uVar86;
  undefined1 *puVar87;
  YV12_BUFFER_CONFIG *src_00;
  int32_t *piVar88;
  undefined4 *puVar89;
  MB_MODE_INFO *pMVar90;
  MvCosts *mvjcost;
  uint16_t *puVar91;
  int ref_mv_idx;
  YV12_BUFFER_CONFIG *src_01;
  undefined4 *puVar92;
  ulong uVar93;
  aom_variance_fn_t *pp_Var94;
  int_mv *piVar95;
  size_t sVar96;
  int aiVar97 [2];
  WinnerModeStats *pWVar98;
  int aiVar99 [2];
  int skip_rd [2];
  uint uVar100;
  uint uVar101;
  int iVar102;
  ulong uVar103;
  long lVar104;
  MB_MODE_INFO **ppMVar105;
  int *piVar106;
  int_interpfilters *piVar107;
  byte bVar108;
  long lVar109;
  byte *pbVar110;
  int *piVar111;
  undefined4 *puVar112;
  AV1_COMP *pAVar113;
  uint16_t *puVar114;
  undefined7 in_register_00000081;
  MB_MODE_INFO **ppMVar115;
  MB_MODE_INFO **ppMVar116;
  int (*paiVar117) [8];
  int iVar118;
  MB_MODE_INFO *pMVar119;
  RD_STATS *pRVar120;
  RD_STATS *rd_cost_uv;
  byte *pbVar121;
  long lVar122;
  aom_variance_fn_t *pp_Var123;
  int ref_frame_2;
  ulong uVar124;
  int i;
  ulong uVar125;
  long lVar126;
  int col_5;
  int iVar127;
  int iVar128;
  MV_REFERENCE_FRAME ref_frame_3;
  uint8_t uVar129;
  int32_t *__s;
  long lVar130;
  ulong uVar131;
  ulong uVar132;
  AV1_COMP *pAVar133;
  AV1_COMP *cpi_00;
  NN_CONFIG *pNVar134;
  bool bVar135;
  undefined4 uVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  AV1_COMP *pAVar140;
  macroblock_plane *p;
  long local_6270;
  int local_6250 [2];
  int_mv (*local_6240) [2];
  ulong local_6238;
  uint local_6228;
  int rate_mv;
  uint local_620c;
  uint8_t *local_6208;
  BLOCK_SIZE (*local_6200) [2] [2];
  scale_factors *local_61f8;
  uint8_t *local_61f0;
  MB_MODE_INFO *local_61e8;
  int (*local_61e0) [8];
  int local_61d4;
  ulong local_61d0;
  MB_MODE_INFO *local_61c8;
  undefined8 local_61c0;
  char local_61b3;
  byte local_61b2;
  int8_t local_61b1;
  aom_variance_fn_t *local_61b0;
  uint8_t *local_61a8;
  int_mv cur_mv_1 [2];
  int ref_mv_match [2];
  uint8_t *puStack_6190;
  uint8_t *local_6188;
  long lStack_6180;
  ulong local_6178;
  MB_MODE_INFO *local_6168;
  long local_6160;
  MB_MODE_INFO *local_6158;
  MB_MODE_INFO *local_6150;
  uint8_t *local_6148;
  ulong local_6140;
  uint local_6134;
  ulong local_6130;
  ulong local_6128;
  int local_6120 [2];
  ulong local_6118;
  uint local_6110;
  undefined4 uStack_610c;
  PICK_MODE_CONTEXT *local_6108;
  MB_MODE_INFO *local_6100;
  ulong local_60f8;
  long local_60f0;
  int_mv single_mv;
  int iStack_60e4;
  uint8_t *puStack_60e0;
  uint8_t *puStack_60d8;
  undefined8 local_60d0;
  int local_60c8;
  undefined4 uStack_60c4;
  long local_60c0;
  long local_60b8;
  int (*local_60b0) [2];
  MB_MODE_INFO_EXT *local_60a8;
  int local_60a0 [2];
  int_interpfilters *local_6098;
  uint8_t *local_6090;
  int local_6084;
  int local_6080;
  int skip_build_pred;
  RD_STATS local_6078;
  int *local_6048;
  int16_t *local_6040;
  int ref_searched [2];
  undefined1 auStack_6030 [16];
  undefined8 local_6020;
  ulong local_6018;
  buf_2d *local_5ff0;
  int local_5fe4;
  int local_5fe0;
  int is_luma_interp_done;
  ulong local_5fd8;
  uint16_t (*local_5fd0) [4];
  int64_t rd;
  uint8_t *local_5fc0;
  ModeCosts *local_5fb8;
  ulong local_5fb0;
  int_mv *local_5fa8;
  uint16_t (*local_5fa0) [8];
  CANDIDATE_MV (*local_5f98) [8];
  int local_5f90 [2];
  int local_5f84;
  int local_5f80;
  int rs;
  MV_REFERENCE_FRAME refs_1 [2];
  undefined6 uStack_5f76;
  long lStack_5f70;
  long local_5f68;
  int64_t iStack_5f60;
  uint8_t local_5f58;
  undefined7 uStack_5f57;
  int local_5f48 [2];
  int64_t best_est_rd;
  BUFFER_SET tmp_dst;
  int local_5ef8 [2];
  uint8_t *puStack_5ef0;
  MV_REFERENCE_FRAME single_refs [2];
  undefined6 uStack_5ee6;
  int64_t iStack_5ee0;
  int64_t local_5ed8;
  int64_t iStack_5ed0;
  uint8_t local_5ec8;
  undefined7 uStack_5ec7;
  RD_STATS rd_stats_y;
  int_mv save_mv [2] [2];
  RD_STATS rd_stats_uv;
  RD_STATS this_rd_cost;
  mode_skip_mask_t mode_skip_mask;
  int64_t ref_frame_rd [8];
  PruneInfoFromTpl inter_cost_info_from_tpl;
  RD_STATS best_rd_stats_uv;
  INTERINTRA_MODE interintra_modes [8];
  uint ref_costs_single [8];
  int dst_width1 [3];
  float fStack_5bdc;
  undefined8 local_5bd0;
  undefined1 local_5bc8 [16];
  int64_t local_5bb8;
  undefined8 auStack_5818 [6];
  int dst_width2 [3];
  undefined4 uStack_57dc;
  uint8_t *local_57d0;
  int local_57c8;
  undefined4 uStack_57c4;
  buf_2d yv12_mb [8] [3];
  undefined1 local_50e0 [26];
  byte local_50c6;
  int_mv local_50c0 [2];
  char local_50b8;
  char local_50b7;
  byte local_5038;
  byte local_5037;
  TX_SIZE local_5036 [4];
  TX_SIZE aTStack_5032 [4];
  TX_SIZE aTStack_502e [4];
  TX_SIZE aTStack_502a [9];
  ushort local_5021;
  RD_STATS local_5018;
  undefined4 local_4ff0;
  undefined4 uStack_4fec;
  undefined4 uStack_4fe8;
  undefined4 uStack_4fe4;
  undefined4 local_4fe0;
  undefined4 uStack_4fdc;
  undefined4 uStack_4fd8;
  undefined4 uStack_4fd4;
  undefined4 local_4fd0;
  undefined4 uStack_4fcc;
  undefined4 uStack_4fc8;
  undefined4 uStack_4fc4;
  int local_4fc0;
  int iStack_4fbc;
  int iStack_4fb8;
  int iStack_4fb4;
  int local_4fb0;
  int iStack_4fac;
  int iStack_4fa8;
  int iStack_4fa4;
  long alStack_4fa0 [7];
  long alStack_4f68 [21];
  long alStack_4ec0 [141];
  uint8_t *local_4a58;
  uint local_4a50;
  long local_4a48 [3];
  int_mv local_4a30 [24];
  int local_49d0 [24];
  int local_4970 [24];
  byte local_4910 [64];
  byte local_48d0 [3712];
  undefined8 auStack_3a50 [128];
  byte local_3650 [64];
  byte local_3610 [2432];
  undefined1 local_2c90 [768];
  undefined1 local_2990 [776];
  long lStack_2688;
  char acStack_2680 [4];
  undefined4 local_267c [133];
  long lStack_2468;
  char acStack_2460 [4];
  undefined4 local_245c [51];
  long alStack_2390 [7];
  byte abStack_2358 [8];
  byte abStack_2350 [16];
  byte local_2340 [4];
  aom_variance_fn_t local_233c [2];
  undefined4 local_232c [25];
  long alStack_22c8 [41];
  int aiStack_217c [13];
  int local_2148 [4];
  undefined1 local_2138 [16];
  long local_2128;
  byte local_2120 [4];
  int local_211c [4];
  undefined4 local_210c [25];
  long alStack_20a8 [41];
  int aiStack_1f5c [8];
  char local_1f3c [20];
  int local_1f28 [4];
  int local_1f18 [4];
  undefined1 local_1f08 [36];
  int32_t iStack_1ee4;
  uint8_t auStack_1ee0 [32];
  uint8_t *puStack_1ec0;
  undefined8 local_1eb8;
  uint16_t auStack_1eb0 [40];
  uint8_t local_1e60;
  HandleInterModeArgs local_1e58;
  uint ref_costs_comp [8] [8];
  motion_mode_best_st_candidate best_motion_mode_cands;
  
  local_6140 = CONCAT71(in_register_00000081,bsize);
  local_60f0 = CONCAT71(local_60f0._1_7_,((cpi->common).seq_params)->monochrome);
  xd = &x->e_mbd;
  local_6168 = *(x->e_mbd).mi;
  local_6108 = ctx;
  local_6098 = (int_interpfilters *)tile_data;
  iVar49 = av1_get_reference_mode_context(xd);
  auStack_1ee0[8] = '\0';
  auStack_1ee0[9] = '\0';
  auStack_1ee0[10] = '\0';
  auStack_1ee0[0xb] = '\0';
  auStack_1ee0[0xc] = '\0';
  auStack_1ee0[0xd] = 0;
  auStack_1ee0[0xe] = 0;
  auStack_1ee0[0xf] = 0;
  auStack_1eb0[0xc] = 0;
  auStack_1eb0[0xd] = 0;
  auStack_1eb0[0xe] = 0;
  auStack_1eb0[0xf] = 0;
  auStack_1eb0[0x10] = 0;
  auStack_1eb0[0x11] = 0;
  auStack_1eb0[0x12] = 0;
  auStack_1eb0[0x13] = 0;
  auStack_1eb0[4] = 0;
  auStack_1eb0[5] = 0;
  auStack_1eb0[6] = 0;
  auStack_1eb0[7] = 0;
  auStack_1eb0[8] = 0;
  auStack_1eb0[9] = 0;
  auStack_1eb0[10] = 0;
  auStack_1eb0[0xb] = 0;
  local_1eb8._0_1_ = '\0';
  local_1eb8._1_1_ = '\0';
  local_1eb8._2_1_ = '\0';
  local_1eb8._3_1_ = '\0';
  local_1eb8._4_4_ = 0;
  auStack_1eb0[0] = 0;
  auStack_1eb0[1] = 0;
  auStack_1eb0[2] = 0;
  auStack_1eb0[3] = 0;
  auStack_1eb0[0x14] = 0;
  auStack_1eb0[0x15] = 0;
  auStack_1eb0[0x16] = 0;
  auStack_1eb0[0x17] = 0;
  auStack_1ee0._24_8_ = 0;
  puStack_1ec0 = (uint8_t *)0x0;
  local_1f08[0x20] = '\0';
  local_1f08._33_3_ = 0;
  iStack_1ee4 = 0;
  auStack_1ee0[0] = '\0';
  auStack_1ee0[1] = '\0';
  auStack_1ee0[2] = '\0';
  auStack_1ee0[3] = '\0';
  auStack_1ee0[4] = '\0';
  auStack_1ee0[5] = '\0';
  auStack_1ee0[6] = '\0';
  auStack_1ee0[7] = '\0';
  auStack_1ee0._16_8_ = 0x7fffffff00000000;
  auStack_1eb0[0x18] = 0xffff;
  auStack_1eb0[0x19] = 0x7fff;
  auStack_1eb0[0x1c] = 0xffff;
  auStack_1eb0[0x1d] = 0xffff;
  auStack_1eb0[0x1e] = 0xffff;
  auStack_1eb0[0x1f] = 0x7fff;
  auStack_1eb0[0x20] = 0xffff;
  auStack_1eb0[0x21] = 0xffff;
  auStack_1eb0[0x22] = 0xffff;
  auStack_1eb0[0x23] = 0x7fff;
  auStack_1eb0[0x24] = 0xffff;
  auStack_1eb0[0x25] = 0xffff;
  auStack_1eb0[0x26] = 0xffff;
  auStack_1eb0[0x27] = 0x7fff;
  local_1e60 = '\0';
  auStack_1eb0[0x1a] = 0;
  auStack_1eb0[0x1b] = 0;
  local_50e0._0_8_ = best_rd_so_far;
  local_50e0._8_4_ = -1;
  local_50e0._12_4_ = 0x7fffffff;
  local_50e0._16_8_ = (uint8_t *)0x7fffffffffffffff;
  memset(local_50e0 + 0x18,0,0xb0);
  uVar124 = local_6140;
  local_5018.rate = 0x7fffffff;
  local_5018.zero_rate = 0x7fffffff;
  local_5018.dist = 0;
  local_5018.rdcost._0_1_ = 0xff;
  uVar16 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7;
  local_5018.rdcost._4_4_ = 0;
  local_4fb0 = -1;
  iStack_4fac = -1;
  iStack_4fa8 = -1;
  iStack_4fa4 = -1;
  local_4fc0 = -1;
  iStack_4fbc = -1;
  iStack_4fb8 = -1;
  iStack_4fb4 = -1;
  local_4fd0 = 0xffffffff;
  uStack_4fcc = 0xffffffff;
  uStack_4fc8 = 0xffffffff;
  uStack_4fc4 = 0xffffffff;
  local_4fe0 = 0xffffffff;
  uStack_4fdc = 0xffffffff;
  uStack_4fd8 = 0xffffffff;
  uStack_4fd4 = 0xffffffff;
  local_4ff0 = 0xffffffff;
  uStack_4fec = 0xffffffff;
  uStack_4fe8 = 0xffffffff;
  uStack_4fe4 = 0xffffffff;
  local_5018.sse._0_4_ = 0xffffffff;
  local_5018.sse._4_4_ = 0xffffffff;
  local_5018.skip_txfm = 0xff;
  local_5018._33_3_ = 0xffffff;
  local_5018._36_4_ = 0xffffffff;
  for (lVar57 = 0x28; lVar57 != 0x2f; lVar57 = lVar57 + 1) {
    *(undefined8 *)(local_50e0 + lVar57 * 8) = 0;
  }
  cm = &cpi->common;
  uVar78 = uVar16 & 7;
  uVar103 = local_6140 & 0xff;
  for (lVar57 = 0; lVar57 != 0x54; lVar57 = lVar57 + 4) {
    *(long *)((long)alStack_4f68 + lVar57 * 2) =
         (long)*(int *)((long)x->thresh_freq_fact[uVar103] + lVar57 + 0x1c) *
         (long)*(int *)((long)(cpi->rd).threshes[uVar78][uVar103] + lVar57 + 0x1c) >> 5;
  }
  local_4a58 = (uint8_t *)0x7fffffffffffffff;
  local_4a50 = 0xffffffff;
  memset(local_4a30,0,0x120);
  puVar79 = local_2c90;
  for (lVar57 = 0xd; lVar57 != 0x11; lVar57 = lVar57 + 1) {
    puVar87 = puVar79;
    for (lVar104 = 0; lVar104 != 3; lVar104 = lVar104 + 1) {
      for (lVar109 = 0; lVar109 != 8; lVar109 = lVar109 + 1) {
        *(undefined8 *)(puVar87 + lVar109 * 8 + -0x12c0) = 0x7fffffffffffffff;
        *(undefined8 *)(puVar87 + lVar109 * 8) = 0x7fffffffffffffff;
      }
      puVar87 = puVar87 + 0x40;
    }
    puVar79 = puVar79 + 0xc0;
  }
  for (lVar57 = 0xd3; lVar57 != 0xd6; lVar57 = lVar57 + 1) {
    *(undefined8 *)(local_50e0 + lVar57 * 8) = 0x7fffffffffffffff;
  }
  if ((cpi->common).current_frame.reference_mode != '\0') {
    for (lVar57 = 0; lVar57 != 0x80; lVar57 = lVar57 + 1) {
      alStack_4ec0[lVar57] =
           (long)x->thresh_freq_fact[uVar103][lVar57 + 0x1c] *
           (long)(cpi->rd).threshes[uVar78][uVar103][lVar57 + 0x1c] >> 5;
    }
    puVar79 = local_2990;
    for (lVar57 = 0x11; lVar57 != 0x19; lVar57 = lVar57 + 1) {
      puVar87 = puVar79;
      for (lVar104 = 0; lVar104 != 3; lVar104 = lVar104 + 1) {
        for (lVar109 = 0; lVar109 != 8; lVar109 = lVar109 + 1) {
          *(undefined8 *)(puVar87 + lVar109 * 8 + -0x12c0) = 0x7fffffffffffffff;
          *(undefined8 *)(puVar87 + lVar109 * 8) = 0x7fffffffffffffff;
        }
        puVar87 = puVar87 + 0x40;
      }
      puVar79 = puVar79 + 0xc0;
    }
    pbVar58 = local_2120;
    puVar79 = local_1f08;
    for (lVar57 = 0; lVar57 != 2; lVar57 = lVar57 + 1) {
      pbVar110 = pbVar58;
      puVar87 = puVar79;
      for (lVar104 = 0; lVar104 != 4; lVar104 = lVar104 + 1) {
        pbVar121 = pbVar110;
        for (lVar109 = 0; lVar109 != 4; lVar109 = lVar109 + 1) {
          pbVar121[-0x220] = 0xff;
          pbVar121[-0x228] = 0xff;
          pbVar121[-0x227] = 0xff;
          pbVar121[-0x226] = 0xff;
          pbVar121[-0x225] = 0xff;
          pbVar121[-0x224] = 0xff;
          pbVar121[-0x223] = 0xff;
          pbVar121[-0x222] = 0xff;
          pbVar121[-0x221] = 0x7f;
          *pbVar121 = 0xff;
          pbVar121[-8] = 0xff;
          pbVar121[-7] = 0xff;
          pbVar121[-6] = 0xff;
          pbVar121[-5] = 0xff;
          pbVar121[-4] = 0xff;
          pbVar121[-3] = 0xff;
          pbVar121[-2] = 0xff;
          pbVar121[-1] = 0x7f;
          puVar87[lVar109] = 0xff;
          pbVar121 = pbVar121 + 0x10;
        }
        puVar87 = puVar87 + 4;
        pbVar110 = pbVar110 + 0x40;
      }
      puVar79 = puVar79 + 0x10;
      pbVar58 = pbVar58 + 0x100;
    }
    for (lVar57 = -8; lVar57 != 0; lVar57 = lVar57 + 1) {
      pbVar58 = abStack_2350 + lVar57 * 8;
      pbVar58[0] = 0xff;
      pbVar58[1] = 0xff;
      pbVar58[2] = 0xff;
      pbVar58[3] = 0xff;
      pbVar58[4] = 0xff;
      pbVar58[5] = 0xff;
      pbVar58[6] = 0xff;
      pbVar58[7] = 0x7f;
      abStack_2350[lVar57 + 8] = 0x19;
    }
    local_2138._0_4_ = 0;
    local_2138._4_4_ = 0;
    local_2138._8_4_ = 0;
    local_2138._12_4_ = 0;
    local_2148[0] = 0;
    local_2148[1] = 0;
    local_2148[2] = 0;
    local_2148[3] = 0;
    local_1f18[0] = 0;
    local_1f18[1] = 0;
    local_1f18[2] = 0;
    local_1f18[3] = 0;
    local_1f28[0] = 0;
    local_1f28[1] = 0;
    local_1f28[2] = 0;
    local_1f28[3] = 0;
  }
  builtin_memcpy(interintra_modes,"\x04\x04\x04\x04\x04\x04\x04\x04",8);
  local_60a0 = (int  [2])((ulong)local_60a0 & 0xffffffff00000000);
  pAVar113 = cpi;
  memset(&local_1e58,0,0x1550);
  local_1e58.above_pred_stride[0] = 0x80;
  local_1e58.above_pred_stride[1] = 0x80;
  local_1e58.above_pred_stride[2] = 0x80;
  local_1e58.left_pred_stride[0] = 0x40;
  local_1e58.left_pred_stride[1] = 0x40;
  local_1e58.left_pred_stride[2] = 0x40;
  local_1e58.modelled_rd = (int64_t (*) [3] [8])local_4910;
  local_1e58.ref_frame_cost = 0x7fffffff;
  local_1e58.single_comp_cost = 0x7fffffff;
  local_1e58.simple_rd = (int64_t (*) [3] [8])local_3650;
  local_1e58.inter_intra_mode = interintra_modes;
  memset(local_1e58.interp_filter_stats,0,0x1400);
  local_1e58.wedge_index = -1;
  local_1e58.wedge_sign = -1;
  local_1e58.diffwtd_index = -1;
  local_1e58.best_pred_sse = 0xffffffff;
  bsize_00 = (BLOCK_SIZE)uVar124;
  if ((((cpi->sf).part_sf.partition_search_type == '\x02') &&
      ((cpi->sf).rt_sf.short_circuit_low_temp_var != 0)) &&
     ((cpi->sf).rt_sf.prune_inter_modes_using_temp_var != 0)) {
    iVar50 = (x->e_mbd).mi_row;
    iVar51 = (x->e_mbd).mi_col;
    puVar64 = (x->part_search_info).variance_low;
    if (((pAVar113->common).seq_params)->sb_size == BLOCK_64X64) {
      iVar50 = av1_get_force_skip_low_temp_var_small_sb(puVar64,iVar50,iVar51,bsize_00);
    }
    else {
      iVar50 = av1_get_force_skip_low_temp_var(puVar64,iVar50,iVar51,bsize_00);
    }
    local_60a0[0] = iVar50;
  }
  for (lVar57 = 0x52e; lVar57 != 0x54b; lVar57 = lVar57 + 1) {
    *(undefined4 *)((long)local_1e58.above_pred_buf + lVar57 * 4) = 0xffffffff;
  }
  local_6110 = num_winner_motion_modes[(pAVar113->sf).winner_mode_sf.motion_mode_for_winner_cand];
  uStack_610c = 0;
  best_motion_mode_cands.num_motion_mode_cand = 0;
  for (lVar57 = 0xc0; lVar57 != 0x890; lVar57 = lVar57 + 200) {
    *(undefined8 *)((long)best_motion_mode_cands.motion_mode_cand[0].mbmi.mv + lVar57 + -8) =
         0x7fffffffffffffff;
  }
  for (lVar57 = 0x9598; lVar57 != 0x95a0; lVar57 = lVar57 + 1) {
    *(undefined4 *)((long)&x->plane[0].src_diff + lVar57 * 4) = 0x7fffffff;
  }
  rd_cost->rate = 0x7fffffff;
  rd_cost->zero_rate = 0;
  rd_cost->dist = 0x7fffffffffffffff;
  rd_cost->rdcost = 0x7fffffffffffffff;
  rd_cost->sse = 0x7fffffffffffffff;
  rd_cost->skip_txfm = '\0';
  for (lVar57 = 0x15de0; lVar57 != 0x16200; lVar57 = lVar57 + 0x84) {
    *(undefined4 *)((long)&x->plane[0].src_diff + lVar57) = 0xffffffff;
  }
  iVar50 = (pAVar113->sf).inter_sf.prune_ref_frame_for_rect_partitions;
  if (iVar50 == 0) {
LAB_001efd05:
    uVar78 = 0;
  }
  else {
    if (1 < local_6168->partition - 1) {
      if (local_6168->partition != 0) goto LAB_001efc7c;
      goto LAB_001efd05;
    }
    if (iVar50 < 2) goto LAB_001efd05;
LAB_001efc7c:
    uVar125 = (long)((pAVar113->common).seq_params)->mib_size - 1;
    lVar57 = (long)(int)((x->e_mbd).mi_row & (uint)uVar125);
    uVar125 = (long)(x->e_mbd).mi_col & uVar125;
    lVar104 = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar103] + lVar57;
    piVar111 = x->picked_ref_frames_mask + lVar57 * 0x20;
    uVar78 = 0;
    for (; uVar84 = uVar125, lVar57 < lVar104; lVar57 = lVar57 + 1) {
      for (; (long)uVar84 <
             (long)((long)(int)uVar125 +
                   (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [uVar103]); uVar84 = uVar84 + 1) {
        uVar78 = uVar78 | piVar111[uVar84];
      }
      piVar111 = piVar111 + 0x20;
    }
    if (uVar78 == 0) goto LAB_001efd05;
    uVar78 = ~uVar78;
  }
  local_6200 = (BLOCK_SIZE (*) [2] [2])CONCAT44(local_6200._4_4_,uVar78);
  local_6100 = *(x->e_mbd).mi;
  uVar16 = *(ushort *)&local_6100->field_0xa7;
  puVar64 = (x->obmc_buffer).above_pred;
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    local_1e58.above_pred_buf[1] = puVar64 + 0x2000;
    local_1e58.above_pred_buf[2] = puVar64 + 0x4000;
    local_1e58.left_pred_buf[0] = (x->obmc_buffer).left_pred;
    local_1e58.left_pred_buf[1] = local_1e58.left_pred_buf[0] + 0x2000;
    local_1e58.left_pred_buf[2] = local_1e58.left_pred_buf[0] + 0x4000;
    local_1e58.above_pred_buf[0] = puVar64;
  }
  else {
    local_1e58.above_pred_buf[0] = (uint8_t *)((ulong)puVar64 >> 1);
    local_1e58.above_pred_buf[1] = (uint8_t *)((ulong)(puVar64 + 0x4000) >> 1);
    local_1e58.above_pred_buf[2] = (uint8_t *)((ulong)(puVar64 + 0x8000) >> 1);
    puVar64 = (x->obmc_buffer).left_pred;
    local_1e58.left_pred_buf[0] = (uint8_t *)((ulong)puVar64 >> 1);
    local_1e58.left_pred_buf[1] = (uint8_t *)((ulong)(puVar64 + 0x4000) >> 1);
    local_1e58.left_pred_buf[2] = (uint8_t *)((ulong)(puVar64 + 0x8000) >> 1);
  }
  local_60a8 = &x->mbmi_ext;
  av1_collect_neighbors_ref_counts(xd);
  local_5fb8 = &x->mode_costs;
  estimate_ref_frame_costs(cm,xd,local_5fb8,uVar16 & 7,ref_costs_single,ref_costs_comp);
  iVar50 = (x->e_mbd).mi_row;
  local_61a8 = (uint8_t *)CONCAT44(local_61a8._4_4_,(x->e_mbd).mi_col);
  x->best_pred_mv_sad[0] = 0x7fffffff;
  x->best_pred_mv_sad[1] = 0x7fffffff;
  local_6040 = (x->mbmi_ext).mode_context;
  local_6090 = (x->mbmi_ext).ref_mv_count;
  local_5f98 = (x->e_mbd).ref_mv_stack;
  local_5fa0 = (x->e_mbd).weight;
  local_5fa8 = (x->mbmi_ext).global_mvs;
  local_5fd0 = (x->mbmi_ext).weight;
  lVar57 = 0x60;
  local_6270 = 0;
  lVar104 = 0;
  uVar78 = (uint)local_6200;
  while (lVar104 != 7) {
    lVar109 = lVar104 + 1;
    x->pred_mv_sad[lVar104 + 1] = 0x7fffffff;
    x->cb_offset[lVar104 + -0x2f] = 0;
    (x->mbmi_ext).ref_mv_count[lVar104 + 1] = 0xff;
    if ((pAVar113->ref_frame_flags & (uint)""[lVar104 + 1]) == 0) {
LAB_001f00ca:
      if ((((pAVar113->sf).inter_sf.alt_ref_search_fp != 0) ||
          ((pAVar113->sf).inter_sf.prune_single_ref != 0)) ||
         ((pAVar113->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad != 0)) {
        iVar51 = x->pred_mv_sad[lVar104 + 1];
        if ((pAVar113->ref_frame_dist_info).ref_relative_dist[lVar104] < 0) {
          if (x->best_pred_mv_sad[0] < iVar51) {
            iVar51 = x->best_pred_mv_sad[0];
          }
          x->best_pred_mv_sad[0] = iVar51;
        }
        else {
          if (x->best_pred_mv_sad[1] < iVar51) {
            iVar51 = x->best_pred_mv_sad[1];
          }
          x->best_pred_mv_sad[1] = iVar51;
        }
      }
    }
    else {
      uVar53 = (uint)lVar109;
      pAVar140 = pAVar113;
      if (((uVar78 >> (uVar53 & 0x1f) & 1) == 0) ||
         (iVar51 = is_ref_frame_used_by_compound_ref(uVar53,uVar78), pAVar140 = pAVar113,
         iVar51 != 0)) {
LAB_001eff2a:
        uVar8 = ((pAVar140->common).seq_params)->monochrome;
        pAVar113 = pAVar140;
        pYVar59 = av1_get_scaled_ref_frame(pAVar140,uVar53);
        pMVar63 = *(x->e_mbd).mi;
        local_61f8 = get_ref_scale_factors_const(cm,(MV_REFERENCE_FRAME)lVar109);
        lVar60 = (long)(pAVar140->common).remapped_ref_idx[lVar104];
        if (lVar60 == -1) {
          pRVar61 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar61 = (pAVar140->common).ref_frame_map[lVar60];
        }
        iVar51 = (uint)(uVar8 == '\0') * 2 + 1;
        src_01 = &pRVar61->buf;
        if (pRVar61 == (RefCntBuffer *)0x0) {
          src_01 = (YV12_BUFFER_CONFIG *)0x0;
        }
        pbVar71 = (buf_2d *)((long)&yv12_mb[0][0].buf + lVar57);
        src_00 = src_01;
        psVar68 = local_61f8;
        if (pYVar59 != (YV12_BUFFER_CONFIG *)0x0) {
          src_00 = pYVar59;
          psVar68 = (scale_factors *)0x0;
        }
        av1_setup_pred_block(xd,pbVar71,src_00,psVar68,psVar68,iVar51);
        av1_find_mv_refs(cm,xd,pMVar63,(MV_REFERENCE_FRAME)lVar109,local_6090,local_5f98,local_5fa0,
                         (int_mv (*) [2])0x0,local_5fa8,local_6040);
        (x->mbmi_ext).weight[lVar104 + 1] =
             *(uint16_t (*) [4])((long)(x->e_mbd).weight[1] + local_6270);
        piVar95 = &(x->e_mbd).ref_mv_stack[1][0].this_mv + local_6270;
        uVar27 = *(undefined8 *)piVar95;
        uVar28 = *(undefined8 *)(piVar95 + 2);
        piVar95 = &(x->e_mbd).ref_mv_stack[1][2].this_mv + local_6270;
        uVar29 = *(undefined8 *)(piVar95 + 2);
        puVar6 = (undefined8 *)((long)&(x->mbmi_ext).ref_mv_stack[1][2].this_mv + local_6270 * 2);
        *puVar6 = *(undefined8 *)piVar95;
        puVar6[1] = uVar29;
        puVar6 = (undefined8 *)((long)&(x->mbmi_ext).ref_mv_stack[1][0].this_mv + local_6270 * 2);
        *puVar6 = uVar27;
        puVar6[1] = uVar28;
        av1_mv_pred(pAVar113,x,*(uint8_t **)((long)&yv12_mb[0][0].buf + lVar57),
                    *(int *)((long)&yv12_mb[0][0].stride + lVar57),uVar53,bsize_00);
        uVar78 = (uint)local_6200;
        if (pYVar59 != (YV12_BUFFER_CONFIG *)0x0) {
          av1_setup_pred_block(xd,pbVar71,src_01,local_61f8,local_61f8,iVar51);
          uVar78 = (uint)local_6200;
        }
        goto LAB_001f00ca;
      }
      iVar51 = is_ref_frame_used_in_cache((char)lVar104 + '\x01',x->mb_mode_cache);
      uVar78 = (uint)local_6200;
      pAVar140 = pAVar113;
      if (iVar51 != 0) goto LAB_001eff2a;
    }
    local_6270 = local_6270 + 0x10;
    lVar57 = lVar57 + 0x60;
    lVar104 = lVar109;
  }
  if ((pAVar113->sf).rt_sf.use_real_time_ref_set == 0) {
    bVar45 = block_size_high[uVar103];
    if (block_size_wide[uVar103] < block_size_high[uVar103]) {
      bVar45 = block_size_wide[uVar103];
    }
    if (7 < bVar45) {
      cVar77 = '\b';
      lVar104 = 0x1eb8;
      for (lVar57 = 0x4100; lVar57 != 0x4115; lVar57 = lVar57 + 1) {
        *(undefined2 *)((long)x + lVar57 * 2 + -0x40b8) = 0;
        *(undefined1 *)((long)&x->plane[0].src_diff + lVar57) = 0xff;
        if (((pAVar113->ref_frame_flags &
             (uint)""[*(char *)((long)av1_ab_partition_nn_bias_16_layer0 + lVar57 * 2 + 0xf0)]) != 0
            ) && ((pAVar113->ref_frame_flags &
                  (uint)""[*(char *)((long)av1_ab_partition_nn_bias_16_layer0 + lVar57 * 2 + 0xf1)])
                  != 0)) {
          if ((uVar78 >> ((int)lVar57 - 0x40f8U & 0x1f) & 1) == 0) {
            cVar46 = (char)lVar57 + '\b';
          }
          else {
            iVar51 = is_ref_frame_used_in_cache((char)lVar57 + '\b',x->mb_mode_cache);
            uVar78 = (uint)local_6200;
            cVar46 = cVar77;
            if (iVar51 == 0) goto LAB_001f0517;
          }
          iVar51 = prune_ref_frame(pAVar113,x,cVar46);
          uVar78 = (uint)local_6200;
          if (iVar51 == 0) {
            av1_find_mv_refs(cm,xd,local_6100,cVar46,local_6090,local_5f98,local_5fa0,
                             (int_mv (*) [2])0x0,local_5fa8,local_6040);
            *(undefined8 *)((long)x + lVar57 * 8 + -0x1c7b0) =
                 *(undefined8 *)((long)(x->e_mbd).plane[0].seg_qmatrix[6] + lVar104 + 0x70);
            puVar6 = (undefined8 *)((long)x + lVar104 * 4 + -0x56c8);
            uVar27 = *puVar6;
            uVar28 = puVar6[1];
            puVar7 = (undefined8 *)((long)x + lVar104 * 4 + -0x56b8);
            uVar29 = puVar7[1];
            puVar6 = (undefined8 *)((long)&x->plane[0].qcoeff + lVar104 * 2);
            *puVar6 = *puVar7;
            puVar6[1] = uVar29;
            puVar6 = (undefined8 *)((long)&x->plane[0].src_diff + lVar104 * 2);
            *puVar6 = uVar27;
            puVar6[1] = uVar28;
            uVar78 = (uint)local_6200;
          }
        }
LAB_001f0517:
        cVar77 = cVar77 + '\x01';
        lVar104 = lVar104 + 0x10;
      }
    }
  }
  av1_count_overlappable_neighbors(cm,xd);
  if ((((pAVar113->oxcf).motion_mode_cfg.enable_obmc == true) &&
      ((pAVar113->sf).inter_sf.prune_obmc_prob_thresh <=
       (pAVar113->ppi->frame_probs).obmc_probs
       [(pAVar113->ppi->gf_group).update_type[pAVar113->gf_frame_index]][uVar103])) &&
     (local_6100->overlappable_neighbors != '\0')) {
    bVar45 = block_size_high[uVar103];
    if (block_size_wide[uVar103] < block_size_high[uVar103]) {
      bVar45 = block_size_wide[uVar103];
    }
    if (7 < bVar45) {
      stack0xffffffffffffa420 = (uint8_t *)CONCAT44(fStack_5bdc,0x80);
      dst_width1[0] = 0x80;
      dst_width1[1] = 0x80;
      stack0xffffffffffffa820 = (uint8_t *)CONCAT44(uStack_57dc,0x40);
      dst_width2[0] = 0x40;
      dst_width2[1] = 0x40;
      this_rd_cost.dist = CONCAT44(this_rd_cost.dist._4_4_,0x40);
      this_rd_cost.rate = 0x40;
      this_rd_cost.zero_rate = 0x40;
      mode_skip_mask.pred_modes[2] = 0x80;
      mode_skip_mask.pred_modes[0] = 0x80;
      mode_skip_mask.pred_modes[1] = 0x80;
      pAVar140 = pAVar113;
      av1_build_prediction_by_above_preds
                (cm,xd,local_1e58.above_pred_buf,dst_width1,&this_rd_cost.rate,
                 local_1e58.above_pred_stride);
      av1_build_prediction_by_left_preds
                (cm,xd,local_1e58.left_pred_buf,dst_width2,(int *)&mode_skip_mask,
                 local_1e58.left_pred_stride);
      av1_setup_dst_planes
                ((x->e_mbd).plane,bsize_00,&((pAVar113->common).cur_frame)->buf,iVar50,
                 (int)local_61a8,0,
                 (uint)(((pAVar113->common).seq_params)->monochrome == '\0') * 2 + 1);
      local_6148 = local_1e58.above_pred_buf[0];
      local_61a8 = local_1e58.left_pred_buf[0];
      lVar57 = (long)local_1e58.above_pred_stride[0];
      iVar50 = local_1e58.left_pred_stride[0];
      lVar104 = (long)local_1e58.left_pred_stride[0];
      local_6048 = (int *)(ulong)(*(x->e_mbd).mi)->bsize;
      bVar45 = (x->e_mbd).width;
      local_6128 = (ulong)bVar45;
      local_6158 = (MB_MODE_INFO *)((ulong)bVar45 << 2);
      iVar51 = (uint)(x->e_mbd).height * 4;
      pMVar63 = (MB_MODE_INFO *)(x->obmc_buffer).mask;
      __s = (x->obmc_buffer).wsrc;
      local_60b0 = (int (*) [2])CONCAT44(local_60b0._4_4_,((x->e_mbd).cur_buf)->flags);
      uVar78 = iVar51 * (uint)bVar45 * 4;
      puVar64 = (uint8_t *)(ulong)uVar78;
      memset(__s,0,(ulong)(uVar78 * 4));
      for (uVar125 = 0; puVar64 != (uint8_t *)uVar125; uVar125 = uVar125 + 1) {
        *(int32_t *)((long)pMVar63 + uVar125 * 4) = 0x40;
      }
      pAVar113 = pAVar140;
      if ((x->e_mbd).up_available != false) {
        if ((0x2f0bffUL >> ((ulong)local_6048 & 0x3f) & 1) == 0) {
          uVar78 = 0x20;
        }
        else {
          uVar78 = (uint)(block_size_high[(long)local_6048] >> 1);
        }
        uVar53 = (x->e_mbd).mi_col;
        local_6120 = (int  [2])(long)(int)uVar53;
        ppMVar115 = (x->e_mbd).mi + (-(long)local_6120 - (long)(x->e_mbd).mi_stride);
        iVar118 = (x->e_mbd).width + uVar53;
        iVar52 = (pAVar140->common).mi_params.mi_cols;
        if (iVar52 <= iVar118) {
          iVar118 = iVar52;
        }
        local_6100 = (MB_MODE_INFO *)
                     CONCAT44(local_6100._4_4_,max_neighbor_obmc[""[(long)local_6048]]);
        iVar52 = 0;
        ppMVar116 = ppMVar115;
        local_6208 = puVar64;
        local_61c0 = (int (*) [2])ppMVar115;
        local_6150 = pMVar63;
        while ((pAVar113 = pAVar140, (int)uVar53 < iVar118 && (iVar52 < (int)local_6100))) {
          bVar45 = 0x10;
          if ((0x1f07ffUL >> ((ulong)ppMVar116[(int)uVar53]->bsize & 0x3f) & 1) != 0) {
            bVar45 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [ppMVar116[(int)uVar53]->bsize];
          }
          lVar109 = (long)(int)uVar53;
          uVar100 = uVar53 & 0xfffffffe;
          bVar135 = bVar45 == 1;
          if (bVar135) {
            bVar45 = 2;
            uVar53 = uVar100;
          }
          local_61f8 = (scale_factors *)(ulong)uVar53;
          ppMVar105 = ppMVar115 + (long)(int)uVar100 + 1;
          if (!bVar135) {
            ppMVar105 = ppMVar116 + lVar109;
          }
          if ((((*ppMVar105)->field_0xa7 & 0x80) != 0) || ('\0' < (*ppMVar105)->ref_frame[0])) {
            iVar52 = iVar52 + 1;
            iVar127 = uVar53 - local_6120[0];
            bVar108 = (x->e_mbd).width;
            bVar47 = bVar108;
            if (bVar45 <= bVar108) {
              bVar47 = bVar45;
            }
            puVar62 = av1_get_obmc_mask(uVar78);
            iVar127 = iVar127 * 4;
            piVar88 = (x->obmc_buffer).wsrc + iVar127;
            puVar80 = local_6148 + iVar127;
            piVar81 = (x->obmc_buffer).mask + iVar127;
            pMVar63 = local_6150;
            puVar64 = local_6208;
            ppMVar116 = (MB_MODE_INFO **)local_61c0;
            if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
              for (uVar125 = 0; uVar125 != uVar78; uVar125 = uVar125 + 1) {
                bVar40 = puVar62[uVar125];
                for (lVar109 = 0; (ulong)bVar47 << 2 != lVar109; lVar109 = lVar109 + 1) {
                  piVar88[lVar109] = (uint)puVar80[lVar109] * (uint)(byte)(0x40 - bVar40);
                  piVar81[lVar109] = (uint)bVar40;
                }
                puVar80 = puVar80 + lVar57;
                piVar81 = piVar81 + (ulong)bVar108 * 4;
                piVar88 = piVar88 + (ulong)bVar108 * 4;
              }
            }
            else {
              lVar109 = (long)puVar80 * 2;
              for (uVar125 = 0; uVar125 != uVar78; uVar125 = uVar125 + 1) {
                bVar40 = puVar62[uVar125];
                for (lVar60 = 0; (ulong)bVar47 << 3 != lVar60; lVar60 = lVar60 + 2) {
                  *(uint *)((long)piVar88 + lVar60 * 2) =
                       (uint)*(ushort *)(lVar109 + lVar60) * (uint)(byte)(0x40 - bVar40);
                  *(uint *)((long)piVar81 + lVar60 * 2) = (uint)bVar40;
                }
                piVar81 = piVar81 + (ulong)bVar108 * 4;
                piVar88 = piVar88 + (ulong)bVar108 * 4;
                lVar109 = lVar109 + lVar57 * 2;
              }
            }
          }
          uVar53 = (int)local_61f8 + (uint)bVar45;
        }
      }
      uVar78 = 0x20;
      for (uVar125 = 0; puVar64 != (uint8_t *)uVar125; uVar125 = uVar125 + 1) {
        __s[uVar125] = __s[uVar125] << 6;
        *(int *)((long)pMVar63 + uVar125 * 4) = *(int *)((long)pMVar63 + uVar125 * 4) << 6;
      }
      if ((x->e_mbd).left_available != false) {
        if ((0x1f07ffUL >> ((ulong)local_6048 & 0x3f) & 1) != 0) {
          uVar78 = (uint)(block_size_wide[(long)local_6048] >> 1);
        }
        uVar53 = (x->e_mbd).mi_row;
        ppMVar115 = (x->e_mbd).mi;
        lVar57 = (long)(x->e_mbd).mi_stride * (long)(int)uVar53;
        iVar118 = (x->e_mbd).height + uVar53;
        iVar52 = (pAVar113->common).mi_params.mi_rows;
        if (iVar52 <= iVar118) {
          iVar118 = iVar52;
        }
        local_6100 = (MB_MODE_INFO *)
                     CONCAT44(local_6100._4_4_,max_neighbor_obmc[""[(long)local_6048]]);
        iVar52 = 0;
        uVar100 = uVar53;
        while (((int)uVar100 < iVar118 && (iVar52 < (int)local_6100))) {
          iVar127 = (x->e_mbd).mi_stride;
          pMVar63 = ppMVar115[((long)(int)(iVar127 * uVar100) + -1) - lVar57];
          uVar125 = (ulong)pMVar63->bsize;
          bVar45 = 0x10;
          uVar101 = uVar100;
          if ((0x2f0bffUL >> (uVar125 & 0x3f) & 1) != 0) {
            if ((0x20005UL >> (uVar125 & 0x3f) & 1) == 0) {
              bVar45 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [uVar125];
            }
            else {
              uVar101 = uVar100 & 0xfffffffe;
              pMVar63 = ppMVar115[((long)(int)(iVar127 * (uVar100 | 1)) + -1) - lVar57];
              bVar45 = 2;
            }
          }
          if (((pMVar63->field_0xa7 & 0x80) != 0) ||
             (uVar100 = (uint)bVar45, '\0' < pMVar63->ref_frame[0])) {
            iVar52 = iVar52 + 1;
            bVar108 = (x->e_mbd).height;
            local_61f8 = (scale_factors *)CONCAT44(local_61f8._4_4_,(uint)bVar45);
            uVar100 = (uint)bVar108;
            if (bVar45 <= bVar108) {
              uVar100 = (uint)bVar45;
            }
            bVar45 = (x->e_mbd).width;
            puVar64 = av1_get_obmc_mask(uVar78);
            iVar128 = (uVar101 - uVar53) * 4;
            iVar127 = (uint)bVar45 * iVar128 * 4;
            piVar88 = (x->obmc_buffer).wsrc + iVar127;
            puVar62 = local_61a8 + iVar128 * iVar50;
            piVar81 = (x->obmc_buffer).mask + iVar127;
            if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
              for (iVar127 = 0; iVar127 != uVar100 << 2; iVar127 = iVar127 + 1) {
                for (uVar125 = 0; uVar78 != uVar125; uVar125 = uVar125 + 1) {
                  bVar108 = puVar64[uVar125];
                  piVar88[uVar125] =
                       (uint)(byte)(0x40 - bVar108) * (uint)puVar62[uVar125] * 0x40 +
                       (piVar88[uVar125] >> 6) * (uint)bVar108;
                  piVar81[uVar125] = (piVar81[uVar125] >> 6) * (uint)bVar108;
                }
                puVar62 = puVar62 + lVar104;
                piVar81 = piVar81 + (ulong)bVar45 * 4;
                piVar88 = piVar88 + (ulong)bVar45 * 4;
              }
            }
            else {
              lVar109 = (long)puVar62 * 2;
              for (iVar127 = 0; iVar127 != uVar100 << 2; iVar127 = iVar127 + 1) {
                for (uVar125 = 0; uVar78 != uVar125; uVar125 = uVar125 + 1) {
                  bVar108 = puVar64[uVar125];
                  piVar88[uVar125] =
                       (uint)(byte)(0x40 - bVar108) * (uint)*(ushort *)(lVar109 + uVar125 * 2) *
                       0x40 + (piVar88[uVar125] >> 6) * (uint)bVar108;
                  piVar81[uVar125] = (piVar81[uVar125] >> 6) * (uint)bVar108;
                }
                piVar81 = piVar81 + (ulong)bVar45 * 4;
                lVar109 = lVar109 + lVar104 * 2;
                piVar88 = piVar88 + (ulong)bVar45 * 4;
              }
            }
            uVar100 = (uint)local_61f8;
          }
          uVar100 = uVar101 + uVar100;
        }
      }
      puVar64 = x->plane[0].src.buf;
      if (((ulong)local_60b0 & 8) == 0) {
        for (iVar50 = 0; iVar50 != iVar51; iVar50 = iVar50 + 1) {
          for (uVar125 = 0; local_6158 != (MB_MODE_INFO *)uVar125; uVar125 = uVar125 + 1) {
            __s[uVar125] = (uint)puVar64[uVar125] * 0x1000 - __s[uVar125];
          }
          puVar64 = puVar64 + x->plane[0].src.stride;
          __s = (int32_t *)((long)__s + (ulong)(uint)((int)local_6128 << 4));
        }
      }
      else {
        lVar57 = (long)puVar64 * 2;
        for (iVar50 = 0; iVar50 != iVar51; iVar50 = iVar50 + 1) {
          for (uVar125 = 0; ((ulong)local_6158 & 0xffffffff) != uVar125; uVar125 = uVar125 + 1) {
            __s[uVar125] = (uint)*(ushort *)(lVar57 + uVar125 * 2) * 0x1000 - __s[uVar125];
          }
          lVar57 = lVar57 + (long)x->plane[0].src.stride * 2;
          __s = (int32_t *)((long)__s + (ulong)(uint)((int)local_6128 << 4));
        }
      }
    }
  }
  uVar78 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7;
  if ((pAVar113->sf).rt_sf.use_real_time_ref_set == 0) {
    default_skip_mask(&mode_skip_mask,
                      (uint)(pAVar113->oxcf).ref_frm_cfg.enable_reduced_reference_set);
    iVar50 = 0x7fffffff;
    for (lVar57 = 0; lVar57 != 7; lVar57 = lVar57 + 1) {
      if (x->pred_mv_sad[lVar57 + 1] <= iVar50) {
        iVar50 = x->pred_mv_sad[lVar57 + 1];
      }
    }
  }
  else {
    default_skip_mask(&mode_skip_mask,REF_SET_REALTIME);
    iVar50 = 0x7fffffff;
    for (lVar57 = 0; lVar57 != 8; lVar57 = lVar57 + 2) {
      if (((long)real_time_ref_combos[0][lVar57] != 0) &&
         (x->pred_mv_sad[real_time_ref_combos[0][lVar57]] <= iVar50)) {
        iVar50 = x->pred_mv_sad[real_time_ref_combos[0][lVar57]];
      }
    }
  }
  pAVar33 = &pAVar113->common;
  uVar53 = pAVar113->ref_frame_flags;
  for (lVar57 = 0; lVar57 != 7; lVar57 = lVar57 + 1) {
    if ((uVar53 & ""[lVar57 + 1]) == 0) {
      disable_reference((char)lVar57 + '\x01',mode_skip_mask.ref_combo);
    }
    else if (iVar50 < x->pred_mv_sad[lVar57 + 1] >> 2) {
      mode_skip_mask.pred_modes[lVar57 + 1] = mode_skip_mask.pred_modes[lVar57 + 1] | 0xfee000;
    }
    if ((((pAVar113->common).seg.enabled != '\0') &&
        (((pAVar113->common).seg.feature_mask[uVar78] & 0x20) != 0)) &&
       ((short)((short)lVar57 + 1) !=
        *(short *)((long)(pAVar33->seg).feature_data[0] + (ulong)(uVar78 << 4) + 10))) {
      disable_reference((char)lVar57 + '\x01',mode_skip_mask.ref_combo);
    }
  }
  if (((pAVar113->common).seg.enabled == '\0') ||
     (((pAVar113->common).seg.feature_mask[uVar78] & 0x20) == 0)) {
    if ((pAVar113->rc).is_src_frame_alt_ref != 0) {
      if ((pAVar113->oxcf).algo_cfg.arnr_max_frames == 0) {
        disable_inter_references_except_altref(mode_skip_mask.ref_combo);
        pMVar36 = local_60a8;
        mode_skip_mask.pred_modes[7] = 0xff011fff;
        ref_frame_rd[0] = CONCAT62(ref_frame_rd[0]._2_6_,0xff07);
        get_this_mv((int_mv *)dst_width2,'\r',0,0,0,(MV_REFERENCE_FRAME *)ref_frame_rd,local_60a8);
        get_this_mv((int_mv *)dst_width1,'\x0e',0,0,0,(MV_REFERENCE_FRAME *)ref_frame_rd,pMVar36);
        get_this_mv((int_mv *)&this_rd_cost,'\x0f',0,0,0,(MV_REFERENCE_FRAME *)ref_frame_rd,pMVar36)
        ;
        uVar54 = 0xff013fff;
        if (dst_width1[0] != this_rd_cost.rate) {
          mode_skip_mask.pred_modes[7] = 0xff015fff;
          uVar54 = 0xff017fff;
        }
        if (dst_width2[0] != this_rd_cost.rate) {
          mode_skip_mask.pred_modes[7] = uVar54;
        }
      }
      local_6048 = &(pAVar113->rc).is_src_frame_alt_ref;
      iVar50 = (pAVar113->sf).inter_sf.alt_ref_search_fp;
      goto LAB_001f0dee;
    }
    local_6048 = &(pAVar113->rc).is_src_frame_alt_ref;
    iVar50 = (pAVar113->sf).inter_sf.alt_ref_search_fp;
LAB_001f0e32:
    pAVar140 = pAVar113;
    if (iVar50 != 0) {
LAB_001f0e36:
      if (((pAVar113->common).show_frame == 0) &&
         (iVar51 = x->best_pred_mv_sad[0], iVar51 != 0x7fffffff)) {
        for (lVar57 = (ulong)(iVar50 == 1) + 5; lVar57 != 8; lVar57 = lVar57 + 1) {
          iVar52 = (pAVar113->ref_frame_dist_info).ref_relative_dist[lVar57 + -1];
          if (iVar52 < 0) {
            if (iVar50 == 1) {
              iVar118 = (pAVar113->ref_frame_dist_info).ref_relative_dist[0];
              iVar127 = -iVar118;
              if (0 < iVar118) {
                iVar127 = iVar118;
              }
              if ((double)iVar127 * 1.5 < (double)-iVar52) goto LAB_001f63c5;
            }
            if ((iVar51 >> 3) + iVar51 < x->pred_mv_sad[lVar57]) {
              mode_skip_mask.pred_modes[lVar57] = mode_skip_mask.pred_modes[lVar57] | 0x1ffe000;
            }
          }
LAB_001f63c5:
        }
      }
    }
  }
  else {
    local_6048 = &(pAVar113->rc).is_src_frame_alt_ref;
    iVar50 = (pAVar113->sf).inter_sf.alt_ref_search_fp;
    if ((pAVar113->rc).is_src_frame_alt_ref == 0) goto LAB_001f0e32;
LAB_001f0dee:
    pAVar140 = pAVar113;
    if (iVar50 != 0) {
      if ((uVar53 & 0x40) != 0) {
        mode_skip_mask.pred_modes[7] = 0;
        disable_inter_references_except_altref(mode_skip_mask.ref_combo);
        disable_reference('\0',mode_skip_mask.ref_combo);
      }
      goto LAB_001f0e36;
    }
  }
  if (((pAVar113->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad != 0) &&
     (iVar50 = x->best_pred_mv_sad[0], iVar50 != 0x7fffffff)) {
    for (lVar57 = 0; lVar57 != 8; lVar57 = lVar57 + 4) {
      if ((iVar50 >> 1) + iVar50 < x->pred_mv_sad[(char)(&DAT_00460690)[lVar57]]) {
        mode_skip_mask.pred_modes[(char)(&DAT_00460690)[lVar57]] =
             mode_skip_mask.pred_modes[(char)(&DAT_00460690)[lVar57]] | 0xfee000;
      }
    }
  }
  if ((pAVar113->sf).part_sf.max_intra_bsize < (BLOCK_SIZE)local_6140) {
    disable_reference('\0',mode_skip_mask.ref_combo);
  }
  if ((pAVar113->oxcf).tool_cfg.enable_global_motion == false) {
    for (lVar57 = 1; lVar57 != 8; lVar57 = lVar57 + 1) {
      mode_skip_mask.pred_modes[lVar57] = mode_skip_mask.pred_modes[lVar57] | 0x808000;
    }
  }
  mode_skip_mask.pred_modes[0] =
       mode_skip_mask.pred_modes[0] | ~(pAVar113->sf).intra_sf.intra_y_mode_mask[""[uVar103]];
  lVar57 = (long)(pAVar113->sf).inter_sf.prune_single_ref;
  if (lVar57 != 0) {
    bVar45 = (pAVar113->ref_frame_dist_info).nearest_past_ref;
    uVar125 = 0;
    while (uVar84 = uVar125, uVar84 != 7) {
      uVar125 = uVar84 + 1;
      if (((((ulong)bVar45 - 1 != uVar84) &&
           (uVar125 != (byte)(pAVar113->ref_frame_dist_info).nearest_future_ref)) &&
          (x->best_pred_mv_sad
           [(uint)~(pAVar113->ref_frame_dist_info).ref_relative_dist[uVar84] >> 0x1f] != 0x7fffffff)
          ) && ((double)x->best_pred_mv_sad
                        [(uint)~(pAVar113->ref_frame_dist_info).ref_relative_dist[uVar84] >> 0x1f] *
                *(double *)(&DAT_00460678 + lVar57 * 8) < (double)x->pred_mv_sad[uVar84 + 1])) {
        mode_skip_mask.pred_modes[uVar84 + 1] = mode_skip_mask.pred_modes[uVar84 + 1] | 0x1e000;
      }
    }
  }
  set_mode_eval_params(pAVar113,x,'\x01');
  x->comp_rd_stats_idx = 0;
  for (lVar57 = 0x54b; lVar57 != 0x553; lVar57 = lVar57 + 1) {
    *(undefined4 *)((long)local_1e58.above_pred_buf + lVar57 * 4) = 0x7fffffff;
  }
  best_est_rd = 0x7fffffffffffffff;
  iVar50 = (pAVar113->sf).inter_sf.inter_mode_rd_model_estimation;
  if (iVar50 == 2) {
    uVar136 = (undefined4)CONCAT71(0x30ff,(0x30ff80UL >> (uVar124 & 0x3f) & 1) != 0);
LAB_001f0fdc:
    local_61c0 = (int (*) [2])CONCAT44(local_61c0._4_4_,uVar136);
  }
  else {
    if (iVar50 == 1) {
      uVar136 = (undefined4)
                CONCAT71((int7)(uVar103 * 0x70 >> 8),local_6098[uVar103 * 0x1c + 0x14ce].as_int != 0
                        );
      goto LAB_001f0fdc;
    }
    local_61c0 = (int (*) [2])((ulong)local_61c0._4_4_ << 0x20);
  }
  pIVar17 = x->inter_modes_info;
  pIVar17->num = 0;
  local_6158 = (MB_MODE_INFO *)((ulong)x->tmp_pred_bufs[0] >> 1);
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    local_6158 = (MB_MODE_INFO *)x->tmp_pred_bufs[0];
  }
  ref_frame_rd[6] = 0x7fffffffffffffff;
  ref_frame_rd[7] = 0x7fffffffffffffff;
  ref_frame_rd[4] = 0x7fffffffffffffff;
  ref_frame_rd[5] = 0x7fffffffffffffff;
  ref_frame_rd[2] = 0x7fffffffffffffff;
  ref_frame_rd[3] = 0x7fffffffffffffff;
  ref_frame_rd[0] = 0x7fffffffffffffff;
  ref_frame_rd[1] = 0x7fffffffffffffff;
  local_6128 = CONCAT44(local_6128._4_4_,(x->e_mbd).mi_row);
  iVar50 = (x->e_mbd).mi_col;
  if ((pAVar113->sf).inter_sf.prune_inter_modes_based_on_tpl != 0) {
    pAVar113 = pAVar140;
    for (lVar57 = 0; lVar57 != 7; lVar57 = lVar57 + 1) {
      dst_width2[0]._1_1_ = 0xff;
      dst_width2[0]._0_1_ = (char)lVar57 + '\x01';
      uVar78 = 1;
      if (x->tpl_keep_ref_frame[lVar57 + 1] == '\0') {
        uVar78 = prune_ref_by_selective_ref_frame
                           (pAVar113,x,(MV_REFERENCE_FRAME *)dst_width2,
                            ((pAVar113->common).cur_frame)->ref_display_order_hint);
        uVar78 = uVar78 ^ 1;
      }
      dst_width1[lVar57] = uVar78;
    }
    inter_cost_info_from_tpl.ref_inter_cost[5] = 0;
    inter_cost_info_from_tpl.ref_inter_cost[6] = 0;
    inter_cost_info_from_tpl.ref_inter_cost[3] = 0;
    inter_cost_info_from_tpl.ref_inter_cost[4] = 0;
    inter_cost_info_from_tpl.ref_inter_cost[1] = 0;
    inter_cost_info_from_tpl.ref_inter_cost[2] = 0;
    inter_cost_info_from_tpl.best_inter_cost = 0;
    inter_cost_info_from_tpl.ref_inter_cost[0] = 0;
    bVar45 = pAVar113->gf_frame_index;
    pAVar18 = pAVar113->ppi;
    pAVar140 = pAVar113;
    iVar51 = av1_tpl_stats_ready(&pAVar18->tpl_data,(uint)bVar45);
    if (iVar51 != 0) {
      pTVar19 = (pAVar18->tpl_data).tpl_frame;
      pTVar20 = pTVar19[bVar45].tpl_stats_ptr;
      iVar51 = pTVar19[bVar45].stride;
      bVar45 = (pAVar18->tpl_data).tpl_stats_block_mis_log2;
      local_61f8 = (scale_factors *)CONCAT44(local_61f8._4_4_,1 << (bVar45 & 0x1f));
      bVar108 = (pAVar113->common).superres_scale_denominator;
      uVar53 = (int)(((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [uVar103] + iVar50) * (uint)bVar108 + 4) / 8;
      uVar78 = (pAVar113->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
      iVar118 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [uVar103] + (int)local_6128;
      iVar52 = (int)local_6128;
      pAVar113 = pAVar140;
      if ((int)uVar53 < (int)uVar78) {
        uVar78 = uVar53;
      }
      while( true ) {
        iVar127 = (pAVar113->common).mi_params.mi_rows;
        if (iVar118 < iVar127) {
          iVar127 = iVar118;
        }
        iVar128 = (int)(iVar50 * (uint)bVar108 + 4) / 8;
        if (iVar127 <= iVar52) break;
        for (; iVar128 < (int)uVar78;
            iVar128 = iVar128 + (int)(((uint)bVar108 << (bVar45 & 0x1f)) + 4) / 8) {
          iVar127 = av1_tpl_ptr_pos(iVar52,iVar128,iVar51,
                                    (pAVar18->tpl_data).tpl_stats_block_mis_log2);
          for (lVar57 = 0; lVar57 != 7; lVar57 = lVar57 + 1) {
            inter_cost_info_from_tpl.ref_inter_cost[lVar57] =
                 inter_cost_info_from_tpl.ref_inter_cost[lVar57] +
                 pTVar20[iVar127].pred_error[lVar57];
          }
        }
        iVar52 = iVar52 + (uint)local_61f8;
      }
      inter_cost_info_from_tpl.best_inter_cost = 0x7fffffffffffffff;
      for (lVar57 = 1; pAVar140 = pAVar113, lVar57 != 8; lVar57 = lVar57 + 1) {
        lVar104 = inter_cost_info_from_tpl.ref_inter_cost[lVar57 + -1];
        if (((lVar104 != 0) && (lVar104 < inter_cost_info_from_tpl.best_inter_cost)) &&
           (ref_costs_single[lVar57 + 7] != 0)) {
          inter_cost_info_from_tpl.best_inter_cost = lVar104;
        }
      }
    }
  }
  iVar51 = (pAVar113->common).width;
  iVar52 = (pAVar113->common).height;
  if (iVar51 < iVar52) {
    iVar52 = iVar51;
  }
  lVar57 = -1;
  local_5fb0 = 0xffffffffffffffff;
  if (((iVar52 < 0x1e1) || (1 < pAVar113->speed)) &&
     (((pAVar113->sf).intra_sf.skip_intra_in_interframe != 0 &&
      ((pAVar113->oxcf).algo_cfg.enable_tpl_model == true)))) {
    BVar39 = ((pAVar113->common).seq_params)->sb_size;
    bVar45 = (pAVar113->ppi->tpl_data).tpl_bsize_1d;
    if ((x->sb_enc).tpl_data_count ==
        (uint)(block_size_high[BVar39] / bVar45) * (uint)(block_size_wide[BVar39] / bVar45)) {
      if (bVar45 == 4) {
        lVar104 = 0;
      }
      else if (bVar45 == 8) {
        lVar104 = 3;
        lVar57 = lVar104;
      }
      else {
        lVar104 = 6;
        lVar57 = 0;
        if (bVar45 != 0x10) {
          if (bVar45 == 0x40) {
            lVar104 = 0xc;
            lVar57 = lVar104;
          }
          else if (bVar45 == 0x20) {
            lVar104 = 9;
            lVar57 = lVar104;
          }
        }
      }
      bVar45 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[lVar104]
      ;
      bVar108 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [lVar104];
      bVar47 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar103]
               / bVar45;
      local_60f8 = local_5fb0;
      if (bVar108 <=
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar103] &&
          bVar45 <= "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar103]) {
        iVar51 = (x->sb_enc).tpl_stride;
        iVar52 = (short)((short)((int)local_6128 %
                                (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                           [BVar39]) / (short)(ushort)bVar108) * iVar51 +
                 (int)(short)((short)(iVar50 % (int)(uint)
                                                  "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [BVar39]) / (short)(ushort)bVar45);
        lVar57 = -1;
        lVar104 = -1;
        lVar109 = lVar104;
        for (uVar78 = 0;
            uVar53 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [uVar103] / bVar108), uVar78 < uVar53; uVar78 = uVar78 + 1) {
          for (uVar124 = 0; uVar124 < bVar47; uVar124 = uVar124 + 1) {
            iVar118 = iVar52 + (int)uVar124;
            lVar104 = lVar104 + (x->sb_enc).tpl_inter_cost[iVar118];
            lVar109 = lVar109 + (x->sb_enc).tpl_intra_cost[iVar118];
          }
          iVar52 = iVar52 + iVar51;
        }
        local_5fb0 = (ulong)(uVar53 * bVar47);
        local_60f8 = lVar104 / (long)local_5fb0;
        local_5fb0 = lVar109 / (long)local_5fb0;
      }
    }
    else {
      local_60f8 = 0xffffffffffffffff;
    }
  }
  else {
    local_60f8 = 0xffffffffffffffff;
  }
  uVar78 = (uint)((ulong)lVar57 >> 0x20);
  pWVar98 = x->winner_mode_stats;
  BVar39 = (pAVar140->sf).winner_mode_sf.multi_winner_mode_type;
  if (pWVar98 != (WinnerModeStats *)0x0) {
    bVar45 = block_size_high[uVar103];
    bVar108 = block_size_wide[uVar103];
    uVar125 = 0;
    uVar124 = (ulong)(uint)winner_mode_count_allowed[BVar39];
    if (winner_mode_count_allowed[BVar39] < 1) {
      uVar124 = uVar125;
    }
    for (; uVar78 = (uint)((ulong)lVar57 >> 0x20), uVar124 * 0x40f0 - uVar125 != 0;
        uVar125 = uVar125 + 0x40f0) {
      memset((void *)((long)(pWVar98->mbmi).mv + (uVar125 - 8)),0,0xe8);
      lVar57 = 0;
      memset(pWVar98->color_index_map + uVar125,0,(ulong)bVar108 * (ulong)bVar45);
      (&pWVar98->mode_index)[uVar125] = '\0';
    }
    BVar39 = (pAVar140->sf).winner_mode_sf.multi_winner_mode_type;
  }
  bVar45 = (byte)local_61c0;
  x->winner_mode_count = 0;
  p._0_4_ = (int)x;
  pAVar113 = pAVar140;
  store_winner_mode_stats
            (cm,x,local_6168,(RD_STATS *)0x0,(RD_STATS *)0x0,(RD_STATS *)0x0,0xff,
             (uint8_t *)best_rd_so_far,BVar39,(ulong)uVar78 << 0x20,(int)pAVar140,(int)p);
  lVar57 = 0x1000;
  if ((pAVar140->sf).inter_sf.prune_inter_modes_if_skippable != 0) {
    lVar57 = (long)mode_threshold_mul_factor[x->qindex];
  }
  local_6208 = (uint8_t *)(ulong)(bVar45 ^ 1);
  bVar135 = (byte)local_60f0 == '\0';
  local_60f0 = CONCAT44(local_60f0._4_4_,(int)local_6140 + -10);
  pMVar63 = local_6158 + 0x5d;
  pMVar24 = local_6158 + 0xba;
  local_60b0 = (x->mode_costs).drl_mode_cost0;
  local_6100 = (MB_MODE_INFO *)
               ((ulong)((pAVar140->common).current_frame.reference_mode != '\0') << 7 | 0x1c);
  local_61f8 = (scale_factors *)(x->txfm_search_info).blk_skip;
  pMVar65 = local_6168->ref_frame;
  local_5fe0 = local_6110 - 1;
  local_5ff0 = &(x->e_mbd).plane[0].dst;
  iVar51 = 0;
  local_6080 = 0;
  local_6150 = (MB_MODE_INFO *)((ulong)local_6150 & 0xffffffff00000000);
  local_6120[0] = -1;
  local_6120[1] = 0x7fffffff;
  pAVar133 = pAVar140;
  for (uVar124 = 0; (MB_MODE_INFO *)uVar124 != local_6100; uVar124 = uVar124 + 1) {
    local_61a8 = (uint8_t *)(ulong)""[uVar124];
    pMVar2 = av1_mode_defs[(long)local_61a8].ref_frame;
    bVar45 = av1_mode_defs[(long)local_61a8].mode;
    uVar125 = (ulong)bVar45;
    bVar108 = *pMVar2;
    bVar47 = av1_mode_defs[(long)local_61a8].ref_frame[1];
    uVar85 = *(undefined2 *)pMVar2;
    bVar76 = (char)bVar47 == -1 && '\0' < (char)bVar108;
    local_6148 = (uint8_t *)CONCAT71(local_6148._1_7_,bVar76);
    iVar51 = iVar51 + (uint)bVar76;
    init_mbmi(local_6168,bVar45,pMVar2,cm);
    (x->txfm_search_info).skip_txfm = '\0';
    set_ref_ptrs(cm,xd,bVar108,bVar47);
    if (((bVar108 != 0) &&
        ((((pAVar133->sf).inter_sf.skip_arf_compound == 0 ||
          ((pAVar133->ppi->gf_group).update_type[pAVar133->gf_frame_index] != '\x03')) ||
         ((char)bVar47 < '\x01')))) &&
       (((bVar108 == 1 || local_60a0[0] == 0) || '\0' < (char)bVar47) || bVar45 == 0xd)) {
      if ((char)bVar47 < '\x01') {
        if ((bVar47 != 0 || (char)bVar108 < '\x01') ||
           ((0xf8 < (byte)local_60f0 && (0xfb < (byte)(bVar45 - 0x11))))) goto LAB_001f17d9;
      }
      else {
        bVar40 = block_size_high[uVar103];
        if (block_size_wide[uVar103] < block_size_high[uVar103]) {
          bVar40 = block_size_wide[uVar103];
        }
        if (((7 < bVar40) && ((pAVar133->ref_frame_flags & (uint)""[bVar47]) != 0)) &&
           (((((cm->current_frame).frame_type & 0xfd) != 0 &&
             ((pAVar133->common).current_frame.reference_mode != '\0')) &&
            (((pAVar133->common).seg.enabled == '\0' ||
             (((pAVar133->common).seg.feature_mask[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] &
              0x20) == 0)))))) {
LAB_001f17d9:
          lVar104 = (long)(int)(char)bVar108;
          if (((mode_skip_mask.pred_modes[lVar104] >> (bVar45 & 0x1f) & 1) == 0) &&
             (local_6160 = lVar104,
             mode_skip_mask.ref_combo[lVar104][(long)(int)(char)bVar47 + 1] == false)) {
            local_61d0 = (ulong)bVar47;
            bVar40 = av1_ref_frame_type(pMVar2);
            if (((pAVar133->sf).rt_sf.use_real_time_ref_set != 0) ||
               (iVar52 = prune_ref_frame(pAVar133,x,bVar40), iVar52 == 0)) {
              pAVar133 = pAVar113;
              uVar78 = (uint)bVar45;
              if ((char)bVar47 < '\x01') {
                uVar8 = local_6090[bVar40];
                if (uVar78 == 0xf) {
                  if (uVar8 == '\x01') {
                    bVar41 = 0xe;
LAB_001f20d1:
                    lVar104 = *(long *)(local_4910 + ((ulong)bVar41 * 0x18 + local_6160) * 8);
                    if (lVar104 != 0x7fffffffffffffff) {
                      iVar48 = av1_mode_context_analyzer(local_6040,pMVar2);
                      mode_costs = local_5fb8;
                      iVar52 = cost_mv_ref(local_5fb8,bVar41,iVar48);
                      iVar118 = cost_mv_ref(mode_costs,bVar45,iVar48);
                      if (iVar52 < iVar118) {
                        *(long *)(local_4910 + (uVar125 * 0x18 + local_6160) * 8) = lVar104;
                        pAVar113 = pAVar133;
                        goto LAB_001f18ce;
                      }
                    }
                  }
                  else if (uVar8 == '\0') {
                    bVar41 = 0xd;
                    bVar9 = (pAVar140->common).global_motion[local_6160].wmtype;
joined_r0x001f1956:
                    if (bVar9 < 2) goto LAB_001f20d1;
                  }
                }
                else if (uVar78 == 0xe) {
                  if (uVar8 == '\0') {
                    bVar41 = 0xd;
                    goto LAB_001f20d1;
                  }
                  if (uVar8 == '\x01') {
                    bVar41 = 0xf;
                    bVar9 = (pAVar140->common).global_motion[local_6160].wmtype;
                    goto joined_r0x001f1956;
                  }
                }
              }
              pAVar113 = pAVar133;
              if (x->use_mb_mode_cache == 0) {
LAB_001f1978:
                pMVar119 = *(x->e_mbd).mi;
                if ((((uint8_t *)local_50e0._0_8_ != (uint8_t *)0x7fffffffffffffff) ||
                    (pMVar119->partition != '\0')) ||
                   (iVar52 = 0, x->must_find_valid_partition == 0)) {
                  uVar84 = (ulong)(pAVar133->sf).inter_sf.prune_nearmv_using_neighbors;
                  if ((((uVar84 != 0) && ((uVar78 == 0x12 || (uVar78 == 0xe)))) &&
                      ((uint8_t *)local_50e0._0_8_ != (uint8_t *)0x7fffffffffffffff)) &&
                     (((x->e_mbd).left_available == true && ((x->e_mbd).up_available == true)))) {
                    auVar138._12_4_ = 0;
                    auVar138._0_12_ = local_5bc8._4_12_;
                    local_5bc8 = auVar138 << 0x20;
                    dst_width1[0] = 1;
                    dst_width1[1] = 0;
                    stack0xffffffffffffa420 = (uint8_t *)0x100000000;
                    local_5bd0 = (uint8_t *)0x100000002;
                    pMVar90 = (x->e_mbd).left_mbmi;
                    uVar53 = 0;
                    uVar100 = 0;
                    if (bVar108 == pMVar90->ref_frame[0]) {
                      uVar100 = (uint)(bVar47 == pMVar90->ref_frame[1]);
                    }
                    pMVar90 = (x->e_mbd).above_mbmi;
                    if (bVar108 == pMVar90->ref_frame[0]) {
                      uVar53 = (uint)(bVar47 == pMVar90->ref_frame[1]);
                    }
                    if ((int)(uVar53 + uVar100) <
                        dst_width1[uVar84 * 3 + (long)((x->qindex * 3) / 0x100) + -3])
                    goto LAB_001f18ce;
                  }
                  if (pMVar119->partition != '\0') {
                    uVar53 = 1 << (bVar40 & 0x1f) & (uint)local_6200;
                    bVar76 = false;
                    if (((char)bVar40 < '\b') && (uVar53 != 0)) {
                      iVar52 = is_ref_frame_used_by_compound_ref((int)(char)bVar40,(uint)local_6200)
                      ;
                      bVar76 = iVar52 != 0;
                      if (bVar76) {
                        uVar53 = 0;
                      }
                    }
                    pMVar119 = x->mb_mode_cache;
                    iVar52 = is_ref_frame_used_in_cache(bVar40,pMVar119);
                    if (iVar52 == 0 || '\a' < (char)bVar40) {
                      if (iVar52 == 0) {
                        pAVar113 = pAVar133;
                        if (uVar53 != 0) goto LAB_001f18ce;
                      }
                      else {
                        bVar76 = false;
                      }
                    }
                    else {
                      bVar76 = '\0' < pMVar119->ref_frame[1];
                    }
                    iVar52 = 1;
                    if (bVar76) goto LAB_001f1b43;
                  }
                  iVar52 = 0;
                }
LAB_001f1b43:
                local_1e58.skip_motion_mode = iVar52;
                local_61d4 = (pAVar133->sf).interp_sf.skip_interp_filter_search;
                if (local_61d4 == 0) {
                  uVar53 = (pAVar133->sf).inter_sf.prune_comp_search_by_single_result;
                  if (((int)local_6150 == 0 && 0 < (int)uVar53) && '\0' < (char)bVar47) {
                    lVar104 = 6 - (ulong)(uVar53 < 2);
                    puVar66 = local_210c;
                    puVar89 = local_232c;
                    for (lVar109 = 0; lVar109 != 2; lVar109 = lVar109 + 1) {
                      lVar60 = alStack_22c8[lVar109 * 0x20];
                      if (alStack_22c8[lVar109 * 0x20 + 8] < alStack_22c8[lVar109 * 0x20]) {
                        lVar60 = alStack_22c8[lVar109 * 0x20 + 8];
                      }
                      puVar112 = puVar89;
                      for (lVar122 = 0; lVar122 != 4; lVar122 = lVar122 + 1) {
                        puVar92 = puVar112;
                        for (lVar130 = 1; lVar130 < local_2148[lVar109 * 4 + lVar122];
                            lVar130 = lVar130 + 1) {
                          if ((*(long *)(puVar92 + -3) != 0x7fffffffffffffff) &&
                             (lVar126 = (*(long *)(puVar92 + -3) >> 3) * lVar104,
                             lVar126 - lVar60 != 0 && lVar60 <= lVar126)) {
                            *puVar92 = 0;
                          }
                          puVar92 = puVar92 + 4;
                        }
                        puVar112 = puVar112 + 0x10;
                      }
                      lVar60 = alStack_20a8[lVar109 * 0x20];
                      if (alStack_20a8[lVar109 * 0x20 + 8] < alStack_20a8[lVar109 * 0x20]) {
                        lVar60 = alStack_20a8[lVar109 * 0x20 + 8];
                      }
                      puVar112 = puVar66;
                      for (lVar122 = 0; lVar122 != 4; lVar122 = lVar122 + 1) {
                        puVar92 = puVar112;
                        for (lVar130 = 1; lVar130 < local_1f28[lVar109 * 4 + lVar122];
                            lVar130 = lVar130 + 1) {
                          if ((*(long *)(puVar92 + -3) != 0x7fffffffffffffff) &&
                             (lVar126 = (*(long *)(puVar92 + -3) >> 3) * lVar104,
                             lVar126 - lVar60 != 0 && lVar60 <= lVar126)) {
                            *puVar92 = 0;
                          }
                          puVar92 = puVar92 + 4;
                        }
                        puVar112 = puVar112 + 0x10;
                      }
                      puVar89 = puVar89 + 0x40;
                      puVar66 = puVar66 + 0x40;
                    }
                    pMVar119 = (MB_MODE_INFO *)local_1f08;
                    paiVar69 = (int (*) [8])local_2340;
                    pp_Var94 = local_233c;
                    for (pMVar90 = (MB_MODE_INFO *)0x0; pp_Var123 = pp_Var94, paiVar117 = paiVar69,
                        pMVar82 = pMVar119, pMVar90 != (MB_MODE_INFO *)0x2;
                        pMVar90 = (MB_MODE_INFO *)&pMVar90->partition) {
                      local_6150 = pMVar90;
                      paiVar69 = paiVar117;
                      pMVar119 = pMVar82;
                      pp_Var94 = pp_Var123;
                      for (lVar104 = 0; lVar104 != 4; lVar104 = lVar104 + 1) {
                        uVar53 = local_2148[(long)pMVar90 * 4 + lVar104];
                        uVar100 = local_1f28[(long)pMVar90 * 4 + lVar104];
                        uVar101 = uVar100;
                        if ((int)uVar100 < (int)uVar53) {
                          uVar101 = uVar53;
                        }
                        uVar131 = 0;
                        uVar84 = (ulong)uVar53;
                        if ((int)uVar53 < 1) {
                          uVar84 = uVar131;
                        }
                        uVar93 = 0;
                        for (; (iVar52 = (int)uVar93, uVar84 * 0x10 != uVar131 &&
                               (*(long *)((long)pp_Var94 + (uVar131 - 0xc)) != 0x7fffffffffffffff));
                            uVar131 = uVar131 + 0x10) {
                          if (*(int *)((long)pp_Var94 + uVar131) != 0) {
                            uVar93 = (ulong)(iVar52 + 1);
                            local_1f08[(long)iVar52 + lVar104 * 4 + (long)pMVar90 * 0x10] =
                                 *(MV_REFERENCE_FRAME *)((long)pp_Var94 + (uVar131 - 4));
                          }
                        }
                        if (iVar52 < (int)uVar101) {
                          lVar109 = 0;
LAB_001f1e12:
                          if (((lVar109 < (int)uVar100) &&
                              (iVar52 = (int)uVar93, iVar52 < (int)uVar101)) &&
                             ((&local_2128)[(long)pMVar90 * 0x20 + lVar104 * 8 + lVar109 * 2] !=
                              0x7fffffffffffffff)) {
                            if (local_211c[(long)pMVar90 * 0x40 + lVar104 * 0x10 + lVar109 * 4] != 0
                               ) {
                              bVar40 = local_2120
                                       [lVar109 * 0x10 + lVar104 * 0x40 + (long)pMVar90 * 0x100];
                              uVar131 = 0;
                              if (0 < iVar52) {
                                uVar131 = uVar93;
                              }
                              uVar132 = 0;
                              do {
                                if (uVar131 == uVar132) {
                                  lVar60 = 0;
                                  goto LAB_001f1e5e;
                                }
                                lVar60 = uVar132 - 8;
                                uVar132 = uVar132 + 1;
                              } while (*(byte *)((long)pMVar119->mv + lVar60) != bVar40);
                            }
                            goto LAB_001f1e90;
                          }
                        }
                        pp_Var94 = pp_Var94 + 8;
                        pMVar119 = (MB_MODE_INFO *)&pMVar119->current_qindex;
                        paiVar69 = paiVar69 + 2;
                        pMVar90 = local_6150;
                      }
                      pMVar119 = (MB_MODE_INFO *)pMVar82->ref_frame;
                      paiVar69 = paiVar117 + 8;
                      pp_Var94 = pp_Var123 + 0x20;
                      local_61e0 = paiVar117;
                      local_61c8 = pMVar82;
                      local_61b0 = pp_Var123;
                    }
                    local_6150 = (MB_MODE_INFO *)CONCAT44(local_6150._4_4_,1);
                  }
                }
                lVar104 = lVar57;
                if ((int)local_5018.dist == 0) {
                  lVar104 = 0x1000;
                }
                pAVar113 = pAVar133;
                if (lVar104 * alStack_4fa0[(long)local_61a8] >> 0xc <= (long)local_50e0._0_8_) {
                  if (((local_61d4 == 0) &&
                      (iVar52 = (pAVar133->sf).inter_sf.prune_comp_search_by_single_result,
                      0 < iVar52)) && ('\0' < (char)bVar47)) {
                    _refs_1 = CONCAT62(uStack_5f76,uVar85);
                    dst_width1[1]._0_1_ = compound_ref1_mode_lut[uVar125];
                    dst_width1[0] = (uint)(byte)compound_ref0_mode_lut[uVar125];
                    dst_width1[1]._1_3_ = 0;
                    dst_width2[1] = (byte)compound_ref1_mode_lut[uVar125] - 0xd;
                    dst_width2[0] = (byte)compound_ref0_mode_lut[uVar125] - 0xd;
                    ref_searched[0] = 0;
                    ref_searched[1] = 0;
                    this_rd_cost.zero_rate._0_1_ = 4 < bVar47;
                    this_rd_cost.rate = (uint)('\x04' < (char)bVar108);
                    this_rd_cost.zero_rate._1_3_ = 0;
                    ref_mv_match[0] = 1;
                    ref_mv_match[1] = 1;
                    for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                      uVar84 = (ulong)(uint)local_2148
                                            [(long)(&this_rd_cost.rate)[lVar104] * 4 +
                                             (long)dst_width2[lVar104]];
                      if (local_2148
                          [(long)(&this_rd_cost.rate)[lVar104] * 4 + (long)dst_width2[lVar104]] < 1)
                      {
                        uVar84 = 0;
                      }
                      lVar109 = 0;
                      do {
                        if (uVar84 * 0x10 + 0x10 == lVar109 + 0x10) goto LAB_001f209e;
                        lVar60 = lVar109 + (long)dst_width2[lVar104] * 0x40 +
                                           (long)(&this_rd_cost.rate)[lVar104] * 0x100;
                        lVar109 = lVar109 + 0x10;
                      } while (local_2340[lVar60] != refs_1[lVar104]);
                      ref_searched[lVar104] = 1;
LAB_001f209e:
                    }
                    iVar118 = get_drl_refmv_count(x,refs_1,bVar45);
                    if (iVar118 < 1) {
                      iVar118 = 0;
                    }
                    for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                      pAVar133 = pAVar113;
                      if ((ref_searched[lVar104] != 0) &&
                         (iVar127 = dst_width1[lVar104], iVar127 - 0xdU < 2)) {
                        single_refs = (MV_REFERENCE_FRAME  [2])CONCAT11(-1,refs_1[lVar104]);
                        for (iVar128 = 0; pMVar36 = local_60a8, iVar118 != iVar128;
                            iVar128 = iVar128 + 1) {
                          get_this_mv(&single_mv,(PREDICTION_MODE)iVar127,0,iVar128,0,single_refs,
                                      local_60a8);
                          get_this_mv((int_mv *)&tmp_dst,bVar45,(int)lVar104,iVar128,0,refs_1,
                                      pMVar36);
                          if (single_mv.as_int != (uint32_t)tmp_dst.plane[0]) {
                            ref_mv_match[lVar104] = 0;
                            break;
                          }
                        }
                      }
                      pAVar113 = pAVar133;
                    }
                    for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                      if ((ref_searched[lVar104] != 0) && (ref_mv_match[lVar104] != 0)) {
                        lVar60 = (long)(&this_rd_cost.rate)[lVar104];
                        bVar40 = *(byte *)(dst_width1 + lVar104);
                        uVar84 = (ulong)bVar40;
                        for (lVar109 = 0; lVar109 != 4; lVar109 = lVar109 + 1) {
                          if (local_1f3c[lVar109 + lVar60 * 0x10 + (ulong)bVar40 * 4] == -1)
                          goto LAB_001f2337;
                        }
                        lVar109 = 4;
LAB_001f2337:
                        uVar100 = (uint)lVar109;
                        uVar53 = 2;
                        if (uVar100 < 2) {
                          uVar53 = uVar100;
                        }
                        if (1 < iVar52) {
                          uVar100 = uVar53;
                        }
                        if (2 < iVar52) {
                          if ((((&lStack_2688)[lVar60 * 0x20 + uVar84 * 8] != 0x7fffffffffffffff) &&
                              ((&lStack_2468)[lVar60 * 0x20 + uVar84 * 8] != 0x7fffffffffffffff)) &&
                             (uVar100 = uVar53,
                             acStack_2680[uVar84 * 0x40 + lVar60 * 0x100] ==
                             acStack_2460[uVar84 * 0x40 + lVar60 * 0x100])) {
                            uVar100 = 1;
                          }
                          if ((bVar40 & 0xfe) == 0xe) {
                            uVar100 = 1;
                          }
                        }
                        uVar53 = 1;
                        if ((int)uVar100 < 1) {
                          uVar53 = uVar100;
                        }
                        if (iVar52 < 4) {
                          uVar53 = uVar100;
                        }
                        uVar84 = (ulong)uVar53;
                        if ((int)uVar53 < 1) {
                          uVar84 = 0;
                        }
                        uVar131 = 0;
                        do {
                          if (uVar84 == uVar131) goto LAB_001f18ce;
                          lVar109 = uVar131 + (long)dst_width2[lVar104] * 4 + lVar60 * 0x10;
                          uVar131 = uVar131 + 1;
                        } while (refs_1[lVar104] != local_1f08[lVar109]);
                      }
                    }
                  }
                  if (((pAVar133->sf).inter_sf.prune_compound_using_single_ref != 0) &&
                     ('\0' < (char)bVar47)) {
                    if (local_6080 == 0) {
                      local_6080 = 0;
                      if (iVar51 != 0x1c) goto LAB_001f24c9;
                      local_5bb8 = ref_frame_rd[7];
                      local_5bc8._8_8_ = ref_frame_rd[6];
                      local_5bc8._0_8_ = ref_frame_rd[5];
                      local_5bd0 = (uint8_t *)ref_frame_rd[4];
                      dst_width1[0] = (undefined4)ref_frame_rd[1];
                      dst_width1[1] = ref_frame_rd[1]._4_4_;
                      stack0xffffffffffffa420 = (uint8_t *)ref_frame_rd[2];
                      qsort(dst_width1,7,8,compare_int64);
                      ref_frame_rd[0] = 0x7fffffffffffffff;
                      if (dst_width1._0_8_ != 0x7fffffffffffffff) {
                        ref_frame_rd[0] = (dst_width1._0_8_ * 0x6e) / 100;
                      }
                      local_6080 = 1;
                    }
                    if ((ref_frame_rd[0] < ref_frame_rd[local_6160]) &&
                       (ref_frame_rd[0] < ref_frame_rd[local_61d0])) goto LAB_001f18ce;
                  }
LAB_001f24c9:
                  if (((pAVar133->sf).inter_sf.skip_ext_comp_nearmv_mode == 0) ||
                     (1 < (byte)(bVar45 - 0x15))) {
                    iVar52 = (pAVar133->sf).inter_sf.prune_ext_comp_using_neighbors;
                    if (((iVar52 == 0) || ((char)bVar47 < '\x01')) ||
                       ((uVar78 < 0x19 && ((0x1860000U >> (uVar78 & 0x1f) & 1) != 0)))) {
LAB_001f2514:
                      iVar118 = (pAVar133->sf).inter_sf.prune_comp_using_best_single_mode_ref;
                      if ((iVar118 == 0) || ((char)bVar47 < '\x01')) {
                        if (((pAVar133->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight != 0)
                           && (((((char)bVar47 < '\x01' &&
                                 (iVar42 = av1_ref_frame_type(pMVar2), 0xfd < (byte)(bVar45 - 0xf)))
                                && (0xf3 < (byte)(local_50c6 - 0x19))) &&
                               (((x->e_mbd).left_available == true &&
                                ((x->e_mbd).up_available == true)))))) {
                          bVar40 = local_6090[iVar42];
                          bVar41 = bVar40;
                          if (2 < bVar40) {
                            bVar41 = 3;
                          }
                          if ((bVar40 != 0) && ((bVar45 != 0xd || (local_5fd0[iVar42][0] < 0x280))))
                          {
                            uVar78 = 0;
                            for (uVar125 = 0; bVar41 != uVar125; uVar125 = uVar125 + 1) {
                              uVar78 = (uVar78 + 1) - (uint)(local_5fd0[iVar42][uVar125] < 0x280);
                            }
                            if (uVar78 < (bVar40 != 1) + 1) goto LAB_001f18ce;
                          }
                        }
                      }
                      else if ((0x18 < uVar78) || ((0x1860000U >> (uVar78 & 0x1f) & 1) == 0)) {
                        if ((abStack_2350[pMVar2[(0xaeffffUL >> (uVar125 & 0x3f) & 1) != 0]] != 0x10
                            ) && (iVar118 != 1 ||
                                  abStack_2350[pMVar2[(0xaeffffUL >> (uVar125 & 0x3f) & 1) != 0]] !=
                                  0x19)) goto LAB_001f18ce;
                      }
                      uVar27 = local_50e0._0_8_;
                      if ((bVar108 == 4 && (char)bVar47 < '\x01') &&
                          (pAVar133->sf).rt_sf.prune_inter_modes_with_golden_ref != 0) {
                        iVar118 = (pAVar133->ppi->gf_group).size;
                        iVar127 = iVar118 >> 2;
                        if (0xf < iVar118) {
                          iVar127 = 4;
                        }
                        if (((iVar127 < (pAVar133->rc).frames_since_golden) &&
                            (local_50b8 != '\x04')) &&
                           (bVar45 == 0xe || bVar45 == 0x10 && 6 < (byte)local_6140))
                        goto LAB_001f18ce;
                      }
                      pbVar71 = (x->e_mbd).plane[0].pre + 1;
                      for (uVar125 = 0; ((ulong)bVar135 << 6 | 0x20) != uVar125;
                          uVar125 = uVar125 + 0x20) {
                        puVar6 = (undefined8 *)((long)&yv12_mb[local_6160][0].buf + uVar125);
                        puVar64 = (uint8_t *)*puVar6;
                        puVar62 = (uint8_t *)puVar6[1];
                        puVar6 = (undefined8 *)((long)&yv12_mb[local_6160][0].width + uVar125);
                        uVar28 = *puVar6;
                        uVar29 = puVar6[1];
                        pbVar71[-1].width = (int)uVar28;
                        pbVar71[-1].height = (int)((ulong)uVar28 >> 0x20);
                        *(undefined8 *)&pbVar71[-1].stride = uVar29;
                        pbVar71[-1].buf = puVar64;
                        pbVar71[-1].buf0 = puVar62;
                        if ('\0' < (char)bVar47) {
                          puVar6 = (undefined8 *)((long)&yv12_mb[local_61d0][0].buf + uVar125);
                          puVar64 = (uint8_t *)*puVar6;
                          puVar62 = (uint8_t *)puVar6[1];
                          puVar6 = (undefined8 *)((long)&yv12_mb[local_61d0][0].width + uVar125);
                          uVar28 = *puVar6;
                          uVar29 = puVar6[1];
                          pbVar71->width = (int)uVar28;
                          pbVar71->height = (int)((ulong)uVar28 >> 0x20);
                          *(undefined8 *)&pbVar71->stride = uVar29;
                          pbVar71->buf = puVar64;
                          pbVar71->buf0 = puVar62;
                        }
                        pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                      }
                      local_6168->angle_delta[0] = '\0';
                      local_6168->angle_delta[1] = '\0';
                      (local_6168->filter_intra_mode_info).use_filter_intra = '\0';
                      local_6168->field_0xa7 = local_6168->field_0xa7 & 0xcf;
                      local_6078.sse = 0;
                      local_6078.dist = 0;
                      local_6078.rdcost = 0;
                      local_6078.rate = 0;
                      local_6078.zero_rate = 0;
                      local_6078.skip_txfm = '\x01';
                      puVar83 = ref_costs_single + local_6160;
                      if ('\0' < (char)bVar47) {
                        puVar83 = ref_costs_comp[local_6160] + local_61d0;
                      }
                      bVar40 = block_size_high[local_6168->bsize];
                      if (block_size_wide[local_6168->bsize] < block_size_high[local_6168->bsize]) {
                        bVar40 = block_size_wide[local_6168->bsize];
                      }
                      local_1e58.skip_ifs = false;
                      local_5fe4 = 0;
                      if (7 < bVar40) {
                        local_5fe4 = (x->mode_costs).comp_inter_cost[iVar49]['\0' < (char)bVar47];
                      }
                      RVar10 = (pAVar133->common).current_frame.reference_mode;
                      local_1e58.single_comp_cost = 0;
                      if (RVar10 == '\x02') {
                        local_1e58.single_comp_cost = local_5fe4;
                      }
                      local_1e58.single_newmv = (int_mv (*) [8])local_4a30;
                      local_1e58.single_newmv_rate = (int (*) [8])local_49d0;
                      local_1e58.single_newmv_valid = (int (*) [8])local_4970;
                      local_1e58.ref_frame_cost = *puVar83;
                      local_1e58.best_pred_sse = local_4a50;
                      MVar11 = (pAVar133->oxcf).mode;
                      if (MVar11 == '\0') {
                        local_1e58.skip_ifs =
                             (_Bool)((pAVar133->sf).interp_sf.skip_interp_filter_search != 0 &
                                    (byte)local_6148);
                      }
                      else if (MVar11 == '\x01') {
                        if (RVar10 == '\0') {
                          local_1e58.skip_ifs = true;
                          if ((pAVar133->sf).interp_sf.skip_interp_filter_search == 0) {
                            local_1e58.skip_ifs = (pAVar133->sf).winner_mode_sf.winner_mode_ifs != 0
                            ;
                          }
                        }
                        else {
                          local_1e58.skip_ifs = false;
                        }
                      }
                      iVar118 = frame_is_kf_gf_arf(pAVar133);
                      if (((iVar118 != 0) || ((pAVar133->oxcf).algo_cfg.sharpness != 3)) ||
                         ((bVar108 < 8 && ((0x91U >> (bVar108 & 0x1f) & 1) != 0)))) {
                        local_5ef8[0] = local_50e0._8_4_;
                        local_5ef8[1] = local_50e0._12_4_;
                        puStack_5ef0 = (uint8_t *)local_50e0._16_8_;
                        local_6084 = CONCAT31(local_6084._1_3_,
                                              ((pAVar133->common).seq_params)->monochrome);
                        pMVar119 = *(x->e_mbd).mi;
                        bVar40 = pMVar119->ref_frame[1];
                        bVar108 = pMVar119->mode;
                        uVar125 = (ulong)bVar108;
                        local_6134 = 0;
                        local_61d4 = CONCAT31(local_61d4._1_3_,bVar40);
                        if ((pAVar133->sf).inter_sf.prune_inter_modes_based_on_tpl == 0) {
                          uVar136 = 0;
                        }
                        else {
                          iVar118 = av1_tpl_stats_ready(&pAVar133->ppi->tpl_data,
                                                        (uint)pAVar133->gf_frame_index);
                          uVar136 = CONCAT31((int3)((uint)iVar52 >> 8),iVar118 != 0);
                          bVar40 = pMVar119->ref_frame[1];
                        }
                        uVar78 = (uint)bVar40;
                        if ((char)bVar40 < '\x01') {
                          uVar78 = 0;
                        }
                        local_6130 = CONCAT44(local_6130._4_4_,uVar78);
                        local_60b8 = CONCAT44(local_60b8._4_4_,(int)pMVar119->ref_frame[0]);
                        rate_mv = 0;
                        local_61b0 = (aom_variance_fn_t *)pMVar119->ref_frame;
                        rd = 0x7fffffffffffffff;
                        _single_mv = (int  [2])(x->e_mbd).plane[0].dst.buf;
                        puStack_60e0 = (x->e_mbd).plane[1].dst.buf;
                        puStack_60d8 = (x->e_mbd).plane[2].dst.buf;
                        local_60d0 = CONCAT44((x->e_mbd).plane[1].dst.stride,
                                              (x->e_mbd).plane[0].dst.stride);
                        local_60c8 = (x->e_mbd).plane[2].dst.stride;
                        tmp_dst.plane[0] = &local_6158->bsize;
                        tmp_dst.stride[0] = 0x80;
                        tmp_dst.stride[1] = 0x80;
                        tmp_dst.stride[2] = 0x80;
                        local_61b2 = bVar40;
                        tmp_dst.plane[1] = (uint8_t *)pMVar63->ref_frame;
                        tmp_dst.plane[2] = (uint8_t *)((pMVar24->wm_params).wmmat + 1);
                        local_61b1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)local_61b0);
                        pvVar67 = memcpy(&this_rd_cost,pMVar119,0xb0);
                        pMVar90 = local_61c8;
                        local_61c8 = (MB_MODE_INFO *)((ulong)local_61c8 & 0xffffffff00000000);
                        local_60c0 = CONCAT44(local_60c0._4_4_,uVar136);
                        local_61f0 = (uint8_t *)uVar27;
                        local_61e8 = pMVar119;
                        if ((char)uVar136 != '\0') {
                          uVar75 = (undefined7)((ulong)pvVar67 >> 8);
                          local_6134 = (uint)CONCAT71(uVar75,1);
                          local_61c8._4_4_ = SUB84(pMVar90,4);
                          local_61c8 = (MB_MODE_INFO *)
                                       CONCAT44(local_61c8._4_4_,(int)CONCAT71(uVar75,1));
                          pAVar133 = pAVar113;
                          if ((x->e_mbd).up_available == true) {
                            uVar78 = (pAVar113->common).mi_params.mi_cols;
                            uVar131 = (ulong)uVar78;
                            iVar52 = (x->e_mbd).mi_col;
                            uVar93 = (ulong)iVar52;
                            ppMVar115 = (x->e_mbd).mi;
                            iVar118 = (x->e_mbd).mi_stride;
                            uVar53 = (uint)(x->e_mbd).width + iVar52;
                            uVar84 = uVar93;
                            if ((int)uVar78 <= (int)uVar53) {
                              uVar53 = uVar78;
                            }
                            while( true ) {
                              iVar52 = (int)uVar84;
                              local_61c8 = (MB_MODE_INFO *)
                                           CONCAT44(local_61c8._4_4_,
                                                    (int)CONCAT71((int7)(uVar131 >> 8),
                                                                  iVar52 < (int)uVar53));
                              if ((int)uVar53 <= iVar52) break;
                              pMVar119 = ppMVar115[((long)iVar52 - (long)iVar118) - uVar93];
                              uVar131 = (ulong)pMVar119->bsize;
                              bVar40 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                       [uVar131];
                              if (((pMVar119->field_0xa7 & 0x80) != 0) ||
                                 ('\0' < pMVar119->ref_frame[0])) {
                                uVar78 = ref_match_found_in_nb_blocks(*ppMVar115,pMVar119);
                                uVar131 = (ulong)uVar78;
                                if (uVar78 != 0) break;
                              }
                              uVar84 = (ulong)(iVar52 + (uint)bVar40);
                            }
                          }
                          pAVar113 = pAVar133;
                          if ((x->e_mbd).left_available == true) {
                            uVar78 = (pAVar133->common).mi_params.mi_rows;
                            uVar84 = (ulong)uVar78;
                            iVar52 = (x->e_mbd).mi_row;
                            iVar118 = (x->e_mbd).mi_stride;
                            ppMVar115 = (x->e_mbd).mi;
                            iVar127 = iVar118 * iVar52;
                            uVar53 = (uint)(x->e_mbd).height + iVar52;
                            if ((int)uVar78 <= (int)uVar53) {
                              uVar53 = uVar78;
                            }
                            for (; local_6134 = (uint)CONCAT71((int7)(uVar84 >> 8),
                                                               iVar52 < (int)uVar53),
                                pAVar113 = pAVar133, iVar52 < (int)uVar53;
                                iVar52 = iVar52 + (uint)bVar40) {
                              pMVar119 = ppMVar115[((long)(iVar52 * iVar118) + -1) - (long)iVar127];
                              uVar84 = (ulong)pMVar119->bsize;
                              bVar40 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                       [uVar84];
                              if (((pMVar119->field_0xa7 & 0x80) != 0) ||
                                 ('\0' < pMVar119->ref_frame[0])) {
                                uVar78 = ref_match_found_in_nb_blocks(*ppMVar115,pMVar119);
                                uVar84 = (ulong)uVar78;
                                pAVar113 = pAVar133;
                                if (uVar78 != 0) break;
                              }
                            }
                          }
                        }
                        pp_Var94 = local_61b0;
                        pMVar119 = local_61e8;
                        puVar64 = local_61f0;
                        uVar78 = get_drl_refmv_count(x,(MV_REFERENCE_FRAME *)local_61b0,bVar108);
                        local_61d0 = CONCAT44(extraout_var,uVar78);
                        local_5fd8 = local_1e58._112_8_ & 0xffffffff;
                        local_6118 = (ulong)(uint)local_1e58.single_comp_cost;
                        if (uVar78 == 1) {
                          uVar131 = local_6130 & 0xffffffff;
                          local_620c = 1;
                        }
                        else {
                          pMVar90 = *(x->e_mbd).mi;
                          bVar40 = pMVar90->mode;
                          uVar53 = 0;
                          uVar100 = 0;
                          if (0 < (int)uVar78) {
                            uVar100 = uVar78;
                          }
                          local_61e0 = local_1e58.single_newmv_valid;
                          iVar52 = local_1e58.single_comp_cost + local_1e58.ref_frame_cost;
                          pAVar133 = pAVar113;
                          for (uVar78 = 0; uVar78 != uVar100; uVar78 = uVar78 + 1) {
                            pMVar119 = *(x->e_mbd).mi;
                            pMVar2 = pMVar119->ref_frame;
                            iVar42 = av1_ref_frame_type(pMVar2);
                            bVar41 = pMVar119->ref_frame[1];
                            uVar101 = (pAVar133->sf).inter_sf.reduce_inter_modes;
                            if (uVar78 == 0 || uVar101 == 0) {
LAB_001f2ef6:
                              *(ushort *)&pMVar119->field_0xa7 =
                                   *(ushort *)&pMVar119->field_0xa7 & 0xffcf |
                                   (ushort)((uVar78 & 3) << 4);
                              if ('\0' < (char)bVar41) {
                                for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                                  puVar79 = compound_ref1_mode_lut;
                                  if (lVar104 == 0) {
                                    puVar79 = compound_ref0_mode_lut;
                                  }
                                  if ((puVar79[pMVar119->mode] == '\x10') &&
                                     (*(int *)((long)*local_61e0 +
                                              (long)pMVar2[lVar104] * 4 + (ulong)((uVar78 & 3) << 5)
                                              ) == 0)) goto LAB_001f2fd5;
                                }
                              }
                              iVar118 = get_drl_cost(pMVar119,local_60a8,local_60b0,iVar42);
                              if (((long)x->rdmult * ((long)iVar118 + (long)iVar52) + 0x100 >> 9 <=
                                   (long)local_61f0) || ((pMVar119->mode - 0xd & 0xfb) == 0)) {
                                uVar53 = uVar53 | 1 << (uVar78 & 0x1f);
                              }
                            }
                            else {
                              bVar9 = *pMVar2;
                              if ((bVar41 & 0xfe) != 2 && (bVar9 & 0xfe) != 2) {
LAB_001f2e49:
                                if ((1 < (int)uVar101) && ((char)bVar41 < '\x01')) {
                                  bVar12 = pMVar119->mode;
                                  if ((bVar12 < 0x19) &&
                                     ((((0x1790000U >> (bVar12 & 0x1f) & 1) != 0 &&
                                       (bVar9 != (pAVar133->ref_frame_dist_info).nearest_past_ref))
                                      && (bVar9 != (pAVar133->ref_frame_dist_info).
                                                   nearest_future_ref)))) {
                                    uVar86 = 1;
                                    if ((bVar12 != 0x12) && (uVar86 = 1, bVar12 != 0x15)) {
                                      uVar86 = (uint)(bVar12 == 0x16);
                                    }
                                    if (((2 < uVar101) || ((x->qindex * 3) / 0x100 < (int)uVar78))
                                       && (local_5fd0[iVar42][uVar86 + uVar78] < 0x280))
                                    goto LAB_001f2fd5;
                                  }
                                }
                                goto LAB_001f2ef6;
                              }
                              bVar12 = pMVar119->mode;
                              if ((0x15 < bVar12) ||
                                 (uVar86 = 1, (0x244000U >> (bVar12 & 0x1f) & 1) == 0)) {
                                uVar86 = (uint)(bVar12 == 0x16);
                              }
                              if (0x27f < local_5fd0[iVar42][uVar86 + uVar78]) goto LAB_001f2e49;
                            }
LAB_001f2fd5:
                            puVar64 = local_61f0;
                            pMVar119 = local_61e8;
                          }
                          pAVar113 = pAVar133;
                          if (((((pAVar133->sf).inter_sf.prune_mode_search_simple_translation != 0)
                               && (bVar40 < 0x17)) && ((0x644000U >> (bVar40 & 0x1f) & 1) != 0)) &&
                             ((0x3000fUL >> (bsize_00 & 0x3f) & 1) == 0)) {
                            psVar68 = get_ref_scale_factors(cm,pMVar90->ref_frame[0]);
                            iVar52 = av1_is_scaled(psVar68);
                            if (iVar52 == 0) {
                              if ('\0' < pMVar90->ref_frame[1]) {
                                psVar68 = get_ref_scale_factors(cm,pMVar90->ref_frame[1]);
                                iVar52 = av1_is_scaled(psVar68);
                                if (iVar52 != 0) goto LAB_001f304e;
                              }
                              pAVar133 = pAVar113;
                              dst_width2[0] = -1;
                              dst_width2[1] = 0x7fffffff;
                              stack0xffffffffffffa820 = (uint8_t *)0x7fffffffffffffff;
                              uVar84 = (ulong)uVar100;
                              local_6118 = uVar84;
                              for (uVar131 = 0; uVar131 != uVar84; uVar131 = uVar131 + 1) {
                                if ((uVar53 >> ((uint)uVar131 & 0x1f) & 1) != 0) {
                                  pMVar119 = *(x->e_mbd).mi;
                                  iVar42 = av1_ref_frame_type(pMVar119->ref_frame);
                                  local_61e0 = (int (*) [8])
                                               CONCAT71(local_61e0._1_7_,pMVar119->ref_frame[1]);
                                  dst_width1._0_8_ = (x->e_mbd).plane[0].dst.buf;
                                  unique0x00012000 = (x->e_mbd).plane[1].dst.buf;
                                  local_5bd0 = (uint8_t *)
                                               CONCAT44((x->e_mbd).plane[1].dst.stride,
                                                        (x->e_mbd).plane[0].dst.stride);
                                  local_6078.dist = 0;
                                  local_6078.rdcost = 0;
                                  local_6078.sse = 0;
                                  local_6078.skip_txfm = '\x01';
                                  local_6078.rate = 0;
                                  local_6078.zero_rate = 0;
                                  local_5bc8._0_4_ = (x->e_mbd).plane[2].dst.stride;
                                  (pMVar119->interinter_comp).type = '\0';
                                  uVar16 = *(ushort *)&pMVar119->field_0xa7;
                                  *(ushort *)&pMVar119->field_0xa7 = uVar16 & 0xfcff | 0x200;
                                  if (pMVar119->ref_frame[1] == '\0') {
                                    pMVar119->ref_frame[1] = -1;
                                  }
                                  iVar48 = av1_mode_context_analyzer(local_6040,pMVar119->ref_frame)
                                  ;
                                  pMVar119->motion_mode = '\0';
                                  pMVar119->num_proj_ref = '\0';
                                  *(ushort *)&pMVar119->field_0xa7 =
                                       uVar16 & 0xfccf | 0x200 | (ushort)(((uint)uVar131 & 3) << 4);
                                  iVar118 = local_1e58.single_comp_cost + local_1e58.ref_frame_cost;
                                  local_6078.rate = iVar118;
                                  iVar52 = get_drl_cost(pMVar119,local_60a8,local_60b0,iVar42);
                                  local_6078.rate = iVar52 + iVar118;
                                  iVar52 = build_cur_mv((int_mv *)ref_searched,pMVar119->mode,cm,x,0
                                                       );
                                  puVar64 = local_61f0;
                                  lVar104 = 0x7fffffffffffffff;
                                  if (iVar52 != 0) {
                                    for (lVar104 = 0;
                                        (ulong)('\0' < (char)local_61e0) + 1 != lVar104;
                                        lVar104 = lVar104 + 1) {
                                      pMVar119->mv[lVar104] = *(int_mv *)(ref_searched + lVar104);
                                    }
                                    iVar52 = cost_mv_ref(local_5fb8,pMVar119->mode,iVar48);
                                    lVar109 = (long)local_6078.rate;
                                    local_6078.rate = (int)(iVar52 + lVar109);
                                    lVar104 = 0x7fffffffffffffff;
                                    if ((long)x->rdmult * (iVar52 + lVar109) + 0x100 >> 9 <=
                                        (long)puVar64) {
                                      pMVar119->motion_mode = '\0';
                                      pMVar119->num_proj_ref = '\0';
                                      if ('\0' < (char)local_61e0) {
                                        (pMVar119->interinter_comp).type = '\0';
                                        *(ushort *)&pMVar119->field_0xa7 =
                                             *(ushort *)&pMVar119->field_0xa7 & 0xfcff | 0x200;
                                      }
                                      IVar43 = (pAVar133->common).features.interp_filter;
                                      if (IVar43 == MULTITAP_SHARP2) {
                                        IVar43 = EIGHTTAP_REGULAR;
                                      }
                                      (pMVar119->interp_filters).as_int = (uint)IVar43 * 0x10001;
                                      pAVar113 = (AV1_COMP *)cm;
                                      av1_enc_build_inter_predictor
                                                (cm,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,
                                                 (BUFFER_SET *)dst_width1,bsize_00,0,0);
                                      model_rd_for_sb_with_curvfit
                                                (pAVar113,bsize_00,x,xd,0,0,(int *)refs_1,
                                                 (int64_t *)ref_mv_match,(uint8_t *)0x0,
                                                 (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,
                                                 (int64_t *)0x0);
                                      lVar104 = (long)ref_mv_match * 0x80 +
                                                ((long)x->rdmult *
                                                 ((long)_refs_1 + (long)local_6078.rate) + 0x100 >>
                                                9);
                                    }
                                  }
                                  *(long *)(dst_width2 + uVar131 * 2) = lVar104;
                                  uVar84 = local_6118;
                                  pMVar119 = local_61e8;
                                }
                              }
                              iVar52 = 0;
                              uVar131 = local_6130 & 0xffffffff;
                              for (lVar104 = 1; lVar104 != 3; lVar104 = lVar104 + 1) {
                                iVar118 = (int)lVar104;
                                if (*(long *)(dst_width2 + (long)iVar52 * 2) <=
                                    *(long *)(dst_width2 + lVar104 * 2)) {
                                  iVar118 = iVar52;
                                }
                                iVar52 = iVar118;
                              }
                              local_620c = 0;
                              for (uVar93 = 0; uVar84 != uVar93; uVar93 = uVar93 + 1) {
                                uVar78 = 1 << ((byte)uVar93 & 0x1f);
                                if ((uVar53 >> ((uint)uVar93 & 0x1f) & 1) != 0) {
                                  auVar137._0_8_ = (double)*(long *)(dst_width2 + uVar93 * 2);
                                  auVar137._8_8_ = auVar137._0_8_;
                                  auVar26._8_8_ = (double)*(long *)(dst_width2 + (long)iVar52 * 2);
                                  auVar26._0_8_ = (double)(long)puVar64;
                                  auVar138 = divpd(auVar137,auVar26);
                                  auVar139._8_8_ =
                                       -(ulong)(auVar138._8_8_ <
                                               *(double *)
                                                (&DAT_00460650 +
                                                (ulong)(pMVar90->ref_frame[1] < '\x01') * 8));
                                  auVar139._0_8_ = -(ulong)(auVar138._0_8_ < 5.0);
                                  iVar118 = movmskpd(uVar53,auVar139);
                                  if (iVar118 != 3) {
                                    uVar78 = 0;
                                  }
                                  local_620c = local_620c | uVar78;
                                }
                              }
                              local_5fd8 = local_1e58._112_8_ & 0xffffffff;
                              local_6118 = (ulong)local_1e58._112_8_ >> 0x20;
                              pp_Var94 = local_61b0;
                              pAVar113 = pAVar133;
                              goto LAB_001f305e;
                            }
                          }
LAB_001f304e:
                          uVar131 = local_6130 & 0xffffffff;
                          pp_Var94 = local_61b0;
                          local_620c = uVar53;
                        }
LAB_001f305e:
                        local_60b8 = (long)(int)local_60b8;
                        iVar48 = av1_mode_context_analyzer
                                           (local_6040,(MV_REFERENCE_FRAME *)pp_Var94);
                        iVar52 = cost_mv_ref(local_5fb8,bVar108,iVar48);
                        for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                          save_mv[lVar104] = (int_mv  [2])0x8000800080008000;
                        }
                        bVar76 = (byte)local_6084 == '\0';
                        local_1e58.start_mv_cnt = 0;
                        local_6134 = CONCAT31((int3)(local_6134 >> 8),
                                              (byte)local_6134 | (byte)local_61c8 |
                                              (byte)local_60c0 ^ 1) ^ 1;
                        uVar78 = (uint)bVar108;
                        local_61b3 = uVar78 == 0x17 || uVar78 == 0xf;
                        local_5fd8 = (ulong)((int)local_5fd8 + iVar52 + (uint)local_6118);
                        local_6084 = uVar78 - 0xd;
                        lVar104 = (ulong)bVar76 * 2 + 1;
                        iVar52 = (int)local_61d0;
                        local_61d0 = local_61d0 & 0xffffffff;
                        if (iVar52 < 1) {
                          local_61d0 = 0;
                        }
                        local_61e0 = (int (*) [8])((ulong)('\0' < (char)local_61d4) + 1);
                        local_6240 = save_mv;
                        local_6118 = CONCAT44(local_6118._4_4_,0xffffffff);
                        uVar8 = '\0';
                        local_5f48[0] = -1;
                        local_5f48[1] = 0x7fffffff;
                        local_5fc0 = (uint8_t *)0x7fffffffffffffff;
                        for (uVar84 = 0; uVar84 != local_61d0; uVar84 = uVar84 + 1) {
                          uVar78 = (uint)uVar84;
                          *(ushort *)&pMVar119->field_0xa7 =
                               *(ushort *)&pMVar119->field_0xa7 & 0xffcf |
                               (ushort)((uVar78 & 3) << 4);
                          ref_searched[uVar84 * 5 + 1] = -0x7fff8000;
                          *(undefined4 *)(auStack_6030 + uVar84 * 0x14 + 4) = 0x7fffffff;
                          iVar52 = get_drl_cost(pMVar119,local_60a8,local_60b0,local_61b1);
                          ref_searched[uVar84 * 5] = iVar52;
                          *(undefined4 *)(auStack_6030 + uVar84 * 0x14 + 8) = 0;
                          if ((local_620c >> (uVar78 & 0x1f) & 1) != 0) {
                            if ((puVar64 != (uint8_t *)0x7fffffffffffffff & (byte)local_6134) == 1)
                            {
                              iVar118 = (pAVar133->sf).inter_sf.prune_inter_modes_based_on_tpl;
                              local_6228 = (uint)bVar108;
                              if ((((0x18 < local_6228) ||
                                   ((0x1790000U >> (local_6228 & 0x1f) & 1) == 0)) || (1 < iVar118))
                                 && (inter_cost_info_from_tpl.best_inter_cost != 0x7fffffffffffffff)
                                 ) {
                                lVar109 = inter_cost_info_from_tpl.ref_inter_cost[local_60b8 + -1];
                                if (('\0' < (char)local_61b2) &&
                                   (lVar109 <=
                                    inter_cost_info_from_tpl.ref_inter_cost
                                    [(int)(uVar131 & 0xff) - 1])) {
                                  lVar109 = inter_cost_info_from_tpl.ref_inter_cost
                                            [(int)(uVar131 & 0xff) - 1];
                                }
                                uVar93 = uVar84;
                                if (local_61b3 != '\0') {
                                  uVar93 = 3;
                                }
                                if (inter_cost_info_from_tpl.best_inter_cost *
                                    *(int *)(
                                            prune_modes_based_on_tpl_stats_tpl_inter_mode_prune_mul_factor
                                            + uVar93 * 4 + ((long)iVar118 + -1) * 0x10) >> 2 <
                                    lVar109) goto LAB_001f44cb;
                              }
                            }
                            local_6078.dist = 0;
                            local_6078.rdcost = 0;
                            local_6078.sse = 0;
                            local_6078.skip_txfm = '\x01';
                            (pMVar119->interinter_comp).type = '\0';
                            *(ushort *)&pMVar119->field_0xa7 =
                                 *(ushort *)&pMVar119->field_0xa7 & 0xfcff | 0x200;
                            if (pMVar119->ref_frame[1] == '\0') {
                              pMVar119->ref_frame[1] = -1;
                            }
                            pMVar119->motion_mode = '\0';
                            pMVar119->num_proj_ref = '\0';
                            rs = 0;
                            local_6078.zero_rate = 0;
                            local_6078.rate = iVar52 + (int)local_5fd8;
                            iVar52 = 0;
                            if ((char)local_61d4 < '\x01') {
                              iVar52 = (pAVar133->sf).inter_sf.skip_repeated_ref_mv;
                            }
                            iVar52 = build_cur_mv(cur_mv_1,bVar108,cm,x,iVar52);
                            if (iVar52 != 0) {
                              cpi_00 = pAVar113;
                              if ((bVar108 < 0x19) && ((0x1790000U >> (bVar108 & 0x1f) & 1) != 0)) {
                                pMVar90 = *(x->e_mbd).mi;
                                uVar53 = *(ushort *)&pMVar90->field_0xa7 >> 4 & 3;
                                uVar93 = (ulong)uVar53;
                                lVar109 = (long)pMVar90->ref_frame[0];
                                if (pMVar90->ref_frame[1] < '\x01') {
                                  uVar100 = 0x7fffffff;
                                  local_61c8 = pMVar90;
                                  local_6130 = uVar93;
                                  local_60c0 = lVar109;
                                  if (((pAVar133->sf).mv_sf.reduce_search_range != 0) &&
                                     ((short)uVar53 != 0)) {
                                    local_61b0 = (aom_variance_fn_t *)pMVar90->ref_frame;
                                    local_61f0 = puVar64;
                                    iVar55 = av1_get_ref_mv(x,0);
                                    ref_mv_match[0] = 0;
                                    ref_mv_match[1] = 0;
                                    uVar93 = 0xffffffffffffffff;
                                    pAVar133 = pAVar113;
                                    uVar53 = 0x7fffffff;
                                    for (uVar132 = 0;
                                        uVar132 < (*(ushort *)&local_61c8->field_0xa7 >> 4 & 3);
                                        uVar132 = uVar132 + 1) {
                                      iVar56 = av1_get_ref_mv_from_stack
                                                         (0,(MV_REFERENCE_FRAME *)local_61b0,
                                                          (int)uVar132,local_60a8);
                                      uVar101 = (int)iVar55.as_mv.row - (int)iVar56.as_mv.row;
                                      uVar100 = -uVar101;
                                      if (0 < (int)uVar101) {
                                        uVar100 = uVar101;
                                      }
                                      ((int_mv *)(ref_mv_match + uVar132))->as_mv = (MV)iVar56;
                                      uVar86 = ((int)iVar55.as_int >> 0x10) -
                                               ((int)iVar56.as_int >> 0x10);
                                      uVar101 = -uVar86;
                                      if (0 < (int)uVar86) {
                                        uVar101 = uVar86;
                                      }
                                      if (uVar101 < uVar100) {
                                        uVar101 = uVar100;
                                      }
                                      uVar100 = uVar53;
                                      if ((int)uVar101 <= (int)uVar53) {
                                        uVar100 = uVar101;
                                      }
                                      if ((int)uVar101 < (int)uVar53) {
                                        uVar93 = uVar132;
                                      }
                                      uVar93 = uVar93 & 0xffffffff;
                                      uVar53 = uVar100;
                                    }
                                    uVar100 = 0x7fffffff;
                                    puVar64 = local_61f0;
                                    pMVar119 = local_61e8;
                                    pAVar113 = pAVar133;
                                    if (((int)uVar53 < 0x80) &&
                                       (lVar109 = (long)(int)uVar93,
                                       local_1e58.single_newmv_valid[lVar109][local_60c0] != 0)) {
                                      uVar101 = (int)(((int_mv *)
                                                      ((long)local_1e58.single_newmv +
                                                      (lVar109 * 8 + local_60c0) * 4))->as_mv).row -
                                                (int)(short)ref_mv_match[lVar109];
                                      uVar100 = -uVar101;
                                      if (0 < (int)uVar101) {
                                        uVar100 = uVar101;
                                      }
                                      uVar86 = (int)*(short *)((long)local_1e58.single_newmv +
                                                              local_60c0 * 4 + lVar109 * 0x20 + 2) -
                                               (int)*(short *)((long)ref_mv_match + lVar109 * 4 + 2)
                                      ;
                                      uVar101 = -uVar86;
                                      if (0 < (int)uVar86) {
                                        uVar101 = uVar86;
                                      }
                                      uVar86 = uVar101 & 0xffff;
                                      if ((uVar101 & 0xffff) < (uVar100 & 0xffff)) {
                                        uVar86 = uVar100 & 0xffff;
                                      }
                                      uVar100 = uVar86 + uVar53 + 4 >> 3;
                                    }
                                  }
                                  av1_single_motion_search
                                            (pAVar133,x,bsize_00,0,&rate_mv,uVar100,
                                             (inter_mode_info *)ref_searched,(int_mv *)ref_mv_match,
                                             &local_1e58);
                                  if (ref_mv_match[0] != -0x7fff8000) {
                                    uVar93 = local_6130 & 0xffff;
                                    ((int_mv *)
                                    ((long)local_1e58.single_newmv + (uVar93 * 8 + local_60c0) * 4))
                                    ->as_int = ref_mv_match[0];
                                    local_1e58.single_newmv_rate[uVar93][local_60c0] = rate_mv;
                                    local_1e58.single_newmv_valid[uVar93][local_60c0] = 1;
                                    cur_mv_1[0].as_int = ref_mv_match[0];
                                    pAVar133 = pAVar113;
                                    if (*(int *)(auStack_6030 +
                                                (ulong)(*(ushort *)&local_61c8->field_0xa7 >> 4 & 3)
                                                * 0x14 + 8) == 0) goto LAB_001f379b;
                                  }
                                  goto LAB_001f44cb;
                                }
                                uVar93 = (ulong)(byte)pMVar90->ref_frame[1];
                                PVar13 = pMVar90->mode;
                                iVar52 = *(int *)((long)*local_1e58.single_newmv_valid +
                                                 uVar93 * 4 + (ulong)(uVar53 << 5));
                                if ((PVar13 == '\x13') || (PVar13 == '\x15')) {
                                  piVar95 = cur_mv_1 + 1;
                                  if (iVar52 != 0) {
                                    cur_mv_1[1] = *(int_mv *)
                                                   ((long)local_1e58.single_newmv +
                                                   uVar93 * 4 + (ulong)(uVar53 << 5));
                                    clamp_mv_in_range(x,piVar95,1);
                                  }
                                  iVar55 = av1_get_ref_mv(x,1);
                                  ref_mv_match[0] = iVar55.as_int;
                                  mvjcost = x->mv_costs;
                                  mvcost = mvjcost->mv_cost_stack;
LAB_001f3773:
                                  rate_mv = av1_mv_bit_cost(&piVar95->as_mv,(MV *)ref_mv_match,
                                                            mvjcost->nmv_joint_cost,mvcost,0x6c);
                                  pMVar119 = local_61e8;
                                  pAVar133 = pAVar113;
                                }
                                else {
                                  iVar118 = *(int *)((long)*local_1e58.single_newmv_valid +
                                                    lVar109 * 4 + (ulong)(uVar53 << 5));
                                  if (PVar13 != '\x18') {
                                    piVar95 = cur_mv_1;
                                    if (iVar118 != 0) {
                                      cur_mv_1[0] = *(int_mv *)
                                                     ((long)local_1e58.single_newmv +
                                                     lVar109 * 4 + (ulong)(uVar53 << 5));
                                      clamp_mv_in_range(x,piVar95,0);
                                    }
                                    iVar55 = av1_get_ref_mv(x,0);
                                    ref_mv_match[0] = iVar55.as_int;
                                    mvjcost = x->mv_costs;
                                    mvcost = mvjcost->mv_cost_stack;
                                    goto LAB_001f3773;
                                  }
                                  if (iVar118 != 0) {
                                    cur_mv_1[0] = *(int_mv *)
                                                   ((long)local_1e58.single_newmv +
                                                   lVar109 * 4 + (ulong)(uVar53 << 5));
                                    clamp_mv_in_range(x,cur_mv_1,0);
                                  }
                                  if (iVar52 != 0) {
                                    cur_mv_1[1] = *(int_mv *)
                                                   ((long)local_1e58.single_newmv +
                                                   uVar93 * 4 + (ulong)(uVar53 << 5));
                                    clamp_mv_in_range(x,cur_mv_1 + 1,1);
                                  }
                                  pMVar119 = local_61e8;
                                  rate_mv = 0;
                                  piVar95 = cur_mv_1;
                                  for (lVar109 = 0; pAVar133 = pAVar113, lVar109 != 2;
                                      lVar109 = lVar109 + 1) {
                                    iVar55 = av1_get_ref_mv(x,(int)lVar109);
                                    ref_mv_match[0] = iVar55.as_int;
                                    iVar52 = av1_mv_bit_cost(&piVar95->as_mv,(MV *)ref_mv_match,
                                                             x->mv_costs->nmv_joint_cost,
                                                             x->mv_costs->mv_cost_stack,0x6c);
                                    rate_mv = rate_mv + iVar52;
                                    piVar95 = piVar95 + 1;
                                  }
                                }
LAB_001f379b:
                                if (((byte)local_6084 < 4) && (cur_mv_1[0].as_int != 0x80008000)) {
                                  uVar53 = x->pred_sse[local_60b8];
                                  if (uVar53 < local_1e58.best_single_sse_in_refs[local_60b8]) {
                                    local_1e58.best_single_sse_in_refs[local_60b8] = uVar53;
                                  }
                                  lVar109 = (long)(pAVar133->sf).rt_sf.skip_newmv_mode_based_on_sse;
                                  if ((lVar109 != 0) &&
                                     (pAVar113 = pAVar133,
                                     (double)local_1e58.best_pred_sse <
                                     (double)uVar53 *
                                     *(double *)
                                      ("" + (ulong)
                                                  "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                                  [uVar103] * 8 + lVar109 * 0x58 + 8)))
                                  goto LAB_001f44cb;
                                }
                                local_6078.rate = local_6078.rate + rate_mv;
                                cpi_00 = pAVar133;
                              }
                              for (paiVar69 = (int (*) [8])0x0; local_61e0 != paiVar69;
                                  paiVar69 = (int (*) [8])((long)*paiVar69 + 1)) {
                                pMVar119->mv[(long)paiVar69] = cur_mv_1[(long)paiVar69];
                              }
                              pAVar113 = cpi_00;
                              if ((((long)x->rdmult * (long)local_6078.rate + 0x100 >> 9 <=
                                    (long)puVar64) || (pMVar119->mode == '\x11')) ||
                                 (pMVar119->mode == '\r')) {
                                iVar52 = (pAVar133->sf).inter_sf.prune_ref_mv_idx_search;
                                if (iVar52 != 0 && '\0' < (char)local_61d4) {
                                  cVar77 = pMVar119->ref_frame[1];
                                  if (uVar84 == 0) {
                                    lVar109 = (ulong)('\0' < cVar77) + 1;
                                  }
                                  else {
                                    lVar109 = (ulong)('\0' < cVar77) + 1;
                                    puVar79 = (undefined1 *)((long)save_mv[0] + 2);
                                    for (uVar93 = 0; uVar93 != uVar84; uVar93 = uVar93 + 1) {
                                      if (save_mv[uVar93][0].as_int != 0x80008000) {
                                        iVar118 = 0;
                                        for (lVar60 = 0; lVar109 != lVar60; lVar60 = lVar60 + 1) {
                                          uVar100 = (int)*(short *)(puVar79 + lVar60 * 4 + -2) -
                                                    (int)pMVar119->mv[lVar60].as_mv.row;
                                          uVar53 = -uVar100;
                                          if (0 < (int)uVar100) {
                                            uVar53 = uVar100;
                                          }
                                          uVar101 = (int)*(short *)(puVar79 + lVar60 * 4) -
                                                    (int)*(short *)((long)pMVar119->mv +
                                                                   lVar60 * 4 + 2);
                                          uVar100 = -uVar101;
                                          if (0 < (int)uVar101) {
                                            uVar100 = uVar101;
                                          }
                                          iVar118 = (uVar53 & 0xffff) + iVar118 + (uVar100 & 0xffff)
                                          ;
                                        }
                                        if (((uint)local_6118 == -1) &&
                                           (iVar118 <=
                                            (int)(('\0' < cVar77) + 1 << ((char)iVar52 + 1U & 0x1f))
                                           )) {
                                          local_6118 = CONCAT44(local_6118._4_4_,0xffffffff);
                                          goto LAB_001f44cb;
                                        }
                                      }
                                      puVar79 = puVar79 + 8;
                                    }
                                    if (uVar84 != 1) goto LAB_001f397b;
                                  }
                                  for (lVar60 = 0; lVar109 != lVar60; lVar60 = lVar60 + 1) {
                                    (*local_6240)[lVar60] = pMVar119->mv[lVar60];
                                  }
                                }
LAB_001f397b:
                                iVar52 = (pAVar133->sf).gm_sf.prune_zero_mv_with_sse;
                                if ((iVar52 != 0) && ((uVar125 == 0x17 || (bVar108 == 0xf)))) {
                                  pMVar119 = *(x->e_mbd).mi;
                                  lVar60 = (ulong)('\0' < pMVar119->ref_frame[1]) + 1;
                                  lVar109 = 0;
LAB_001f39cb:
                                  if (lVar60 != lVar109) goto code_r0x001f39d4;
                                  local_60c0 = CONCAT44(local_60c0._4_4_,iVar52);
                                  local_61b0 = &pAVar133->ppi->fn_ptr[uVar103].vf;
                                  uVar53 = 0;
                                  uVar100 = 0;
                                  pbVar71 = (x->e_mbd).plane[0].pre;
                                  pAVar133 = cpi_00;
                                  local_61f0 = puVar64;
                                  local_61c8 = pMVar119;
                                  for (lVar109 = 0; lVar60 != lVar109; lVar109 = lVar109 + 1) {
                                    (**local_61b0)(pbVar71->buf,pbVar71->stride,x->plane[0].src.buf,
                                                   x->plane[0].src.stride,(uint *)ref_mv_match);
                                    uVar100 = uVar100 + ref_mv_match[0];
                                    uVar53 = uVar53 + local_1e58.best_single_sse_in_refs
                                                      [local_61c8->ref_frame[lVar109]];
                                    pbVar71 = pbVar71 + 1;
                                  }
                                  puVar64 = local_61f0;
                                  pMVar119 = local_61e8;
                                  cpi_00 = pAVar133;
                                  pAVar113 = pAVar133;
                                  if ((double)uVar100 <=
                                      (double)uVar53 *
                                      *(double *)(&DAT_00460660 + (ulong)(1 < (int)local_60c0) * 8))
                                  goto LAB_001f3be5;
                                  goto LAB_001f44cb;
                                }
LAB_001f3be5:
                                skip_build_pred = 0;
                                iVar52 = (x->e_mbd).mi_row;
                                iVar118 = (x->e_mbd).mi_col;
                                if ((char)local_61d4 < '\x01') {
                                  iVar127 = 0;
                                }
                                else {
                                  bVar40 = block_size_high[uVar103];
                                  if (block_size_wide[uVar103] < block_size_high[uVar103]) {
                                    bVar40 = block_size_wide[uVar103];
                                  }
                                  uVar53 = 0;
                                  pSVar21 = (cpi_00->common).seq_params;
                                  if (7 < bVar40) {
                                    uVar53 = (uint)(pSVar21->enable_masked_compound != '\0');
                                  }
                                  pMVar119 = *(x->e_mbd).mi;
                                  uVar129 = pSVar21->monochrome;
                                  is_luma_interp_done = 0;
                                  IVar43 = (cpi_00->common).features.interp_filter;
                                  if (IVar43 == MULTITAP_SHARP2) {
                                    IVar43 = EIGHTTAP_REGULAR;
                                  }
                                  (pMVar119->interp_filters).as_int = (uint)IVar43 * 0x10001;
                                  iVar70 = 0x7fffffffffffffff;
                                  if ((long)puVar64 < 0x57fffffffffffff5) {
                                    iVar70 = (long)puVar64 / 0xb << 4;
                                  }
                                  iVar127 = av1_compound_type_rd
                                                      (cpi_00,x,&local_1e58,bsize_00,cur_mv_1,0xf,
                                                       uVar53,(BUFFER_SET *)&single_mv.as_mv,
                                                       &tmp_dst,&x->comp_rd_buffer,&rate_mv,
                                                       (int64_t *)local_5f90,&local_6078,
                                                       (int64_t)puVar64,(int64_t)puStack_5ef0,
                                                       &is_luma_interp_done,iVar70);
                                  if ((puVar64 != (uint8_t *)0x7fffffffffffffff) &&
                                     (lVar109 = ((long)local_5f90 >> 4) * 0xb,
                                     lVar109 - (long)puVar64 != 0 && (long)puVar64 <= lVar109)) {
                                    local_6178 = CONCAT44(uStack_60c4,local_60c8);
                                    local_6188 = puStack_60d8;
                                    lStack_6180 = local_60d0;
                                    ref_mv_match[0] = (int)single_mv;
                                    ref_mv_match[1] = iStack_60e4;
                                    puStack_6190 = puStack_60e0;
                                    pbVar71 = local_5ff0;
                                    for (lVar109 = 0; pMVar119 = local_61e8, pAVar133 = cpi_00,
                                        pAVar113 = cpi_00,
                                        (ulong)(uVar129 == '\0') * 2 + 1 != lVar109;
                                        lVar109 = lVar109 + 1) {
                                      pbVar71->buf = *(uint8_t **)(ref_mv_match + lVar109 * 2);
                                      pbVar71->stride = *(int *)((long)&lStack_6180 + lVar109 * 4);
                                      pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                                    }
                                    goto LAB_001f44cb;
                                  }
                                  if (((pMVar119->interinter_comp).type == '\0') &&
                                     (is_luma_interp_done != 0)) {
                                    if (uVar129 == '\0') {
                                      av1_enc_build_inter_predictor
                                                (cm,xd,iVar52,iVar118,(BUFFER_SET *)&single_mv.as_mv
                                                 ,bsize_00,1,2);
                                    }
                                    skip_build_pred = 1;
                                  }
                                }
                                if (local_1e58.skip_ifs != false) goto LAB_001f3e49;
                                local_61c8 = (MB_MODE_INFO *)CONCAT44(local_61c8._4_4_,iVar52);
                                bVar76 = (char)local_61d4 < '\x01';
                                iVar70 = av1_interpolation_filter_search
                                                   (x,cpi_00,(TileDataEnc *)&local_6098->as_filters,
                                                    bsize_00,&tmp_dst,(BUFFER_SET *)&single_mv.as_mv
                                                    ,&rd,&rs,&skip_build_pred,&local_1e58,
                                                    (int64_t)puVar64);
                                if (local_1e58.modelled_rd != (int64_t (*) [3] [8])0x0 && bVar76) {
                                  local_1e58.modelled_rd[uVar125][uVar84][local_60b8] = rd;
                                }
                                pMVar119 = local_61e8;
                                pAVar133 = cpi_00;
                                pAVar113 = cpi_00;
                                if (iVar70 == 0) {
                                  if ((((cpi_00->sf).inter_sf.
                                        model_based_post_interp_filter_breakout == 0) ||
                                      (puVar64 == (uint8_t *)0x7fffffffffffffff)) ||
                                     ((rd >> 3) * 3 <= (long)puVar64)) {
                                    iVar52 = (int)local_61c8;
                                    if (local_1e58.modelled_rd != (int64_t (*) [3] [8])0x0 &&
                                        '\0' < (char)local_61d4) {
                                      lVar109 = local_1e58.modelled_rd
                                                [(byte)compound_ref0_mode_lut[uVar125]][uVar84]
                                                [local_60b8];
                                      lVar60 = local_1e58.modelled_rd
                                               [(byte)compound_ref1_mode_lut[uVar125]][uVar84]
                                               [uVar131 & 0xff];
                                      if (lVar109 < lVar60) {
                                        lVar60 = lVar109;
                                      }
                                      lVar109 = (rd >> 3) * 6;
                                      if ((lVar109 - lVar60 != 0 && lVar60 <= lVar109) &&
                                         (puVar64 != (uint8_t *)0x7fffffffffffffff)) {
                                        local_6178 = CONCAT44(uStack_60c4,local_60c8);
                                        local_6188 = puStack_60d8;
                                        lStack_6180 = local_60d0;
                                        ref_mv_match[0] = (int)single_mv;
                                        ref_mv_match[1] = iStack_60e4;
                                        puStack_6190 = puStack_60e0;
                                        pbVar71 = local_5ff0;
                                        for (lVar109 = 0; lVar104 != lVar109; lVar109 = lVar109 + 1)
                                        {
                                          pbVar71->buf = *(uint8_t **)(ref_mv_match + lVar109 * 2);
                                          pbVar71->stride =
                                               *(int *)((long)&lStack_6180 + lVar109 * 4);
                                          pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                                        }
                                        goto LAB_001f44cb;
                                      }
                                    }
LAB_001f3e49:
                                    iVar127 = iVar127 + local_6078.rate;
                                    local_6078.rate = iVar127;
                                    local_61f0 = puVar64;
                                    if (skip_build_pred != 1) {
                                      av1_enc_build_inter_predictor
                                                (cm,xd,iVar52,iVar118,(BUFFER_SET *)&single_mv.as_mv
                                                 ,bsize_00,0,
                                                 (uint)(((cpi_00->common).seq_params)->monochrome ==
                                                       '\0') * 2);
                                      iVar127 = local_6078.rate;
                                    }
                                    local_61c8 = (MB_MODE_INFO *)CONCAT44(local_61c8._4_4_,iVar127);
                                    pAVar113 = cpi_00;
                                    iVar70 = motion_mode_rd(cpi_00,(TileDataEnc *)
                                                                   &local_6098->as_filters,x,
                                                            bsize_00,&local_6078,&rd_stats_y,
                                                            &rd_stats_uv,&local_1e58,
                                                            (int64_t)local_61f0,
                                                            (int64_t *)local_5ef8,&rate_mv,
                                                            (BUFFER_SET *)&single_mv.as_mv,
                                                            &best_est_rd,(int)local_6208,pIVar17,0,
                                                            (int64_t *)local_5f90);
                                    pMVar119 = local_61e8;
                                    puVar64 = local_61f0;
                                    if (iVar70 != 0x7fffffffffffffff) {
                                      puVar62 = (uint8_t *)
                                                (local_6078.dist * 0x80 +
                                                ((long)x->rdmult * (long)local_6078.rate + 0x100 >>
                                                9));
                                      TVar44 = get_prediction_mode_idx
                                                         (local_61e8->mode,local_61e8->ref_frame[0],
                                                          local_61e8->ref_frame[1]);
                                      store_winner_mode_stats
                                                (cm,x,pMVar119,&local_6078,&rd_stats_y,&rd_stats_uv,
                                                 TVar44,puVar62,
                                                 (pAVar113->sf).winner_mode_sf.
                                                 multi_winner_mode_type,(int64_t)local_6208,
                                                 (int)pAVar113,(int)p);
                                      cpi_00 = pAVar113;
                                      if ((long)puVar62 < (long)local_5fc0) {
                                        local_5f48[0] = local_5f90[0];
                                        local_5f48[1] = local_5f90[1];
                                        _refs_1 = local_6078.rate;
                                        uStack_5f76._2_4_ = local_6078.zero_rate;
                                        lStack_5f70 = local_6078.dist;
                                        local_5f68 = local_6078.rdcost;
                                        iStack_5f60 = local_6078.sse;
                                        local_5f58 = local_6078.skip_txfm;
                                        uStack_5f57 = local_6078._33_7_;
                                        _single_refs = rd_stats_y.rate;
                                        uStack_5ee6._2_4_ = rd_stats_y.zero_rate;
                                        iStack_5ee0 = rd_stats_y.dist;
                                        local_5ed8 = rd_stats_y.rdcost;
                                        iStack_5ed0 = rd_stats_y.sse;
                                        local_5ec8 = rd_stats_y.skip_txfm;
                                        uStack_5ec7 = rd_stats_y._33_7_;
                                        best_rd_stats_uv.rate = rd_stats_uv.rate;
                                        best_rd_stats_uv.zero_rate = rd_stats_uv.zero_rate;
                                        best_rd_stats_uv.dist = rd_stats_uv.dist;
                                        best_rd_stats_uv.rdcost = rd_stats_uv.rdcost;
                                        best_rd_stats_uv.sse = rd_stats_uv.sse;
                                        best_rd_stats_uv.skip_txfm = rd_stats_uv.skip_txfm;
                                        best_rd_stats_uv._33_7_ = rd_stats_uv._33_7_;
                                        memcpy(&this_rd_cost,pMVar119,0xb0);
                                        uVar8 = (x->txfm_search_info).skip_txfm;
                                        sVar96 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                                        memcpy(dst_width1,local_61f8,sVar96);
                                        memcpy(dst_width2,(x->e_mbd).tx_type_map,sVar96);
                                        local_5f80 = rate_mv;
                                        local_5f84 = (int)local_61c8;
                                        local_5fc0 = puVar62;
                                        cpi_00 = pAVar113;
                                      }
                                      uVar53 = (uint)local_6118;
                                      if ((long)puVar62 < (long)local_61f0) {
                                        uVar53 = uVar78;
                                      }
                                      local_6118 = CONCAT44(local_6118._4_4_,uVar53);
                                      puVar64 = local_61f0;
                                      pAVar113 = cpi_00;
                                      if ((long)puVar62 < (long)local_61f0) {
                                        puVar64 = puVar62;
                                      }
                                    }
                                    local_6178 = CONCAT44(uStack_60c4,local_60c8);
                                    local_6188 = puStack_60d8;
                                    lStack_6180 = local_60d0;
                                    ref_mv_match[0] = (int)single_mv;
                                    ref_mv_match[1] = iStack_60e4;
                                    puStack_6190 = puStack_60e0;
                                    pbVar71 = local_5ff0;
                                    for (lVar109 = 0; pAVar133 = cpi_00, lVar104 != lVar109;
                                        lVar109 = lVar109 + 1) {
                                      pbVar71->buf = *(uint8_t **)(ref_mv_match + lVar109 * 2);
                                      pbVar71->stride = *(int *)((long)&lStack_6180 + lVar109 * 4);
                                      pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                                    }
                                  }
                                  else {
                                    local_6178 = CONCAT44(uStack_60c4,local_60c8);
                                    local_6188 = puStack_60d8;
                                    lStack_6180 = local_60d0;
                                    ref_mv_match[0] = (int)single_mv;
                                    ref_mv_match[1] = iStack_60e4;
                                    puStack_6190 = puStack_60e0;
                                    pbVar71 = local_5ff0;
                                    for (lVar109 = 0; lVar104 != lVar109; lVar109 = lVar109 + 1) {
                                      pbVar71->buf = *(uint8_t **)(ref_mv_match + lVar109 * 2);
                                      pbVar71->stride = *(int *)((long)&lStack_6180 + lVar109 * 4);
                                      pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                                    }
                                  }
                                }
                                else {
                                  local_6178 = CONCAT44(uStack_60c4,local_60c8);
                                  local_6188 = puStack_60d8;
                                  lStack_6180 = local_60d0;
                                  ref_mv_match[0] = (int)single_mv;
                                  ref_mv_match[1] = iStack_60e4;
                                  puStack_6190 = puStack_60e0;
                                  pbVar71 = local_5ff0;
                                  for (lVar109 = 0; lVar104 != lVar109; lVar109 = lVar109 + 1) {
                                    pbVar71->buf = *(uint8_t **)(ref_mv_match + lVar109 * 2);
                                    pbVar71->stride = *(int *)((long)&lStack_6180 + lVar109 * 4);
                                    pbVar71 = (buf_2d *)((long)(pbVar71 + 0x51) + 0x10);
                                  }
                                }
                              }
                            }
                          }
LAB_001f44cb:
                          local_6240 = local_6240 + 1;
                        }
                        aiVar97[0] = -1;
                        aiVar97[1] = 0x7fffffff;
                        lVar104 = 0x7fffffffffffffff;
                        if (local_5fc0 != (uint8_t *)0x7fffffffffffffff) {
                          local_6078.skip_txfm = local_5f58;
                          local_6078._33_7_ = uStack_5f57;
                          local_6078.rdcost = local_5f68;
                          local_6078.sse = iStack_5f60;
                          local_6078.rate = _refs_1;
                          local_6078.zero_rate = uStack_5f76._2_4_;
                          local_6078.dist = lStack_5f70;
                          rd_stats_y.rate = _single_refs;
                          rd_stats_y.zero_rate = uStack_5ee6._2_4_;
                          rd_stats_y.dist = iStack_5ee0;
                          rd_stats_y.rdcost = local_5ed8;
                          rd_stats_y.sse = iStack_5ed0;
                          rd_stats_y.skip_txfm = local_5ec8;
                          rd_stats_y._33_7_ = uStack_5ec7;
                          rd_stats_uv.rate = best_rd_stats_uv.rate;
                          rd_stats_uv.zero_rate = best_rd_stats_uv.zero_rate;
                          rd_stats_uv.dist = best_rd_stats_uv.dist;
                          rd_stats_uv.rdcost = best_rd_stats_uv.rdcost;
                          rd_stats_uv.sse = best_rd_stats_uv.sse;
                          rd_stats_uv.skip_txfm = best_rd_stats_uv.skip_txfm;
                          rd_stats_uv._33_7_ = best_rd_stats_uv._33_7_;
                          memcpy(local_61e8,&this_rd_cost,0xb0);
                          (x->txfm_search_info).skip_txfm = uVar8;
                          sVar96 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                          memcpy(local_61f8,dst_width1,sVar96);
                          memcpy((x->e_mbd).tx_type_map,dst_width2,sVar96);
                          lVar104 = local_6078.dist * 0x80 +
                                    ((long)x->rdmult * (long)local_6078.rate + 0x100 >> 9);
                          local_6078.rdcost = lVar104;
                          aiVar97 = local_5f48;
                        }
                        dst_width1[0] = (int)lVar104;
                        dst_width1[1] = (int)((ulong)lVar104 >> 0x20);
                        if ((pAVar133->common).current_frame.reference_mode == '\0') {
LAB_001f48c4:
                          if (lVar104 == 0x7fffffffffffffff) goto LAB_001f18ce;
                        }
                        else {
                          if (((local_1e58.skip_ifs != true) && (0xfb < (byte)(bVar45 - 0x11))) &&
                             (0 < (pAVar133->sf).inter_sf.prune_comp_search_by_single_result)) {
                            cVar77 = local_6168->ref_frame[0];
                            bVar108 = local_6168->mode;
                            uVar125 = (ulong)bVar108;
                            pAVar133 = pAVar113;
                            iVar52 = get_drl_refmv_count(x,pMVar65,bVar108);
                            local_61e0 = (int (*) [8])(uVar125 * 0xc0);
                            local_61c8 = (MB_MODE_INFO *)(long)cVar77;
                            piVar111 = *local_61e0 + (long)local_61c8 * 2;
                            lVar109 = *(long *)(local_3650 + (long)piVar111);
                            pbVar58 = local_3610 + (long)piVar111;
                            for (lVar60 = 1; lVar60 < iVar52; lVar60 = lVar60 + 1) {
                              if (*(long *)pbVar58 < lVar109) {
                                lVar109 = *(long *)pbVar58;
                              }
                              pbVar58 = pbVar58 + 0x40;
                            }
                            bVar76 = '\x04' < cVar77;
                            lVar60 = uVar125 - 0xd;
                            uVar84 = (ulong)bVar76;
                            lVar122 = uVar84 * 0x100 + lVar60 * 0x40 + -0x2348;
                            piVar106 = aiStack_217c + (ulong)bVar76 * 4 + uVar125;
                            uVar125 = (ulong)*piVar106;
                            puVar66 = local_267c +
                                      uVar125 * 4 + uVar84 * 0x40 + (ulong)bVar108 * 0x10;
                            while ((0 < (int)uVar125 &&
                                   (lVar130 = (uVar125 & 0xffffffff) * 0x10,
                                   lVar109 < *(long *)(abStack_2350 + lVar130 + lVar122 + 0x2340))))
                            {
                              *(undefined8 *)(abStack_2350 + lVar130 + lVar122 + 0x2350) =
                                   *(undefined8 *)(abStack_2350 + lVar130 + lVar122 + 0x2340);
                              *(undefined8 *)(abStack_2350 + lVar130 + lVar122 + 0x2350 + 8) =
                                   *(undefined8 *)(abStack_2350 + lVar130 + lVar122 + 0x2348);
                              uVar125 = (ulong)((int)uVar125 - 1);
                              puVar66 = puVar66 + -4;
                            }
                            *(long *)(puVar66 + -3) = lVar109;
                            *(char *)(puVar66 + -1) = cVar77;
                            *puVar66 = 1;
                            *piVar106 = *piVar106 + 1;
                            lVar109 = *(long *)((byte *)((long)*local_61e0 + (long)local_4910) +
                                               (long)local_61c8 * 8);
                            pbVar58 = (byte *)((long)piVar111 + (long)local_48d0);
                            for (lVar122 = 1; lVar122 < iVar52; lVar122 = lVar122 + 1) {
                              if (*(long *)pbVar58 < lVar109) {
                                lVar109 = *(long *)pbVar58;
                              }
                              pbVar58 = pbVar58 + 0x40;
                            }
                            lVar122 = lVar60 * 0x40 + (ulong)bVar76 * 0x100 + -0x2128;
                            piVar111 = local_1f28 + (ulong)bVar76 * 4 + lVar60;
                            uVar125 = (ulong)*piVar111;
                            puVar66 = local_245c +
                                      uVar84 * 0x40 + (ulong)bVar108 * 0x10 + uVar125 * 4;
                            for (; 0 < (int)uVar125; uVar125 = (ulong)((int)uVar125 - 1)) {
                              lVar130 = (uVar125 & 0xffffffff) * 0x10;
                              if (*(long *)(local_2138 + lVar130 + lVar122 + 0x2128) <= lVar109)
                              break;
                              lVar130 = lVar130 + lVar122;
                              lVar126 = *(long *)(local_2138 + lVar130 + 0x2130);
                              (&local_2128)
                              [(ulong)bVar76 * 0x20 + lVar60 * 8 + (uVar125 & 0xffffffff) * 2] =
                                   *(long *)(local_2138 + lVar130 + 0x2128);
                              (&local_2128 +
                              (ulong)bVar76 * 0x20 + lVar60 * 8 + (uVar125 & 0xffffffff) * 2)[1] =
                                   lVar126;
                              puVar66 = puVar66 + -4;
                            }
                            *(long *)(puVar66 + -3) = lVar109;
                            *(char *)(puVar66 + -1) = cVar77;
                            *puVar66 = 1;
                            *piVar111 = *piVar111 + 1;
                            pAVar113 = pAVar133;
                          }
                          if ((((byte)(bVar45 - 0x11) < 0xfc) ||
                              ((pAVar133->sf).inter_sf.prune_comp_using_best_single_mode_ref < 1))
                             || (alStack_2390[local_6160] <= lVar104)) goto LAB_001f48c4;
                          alStack_2390[local_6160] = lVar104;
                          abStack_2350[local_6160] = bVar45;
                        }
                        if (local_6168->skip_txfm != '\0') {
                          rd_stats_y._0_8_ = rd_stats_y._0_8_ & 0xffffffff00000000;
                          rd_stats_uv._0_8_ = rd_stats_uv._0_8_ & 0xffffffff00000000;
                        }
                        if ((byte)local_6148 == '\x01' &&
                            (pAVar133->sf).inter_sf.prune_compound_using_single_ref != 0) {
                          lVar109 = ref_frame_rd[local_6160];
                          if (lVar104 < ref_frame_rd[local_6160]) {
                            lVar109 = lVar104;
                          }
                          ref_frame_rd[local_6160] = lVar109;
                        }
                        adjust_cost(pAVar133,x,(int64_t *)dst_width1);
                        adjust_rdcost(pAVar133,x,&local_6078);
                        uVar27 = dst_width1._0_8_;
                        pAVar133 = pAVar113;
                        if ((long)dst_width1._0_8_ < (long)local_50e0._0_8_) {
                          local_4a50 = x->pred_sse[local_6160];
                          update_search_state((InterModeSearchState *)local_50e0,rd_cost,local_6108,
                                              &local_6078,&rd_stats_y,&rd_stats_uv,
                                              (THR_MODES)local_61a8,x,(int)local_6208);
                          if ((char)local_61c0 == '\0') {
                            local_50e0._8_4_ = local_5ef8[0];
                            local_50e0._12_4_ = local_5ef8[1];
                          }
                          local_50e0._16_8_ = puStack_5ef0;
                          local_6120[0] = aiVar97[0];
                          local_6120[1] = aiVar97[1];
                          pAVar133 = pAVar113;
                        }
                        iVar52 = local_1e58.skip_motion_mode;
                        if ((pAVar133->sf).winner_mode_sf.motion_mode_for_winner_cand != 0) {
                          uVar125 = 0;
                          if (0 < best_motion_mode_cands.num_motion_mode_cand) {
                            uVar125 = (ulong)(uint)best_motion_mode_cands.num_motion_mode_cand;
                          }
                          piVar73 = &best_motion_mode_cands.motion_mode_cand[0].rd_cost;
                          for (uVar84 = 0; uVar125 != uVar84; uVar84 = uVar84 + 1) {
                            if ((long)uVar27 < *piVar73) goto LAB_001f4a56;
                            piVar73 = piVar73 + 0x19;
                          }
                          uVar84 = (ulong)(uint)best_motion_mode_cands.num_motion_mode_cand;
LAB_001f4a56:
                          iVar118 = (int)uVar84;
                          if (iVar118 < (int)local_6110) {
                            if ((0 < best_motion_mode_cands.num_motion_mode_cand) &&
                               (iVar118 < local_5fe0)) {
                              iVar127 = best_motion_mode_cands.num_motion_mode_cand;
                              if (local_5fe0 <= best_motion_mode_cands.num_motion_mode_cand) {
                                iVar127 = local_5fe0;
                              }
                              memmove(&best_motion_mode_cands.motion_mode_cand[iVar118 + 1].mbmi,
                                      &best_motion_mode_cands.motion_mode_cand[iVar118].mbmi,
                                      (long)(iVar127 - iVar118) * 200);
                            }
                            memcpy(&best_motion_mode_cands.motion_mode_cand[iVar118].mbmi,local_6168
                                   ,0xb0);
                            best_motion_mode_cands.motion_mode_cand[iVar118].rate_mv = local_5f80;
                            best_motion_mode_cands.motion_mode_cand[iVar118].rate2_nocoeff =
                                 local_5f84;
                            best_motion_mode_cands.motion_mode_cand[iVar118].skip_motion_mode =
                                 iVar52;
                            best_motion_mode_cands.motion_mode_cand[iVar118].rd_cost = uVar27;
                            uVar78 = best_motion_mode_cands.num_motion_mode_cand + 1;
                            if ((int)local_6110 <= best_motion_mode_cands.num_motion_mode_cand) {
                              uVar78 = local_6110;
                            }
                            best_motion_mode_cands.num_motion_mode_cand = uVar78;
                          }
                        }
                        iVar52 = x->rdmult;
                        bVar76 = (pAVar133->common).current_frame.reference_mode == '\x02';
                        iVar118 = 0;
                        if (bVar76) {
                          iVar118 = local_5fe4;
                        }
                        iVar127 = local_5fe4;
                        if (bVar76) {
                          iVar127 = 0;
                        }
                        lVar104 = ((long)(local_6078.rate - iVar118) * (long)iVar52 + 0x100 >> 9) +
                                  local_6078.dist * 0x80;
                        if ((char)bVar47 < '\x01') {
                          plVar5 = local_4a48;
                          lVar109 = local_4a48[0];
                        }
                        else {
                          plVar5 = local_4a48 + 1;
                          lVar109 = local_4a48[1];
                        }
                        if (lVar104 < lVar109) {
                          *plVar5 = lVar104;
                        }
                        lVar104 = ((long)(local_6078.rate + iVar127) * (long)iVar52 + 0x100 >> 9) +
                                  local_6078.dist * 0x80;
                        pAVar113 = pAVar133;
                        if (lVar104 < local_4a48[2]) {
                          local_4a48[2] = lVar104;
                        }
                      }
                    }
                    else if (iVar52 < 3) {
                      dst_width1[0] = 0;
                      dst_width1[1] = 0;
                      if ((x->e_mbd).left_available == true) {
                        match_ref_frame((x->e_mbd).left_mbmi,pMVar2,dst_width1);
                      }
                      if ((x->e_mbd).up_available == true) {
                        match_ref_frame((x->e_mbd).above_mbmi,pMVar2,dst_width1);
                      }
                      if (iVar52 <= dst_width1[1] + dst_width1[0]) goto LAB_001f2514;
                    }
                  }
                }
              }
              else {
                pMVar119 = x->mb_mode_cache;
                bVar41 = pMVar119->mode;
                bVar9 = pMVar119->ref_frame[1];
                if ((0xc < bVar41) || (bVar41 == bVar45)) {
                  if ((char)bVar9 < '\x01') {
                    if ((bVar41 == bVar45) && (bVar108 == pMVar119->ref_frame[0]))
                    goto LAB_001f1978;
                  }
                  else if ((char)bVar47 < '\x01') {
                    if ((bVar41 & 0xfd) == 0x14) {
                      bVar9 = pMVar119->ref_frame[0];
                    }
                    else if (bVar41 != 0x13) {
                      if (bVar41 == 0x18) {
                        iVar52 = 1;
                        if (bVar108 == pMVar119->ref_frame[0]) goto LAB_001f1b43;
                      }
                      else if (bVar41 != 0x15) goto LAB_001f18ce;
                    }
                    iVar52 = 1;
                    if (bVar108 == bVar9) goto LAB_001f1b43;
                  }
                  else if (((bVar41 == bVar45) && (bVar108 == pMVar119->ref_frame[0])) &&
                          (bVar47 == bVar9)) goto LAB_001f1978;
                }
              }
            }
          }
        }
      }
    }
LAB_001f18ce:
  }
  if ((pAVar133->sf).winner_mode_sf.motion_mode_for_winner_cand != 0) {
    uVar124 = (ulong)(uint)best_motion_mode_cands.num_motion_mode_cand;
    if (best_motion_mode_cands.num_motion_mode_cand < 1) {
      uVar124 = 0;
    }
    pMVar63 = *(x->e_mbd).mi;
    pIVar17 = x->inter_modes_info;
    lVar57 = 0xa30;
    if (((pAVar133->common).seq_params)->monochrome == '\0') {
      lVar57 = 0x1e90;
    }
    pAVar133 = pAVar113;
    for (uVar125 = 0; pAVar113 = pAVar133, uVar125 != uVar124; uVar125 = uVar125 + 1) {
      stack0xffffffffffffa420 = (uint8_t *)0x0;
      local_5bd0 = (uint8_t *)0x0;
      local_5bc8[0] = 1;
      dst_width1._0_8_ = dst_width1._0_8_ & 0xffffffff;
      stack0xffffffffffffa820 = (uint8_t *)0x0;
      local_57d0 = (uint8_t *)0x0;
      local_57c8 = CONCAT31(local_57c8._1_3_,'\x01');
      dst_width2[0] = 0;
      dst_width2[1] = 0;
      this_rd_cost.dist = 0;
      this_rd_cost.rdcost = 0;
      this_rd_cost.sse = 0;
      this_rd_cost.skip_txfm = '\x01';
      this_rd_cost.rate = 0;
      this_rd_cost.zero_rate = 0;
      tmp_dst.plane[0] =
           (uint8_t *)
           CONCAT44(tmp_dst.plane[0]._4_4_,best_motion_mode_cands.motion_mode_cand[uVar125].rate_mv)
      ;
      local_1e58.skip_motion_mode =
           best_motion_mode_cands.motion_mode_cand[uVar125].skip_motion_mode;
      memcpy(pMVar63,&best_motion_mode_cands.motion_mode_cand[uVar125].mbmi,0xb0);
      dst_width1[0] = best_motion_mode_cands.motion_mode_cand[uVar125].rate2_nocoeff;
      if (0xfb < (byte)(pMVar63->mode - 0x11)) {
        (x->txfm_search_info).skip_txfm = '\0';
        ref_searched = (int  [2])(x->e_mbd).plane[0].dst.buf;
        auStack_6030._8_8_ = (x->e_mbd).plane[2].dst.buf;
        auStack_6030._0_8_ = (x->e_mbd).plane[1].dst.buf;
        local_6020 = CONCAT44((x->e_mbd).plane[1].dst.stride,(x->e_mbd).plane[0].dst.stride);
        local_6018 = CONCAT44(local_6018._4_4_,(x->e_mbd).plane[2].dst.stride);
        set_ref_ptrs(cm,xd,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
        puVar64 = local_6208;
        pMVar63->motion_mode = '\0';
        cVar77 = pMVar63->ref_frame[1];
        pbVar71 = yv12_mb[0];
        for (lVar104 = 0; lVar57 != lVar104; lVar104 = lVar104 + 0xa30) {
          uVar27 = pbVar71[(long)pMVar63->ref_frame[0] * 3].buf;
          uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 8);
          uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x18);
          puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].width + lVar104);
          *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x10);
          puVar6[1] = uVar29;
          puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + lVar104);
          *puVar6 = uVar27;
          puVar6[1] = uVar28;
          if ('\0' < cVar77) {
            uVar27 = pbVar71[(long)pMVar63->ref_frame[1] * 3].buf;
            uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 8);
            uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x18);
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].width + lVar104);
            *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x10);
            puVar6[1] = uVar29;
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].buf + lVar104);
            *puVar6 = uVar27;
            puVar6[1] = uVar28;
          }
          pbVar71 = pbVar71 + 1;
        }
        ref_mv_match[0] = local_50e0._8_4_;
        ref_mv_match[1] = local_50e0._12_4_;
        puStack_6190 = (uint8_t *)local_50e0._16_8_;
        single_mv = (int_mv)0xffffffff;
        iStack_60e4 = 0x7fffffff;
        iVar70 = motion_mode_rd(pAVar133,(TileDataEnc *)&local_6098->as_filters,x,bsize_00,
                                (RD_STATS *)dst_width1,(RD_STATS *)dst_width2,&this_rd_cost,
                                &local_1e58,local_50e0._0_8_,(int64_t *)ref_mv_match,(int *)&tmp_dst
                                ,(BUFFER_SET *)ref_searched,&best_est_rd,(int)local_6208,pIVar17,1,
                                (int64_t *)&single_mv.as_int);
        if (iVar70 != 0x7fffffffffffffff) {
          puVar62 = (uint8_t *)
                    ((long)stack0xffffffffffffa420 * 0x80 +
                    ((long)x->rdmult * (long)dst_width1[0] + 0x100 >> 9));
          TVar44 = get_prediction_mode_idx
                             (pMVar63->mode,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
          store_winner_mode_stats
                    (cm,x,pMVar63,(RD_STATS *)dst_width1,(RD_STATS *)dst_width2,&this_rd_cost,TVar44
                     ,puVar62,(pAVar133->sf).winner_mode_sf.multi_winner_mode_type,(int64_t)puVar64,
                     (int)pAVar133,(int)p);
          if ((long)puVar62 < (long)local_50e0._0_8_) {
            local_6120[0] = (int)single_mv;
            local_6120[1] = iStack_60e4;
            update_search_state((InterModeSearchState *)local_50e0,rd_cost,local_6108,
                                (RD_STATS *)dst_width1,(RD_STATS *)dst_width2,&this_rd_cost,TVar44,x
                                ,(int)local_6208);
            if ((char)local_61c0 == '\0') {
              local_50e0._8_4_ = ref_mv_match[0];
              local_50e0._12_4_ = ref_mv_match[1];
            }
          }
        }
      }
    }
  }
  if ((char)local_61c0 != '\0') {
    uVar8 = ((pAVar133->common).seq_params)->monochrome;
    uVar124 = 0;
    uVar53 = av1_get_skip_txfm_context(xd);
    pMVar63 = *(x->e_mbd).mi;
    piVar22 = x->inter_modes_info;
    uVar78 = piVar22->num;
    if ((long)(int)uVar78 != 0) {
      iVar49 = 0;
      uVar124 = 0;
      if (0 < (int)uVar78) {
        uVar124 = (ulong)uVar78;
      }
      for (lVar57 = 0; uVar124 * 8 != lVar57; lVar57 = lVar57 + 8) {
        *(int *)((long)&piVar22->rd_idx_pair_arr[0].idx + lVar57 * 2) = iVar49;
        *(undefined8 *)((long)&piVar22->rd_idx_pair_arr[0].rd + lVar57 * 2) =
             *(undefined8 *)((long)piVar22->est_rd_arr + lVar57);
        iVar49 = iVar49 + 1;
      }
      uVar124 = 0;
      qsort(piVar22->rd_idx_pair_arr,(long)(int)uVar78,0x10,compare_rd_idx_pair);
    }
    local_50e0._0_8_ = best_rd_so_far;
    local_5018.rdcost._0_1_ = 0xff;
    x->winner_mode_count = 0;
    pRVar120 = (RD_STATS *)0x0;
    pAVar133 = pAVar113;
    store_winner_mode_stats
              (cm,x,pMVar63,(RD_STATS *)0x0,(RD_STATS *)0x0,(RD_STATS *)0x0,0xff,
               (uint8_t *)best_rd_so_far,(pAVar113->sf).winner_mode_sf.multi_winner_mode_type,
               uVar124 & 0xffffffff00000000,(int)pAVar113,(int)p);
    iVar49 = (pAVar113->sf).rt_sf.num_inter_modes_for_tx_search;
    if (piVar22->num < iVar49) {
      iVar49 = piVar22->num;
    }
    piVar22->num = iVar49;
    if (iVar49 < 1) {
      local_6148 = (uint8_t *)0x43e0000000000000;
    }
    else {
      local_6148 = (uint8_t *)(double)piVar22->est_rd_arr[piVar22->rd_idx_pair_arr[0].idx];
    }
    lVar57 = (long)(pAVar133->sf).inter_sf.limit_inter_mode_cands;
    local_61a8 = (uint8_t *)CONCAT44(local_61a8._4_4_,0x7fffffff);
    local_6110 = 0x7fffffff;
    if (lVar57 != 0) {
      local_6110 = *(uint *)(&DAT_00461390 + lVar57 * 4);
    }
    lVar57 = (long)(pAVar133->sf).inter_sf.limit_txfm_eval_per_mode;
    if (lVar57 != 0) {
      local_61a8 = (uint8_t *)CONCAT44(local_61a8._4_4_,*(undefined4 *)(&DAT_00461c30 + lVar57 * 4))
      ;
    }
    local_6150 = piVar22->mbmi_arr;
    local_61c0 = (x->mode_costs).skip_txfm_cost;
    local_5bc8 = ZEXT816(0);
    local_5bd0 = (uint8_t *)0x0;
    dst_width1[0] = 0;
    dst_width1[1] = 0;
    stack0xffffffffffffa420 = (uint8_t *)0x0;
    lVar57 = 0xa30;
    if (uVar8 == '\0') {
      lVar57 = 0x1e90;
    }
    local_6158 = (MB_MODE_INFO *)(ulong)uVar53;
    local_6120[0] = -1;
    local_6120[1] = 0x7fffffff;
    iVar51 = 0;
    bVar135 = false;
    local_6208 = (uint8_t *)0x7fffffffffffffff;
    for (lVar104 = 0; pAVar113 = pAVar133, lVar104 < iVar49; lVar104 = lVar104 + 1) {
      iVar52 = piVar22->rd_idx_pair_arr[lVar104].idx;
      memcpy(pMVar63,local_6150 + iVar52,0xb0);
      pAVar113 = pAVar133;
      if ((double)local_6148 < (double)piVar22->est_rd_arr[iVar52] * 0.8) break;
      bVar45 = pMVar63->mode;
      if ((int)local_61a8 < iVar51) {
        if (bVar45 == 0xd) {
          if (dst_width1[0] < 2) goto LAB_001f5745;
        }
        else if (*(int *)(interintra_modes + (ulong)bVar45 * 4 + -0xc) < 1) goto LAB_001f5745;
      }
      else {
LAB_001f5745:
        (x->txfm_search_info).skip_txfm = '\0';
        set_ref_ptrs(cm,xd,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
        cVar77 = pMVar63->ref_frame[1];
        pbVar71 = yv12_mb[0];
        for (lVar109 = 0; lVar57 != lVar109; lVar109 = lVar109 + 0xa30) {
          uVar27 = pbVar71[(long)pMVar63->ref_frame[0] * 3].buf;
          uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 8);
          uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x18);
          puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].width + lVar109);
          *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x10);
          puVar6[1] = uVar29;
          puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + lVar109);
          *puVar6 = uVar27;
          puVar6[1] = uVar28;
          if ('\0' < cVar77) {
            uVar27 = pbVar71[(long)pMVar63->ref_frame[1] * 3].buf;
            uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 8);
            uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x18);
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].width + lVar109);
            *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x10);
            puVar6[1] = uVar29;
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].buf + lVar109);
            *puVar6 = uVar27;
            puVar6[1] = uVar28;
          }
          pbVar71 = pbVar71 + 1;
        }
        iVar118 = piVar22->mode_rate_arr[iVar52];
        iVar127 = (pAVar133->sf).inter_sf.txfm_rd_gate_level[0];
        skip_rd[0] = -1;
        skip_rd[1] = 0x7fffffff;
        if (iVar127 != 0) {
          skip_rd = (int  [2])
                    (piVar22->sse_arr[iVar52] * 0x80 +
                    ((long)x->rdmult * (long)iVar118 + 0x100 >> 9));
          iVar52 = check_txfm_eval(x,bsize_00,local_50e0._8_8_,(int64_t)skip_rd,iVar127,
                                   (int)pRVar120);
          if (iVar52 == 0) goto LAB_001f5c3a;
        }
        local_6200 = (BLOCK_SIZE (*) [2] [2])(long)iVar118;
        local_60a0 = skip_rd;
        av1_enc_build_inter_predictor
                  (cm,xd,(int)local_6128,iVar50,(BUFFER_SET *)0x0,bsize_00,0,
                   (uint)(((pAVar133->common).seq_params)->monochrome == '\0') * 2);
        if (pMVar63->motion_mode == '\x01') {
          av1_build_obmc_inter_predictors_sb(cm,xd);
        }
        uVar78 = bVar45 - 0x10;
        pRVar120 = (RD_STATS *)ref_searched;
        if (((8 < (byte)uVar78) || (bVar76 = true, (0x139U >> (uVar78 & 0x1f) & 1) == 0)) &&
           (bVar76 = bVar135, bVar45 == 0x16)) {
          bVar76 = true;
        }
        *(int *)(interintra_modes + (ulong)bVar45 * 4 + -0xc) =
             *(int *)(interintra_modes + (ulong)bVar45 * 4 + -0xc) + 1;
        iVar52 = av1_txfm_search(pAVar133,x,bsize_00,(RD_STATS *)dst_width2,&this_rd_cost,pRVar120,
                                 (int)local_6200,local_50e0._0_8_);
        puVar64 = stack0xffffffffffffa820;
        iVar70 = this_rd_cost.dist;
        if (iVar52 != 0) {
          if ((uint8_t)local_57c8 == '\0') {
            iVar52 = local_61c0[(long)local_6158][0] + this_rd_cost.rate;
          }
          else {
            iVar52 = local_61c0[(long)local_6158][1];
          }
          lVar60 = (long)x->rdmult;
          lVar109 = lVar60;
          if ((pAVar133->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
            local_60f0 = lVar60;
            inter_mode_data_push
                      ((TileDataEnc *)&local_6098->as_filters,pMVar63->bsize,(int64_t)local_57d0,
                       (int64_t)stack0xffffffffffffa820,
                       ref_searched[0] + this_rd_cost.rate +
                       local_61c0[(long)local_6158][pMVar63->skip_txfm]);
            lVar60 = (long)x->rdmult;
            lVar109 = local_60f0;
          }
          puVar64 = (uint8_t *)((long)puVar64 * 0x80 + (dst_width2[0] * lVar60 + 0x100 >> 9));
          if ((long)puVar64 < (long)local_6208) {
            local_6208 = puVar64;
            local_6120 = (int  [2])
                         (iVar70 * 0x80 + ((int)(iVar52 + (uint)local_6200) * lVar109 + 0x100 >> 9))
            ;
          }
          TVar44 = get_prediction_mode_idx(bVar45,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
          rd_cost_uv = (RD_STATS *)ref_searched;
          pRVar120 = rd_cost_uv;
          store_winner_mode_stats
                    (cm,x,pMVar63,(RD_STATS *)dst_width2,&this_rd_cost,rd_cost_uv,TVar44,puVar64,
                     (pAVar133->sf).winner_mode_sf.multi_winner_mode_type,1,(int)pAVar133,(int)p);
          if ((long)puVar64 < (long)local_50e0._0_8_) {
            update_search_state((InterModeSearchState *)local_50e0,rd_cost,local_6108,
                                (RD_STATS *)dst_width2,&this_rd_cost,rd_cost_uv,TVar44,x,1);
            local_50e0._8_4_ = local_60a0[0];
            local_50e0._12_4_ = local_60a0[1];
            lVar109 = (long)(pAVar133->sf).inter_sf.inter_mode_txfm_breakout;
            pRVar120 = rd_cost_uv;
            if (lVar104 == 0 && lVar109 != 0) {
              if ((uint8_t)local_57c8 == '\0' && local_5038 == 0) {
                if (local_50b7 < '\x01') goto LAB_001f5c2a;
                pTVar72 = single_inter_to_mode_idx[lVar109 * 2 + 2] + (long)(x->qindex >> 6) * 4;
              }
              else {
                pTVar72 = &DAT_004613b0 + (long)(x->qindex * 5 >> 8) * 4;
              }
              iVar49 = piVar22->num;
              if (*(int *)pTVar72 < piVar22->num) {
                iVar49 = *(int *)pTVar72;
              }
            }
          }
LAB_001f5c2a:
          if (((int)local_6110 <= iVar51) && (pAVar113 = pAVar133, bVar76)) break;
        }
        iVar51 = iVar51 + 1;
        bVar135 = bVar76;
      }
LAB_001f5c3a:
    }
  }
  BVar39 = (pAVar133->sf).rt_sf.prune_intra_mode_based_on_mv_range;
  if (((BVar39 == BLOCK_4X4) || ((BLOCK_SIZE)local_6140 <= (pAVar133->sf).part_sf.max_intra_bsize))
     || ('\0' < local_50b7)) {
LAB_001f5cb3:
    uVar78 = (pAVar133->sf).intra_sf.skip_intra_in_interframe;
    if ((uVar78 != 0) && (1 < x->source_variance)) {
      if ((local_5038 != 0 && 1 < (int)uVar78) &&
         ((((0x18 < local_50c6 || ((0x1790000U >> (local_50c6 & 0x1f) & 1) == 0)) &&
           (x->qindex <= *(int *)(&DAT_00460698 + (ulong)(uVar78 != 2) * 4))) ||
          ((long)(local_60f8 | local_5fb0) < 0 && 3 < uVar78)))) goto LAB_001f5e4d;
      if (-1 < (long)(local_60f8 | local_5fb0)) {
        iVar49 = (pAVar133->common).width;
        iVar50 = (pAVar133->common).height;
        if (iVar49 < iVar50) {
          iVar50 = iVar49;
        }
        pNVar134 = &av1_intrap_hd_nn_config;
        if (iVar50 < 0x1e1) {
          pNVar134 = &av1_intrap_nn_config;
        }
        dst_width2[0] = 0;
        dst_width2[1] = 0;
        dst_width1[1] = (int)(float)""[uVar103];
        dst_width1[0] = (int)(float)local_5038;
        stack0xffffffffffffa420 = (uint8_t *)CONCAT44((float)(long)local_5fb0,(float)""[uVar103]);
        av1_ac_quant_QTX(x->qindex,0,(x->e_mbd).bd);
        av1_ac_quant_QTX(0xff,0,(x->e_mbd).bd);
        (*av1_nn_predict)((float *)dst_width1,pNVar134,1,(float *)dst_width2);
        if ((float)dst_width2[0] + 1.4 < (float)dst_width2[1]) goto LAB_001f5e4d;
      }
    }
  }
  else {
    uVar78 = 0x10 << (BVar39 & (BLOCK_4X16|BLOCK_128X128));
    uVar85 = -local_50c0[0].as_mv.row;
    if (0 < (short)local_50c0[0]._0_2_) {
      uVar85 = local_50c0[0].as_mv.row;
    }
    if ((int)uVar78 <= (int)(uint)(ushort)uVar85) goto LAB_001f5cb3;
    uVar85 = -local_50c0[0].as_mv.col;
    if (0 < (short)local_50c0[0]._2_2_) {
      uVar85 = local_50c0[0].as_mv.col;
    }
    if ((uVar78 <= (ushort)uVar85) || (x->source_variance < 0x81)) goto LAB_001f5cb3;
LAB_001f5e4d:
    iStack_1ee4 = 1;
  }
  local_61c0 = (int (*) [2])CONCAT44(local_61c0._4_4_,ref_costs_single[0]);
  pMVar63 = *(x->e_mbd).mi;
  memcpy(&this_rd_cost,pMVar63,0xb0);
  bVar45 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar103];
  local_6200 = (BLOCK_SIZE (*) [2] [2])(ulong)bVar45;
  _single_refs = 0x7fffffffffffffff;
  for (lVar57 = 0; lVar57 != 4; lVar57 = lVar57 + 1) {
    pMVar65 = refs_1 + lVar57 * 8;
    pMVar65[0] = -1;
    pMVar65[1] = -1;
    pMVar65[2] = -1;
    pMVar65[3] = -1;
    pMVar65[4] = -1;
    pMVar65[5] = -1;
    pMVar65[6] = -1;
    pMVar65[7] = '\x7f';
  }
  uVar78 = 1;
  if (((pAVar113->oxcf).algo_cfg.sharpness == 0) ||
     ((((uint)(0x28ff00L >> (bsize_00 & 0x3f)) | (uint)(0x14fe80L >> (bsize_00 & 0x3f))) & 1) == 0))
  {
    sVar96 = (size_t)(1 << (bVar45 - 4 & 0x1f));
    bVar45 = 0xff;
    iVar49 = 0;
    uVar54 = mode_skip_mask.pred_modes[0];
    local_6238 = 0xffffffff;
    local_6250[0] = -1;
    local_6250[1] = 0x7fffffff;
    bVar135 = false;
    while ((iVar49 != 0x3d &&
           (((pAVar113->sf).intra_sf.skip_intra_in_interframe == 0 || (iStack_1ee4 == 0))))) {
      pAVar140 = pAVar113;
      set_y_mode_and_delta_angle
                (iVar49,pMVar63,(pAVar113->sf).intra_sf.prune_luma_odd_delta_angles_in_intra);
      bVar108 = pMVar63->mode;
      if ((uVar54 >> (bVar108 & 0x1f) & 1) == 0) {
        bVar47 = get_prediction_mode_idx(bVar108,'\0',-1);
        if ((pAVar113->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
          if ((2 < (byte)(bVar108 - 9)) || ((pAVar140->sf).intra_sf.disable_smooth_intra == 0)) {
LAB_001f5f9e:
            if (((bVar108 != 0xc) || ((pAVar140->oxcf).intra_mode_cfg.enable_paeth_intra != false))
               && (((byte)(bVar108 - 9) < 0xf8 ||
                   (((2 < (byte)local_6140 &&
                     ((pAVar140->oxcf).intra_mode_cfg.enable_angle_delta != false)) ||
                    (pMVar63->angle_delta[0] == '\0')))))) {
              init_mbmi(pMVar63,bVar108,av1_mode_defs[bVar47].ref_frame,cm);
              (x->txfm_search_info).skip_txfm = '\0';
              if (bVar108 == 0) {
LAB_001f6046:
                single_mv = (int_mv)0xffffffff;
                iStack_60e4 = 0x7fffffff;
                iVar50 = av1_handle_intra_y_mode
                                   ((IntraModeSearchState *)(local_1f08 + 0x20),pAVar140,x,bsize_00,
                                    (uint)local_61c0,local_6108,(RD_STATS *)ref_mv_match,
                                    local_50e0._0_8_,(int *)&tmp_dst,(int64_t *)&single_mv.as_int,
                                    (int64_t *)single_refs,(int64_t *)refs_1);
                if (_single_mv != (int  [2])0x7fffffffffffffff) {
                  adjust_cost(pAVar140,x,(int64_t *)&single_mv.as_int);
                }
                if (((iVar50 != 0) &&
                    (aiVar23[0] = (int)single_mv, aiVar23[1] = iStack_60e4,
                    (long)_single_mv < (long)local_6120)) &&
                   (bVar135 = true, (long)_single_mv < (long)local_6250)) {
                  local_6018 = local_6178;
                  local_6020 = lStack_6180;
                  ref_searched[0] = ref_mv_match[0];
                  ref_searched[1] = ref_mv_match[1];
                  auStack_6030._8_8_ = local_6188;
                  auStack_6030._0_8_ = puStack_6190;
                  local_6238 = (ulong)tmp_dst.plane[0] & 0xffffffff;
                  memcpy(&this_rd_cost,pMVar63,0xb0);
                  memcpy(dst_width1,local_61f8,sVar96);
                  memcpy(dst_width2,(x->e_mbd).tx_type_map,sVar96);
                  bVar135 = true;
                  local_6250 = aiVar23;
                  bVar45 = bVar47;
                }
              }
              else {
                uVar53 = (pAVar140->sf).rt_sf.mode_search_skip_flags;
                if (((9 < (byte)(bVar108 - 3)) || ((uVar53 & 8) == 0)) ||
                   (((THR_MODES)local_5018.rdcost == 0xff || (local_50b8 < '\x01')))) {
                  if ((uVar53 & 0x10) == 0) goto LAB_001f6046;
                  if (bVar108 == 8) {
                    if ((local_1f08[0x20] | 2) == 3) goto LAB_001f61d8;
                  }
                  else if (((bVar108 != 5) || (local_1f08[0x20] == 1)) || (local_1f08[0x20] == 4)) {
LAB_001f61d8:
                    if (((bVar108 != 7) || (0xfd < (byte)(local_1f08[0x20] - 4))) &&
                       ((bVar108 != 6 || ((local_1f08[0x20] - 2 & 0xfd) == 0)))) goto LAB_001f6046;
                  }
                }
              }
            }
          }
        }
        else if (2 < (byte)(bVar108 - 9)) goto LAB_001f5f9e;
      }
      iVar49 = iVar49 + 1;
      pAVar113 = pAVar140;
    }
    if (bVar135) {
      memcpy(pMVar63,&this_rd_cost,0xb0);
      memcpy(local_61f8,dst_width1,sVar96);
      memcpy((x->e_mbd).tx_type_map,dst_width2,sVar96);
      ref_mv_match[0] = 0;
      ref_mv_match[1] = 0;
      lStack_6180 = 0;
      local_6178 = CONCAT71(local_6178._1_7_,1);
      single_mv = (int_mv)0x0;
      iStack_60e4 = 0;
      puStack_60e0 = (uint8_t *)0x0;
      puStack_60d8 = (uint8_t *)0x0;
      local_60d0 = 0;
      local_60c8 = CONCAT31(local_60c8._1_3_,1);
      uVar8 = ((pAVar113->common).seq_params)->monochrome;
      pAVar140 = pAVar113;
      if ((uVar8 != '\0') ||
         (iVar49 = av1_search_intra_uv_modes_in_interframe
                             ((IntraModeSearchState *)(local_1f08 + 0x20),pAVar113,x,bsize_00,
                              (RD_STATS *)ref_mv_match,(RD_STATS *)ref_searched,
                              (RD_STATS *)&single_mv.as_mv,local_50e0._0_8_), pAVar140 = pAVar113,
         iVar49 != 0)) {
        local_6238._0_4_ = (int)local_6238 + ref_searched[0];
        ref_mv_match[0] = (int)local_6238;
        if (((byte)local_6140 != '\0') &&
           ((x->e_mbd).lossless[*(ushort *)&pMVar63->field_0xa7 & 7] == 0)) {
          iVar49 = 0;
          if ((x->txfm_search_params).tx_mode_search_type == '\x02') {
            lVar57 = (long)(x->mode_costs).skip_txfm_cost +
                     (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[uVar103] * 0x3c
                     + -0x24;
            for (pbVar58 = "" + uVar103; *pbVar58 != pMVar63->tx_size; pbVar58 = "" + *pbVar58) {
              lVar57 = lVar57 + 4;
            }
            _Var14 = (x->e_mbd).up_available;
            _Var15 = (x->e_mbd).left_available;
            bVar108 = *(x->e_mbd).above_txfm_context;
            if ((_Var14 == true) &&
               ((pMVar24 = (x->e_mbd).above_mbmi, (pMVar24->field_0xa7 & 0x80) != 0 ||
                ('\0' < pMVar24->ref_frame[0])))) {
              bVar108 = block_size_wide[pMVar24->bsize];
            }
            uVar53 = (uint)CONCAT71(0x461b,*(x->e_mbd).left_txfm_context);
            if ((_Var15 != false) &&
               ((pMVar24 = (x->e_mbd).left_mbmi, (pMVar24->field_0xa7 & 0x80) != 0 ||
                ('\0' < pMVar24->ref_frame[0])))) {
              uVar53 = (uint)block_size_high[pMVar24->bsize];
            }
            iVar49 = *(int *)(lVar57 + ((ulong)(byte)(_Var14 & tx_size_wide
                                                               [""[(*(x->e_mbd).mi)->bsize]] <=
                                                               (int)(uint)bVar108) +
                                       (ulong)(byte)(_Var15 & tx_size_high
                                                              [""[(*(x->e_mbd).mi)->bsize]] <=
                                                              (int)(uVar53 & 0xff))) * 0x14);
          }
          ref_searched[0] = ref_searched[0] - iVar49;
        }
        bVar108 = pMVar63->mode;
        if ((uVar8 == '\0') && ((x->e_mbd).is_chroma_ref == true)) {
          bVar40 = is_cfl_allowed(xd);
          bVar47 = pMVar63->uv_mode;
          iVar49 = (x->mode_costs).intra_uv_mode_cost[bVar40][bVar108][bVar47];
          iVar55.as_int = single_mv.as_int;
          bVar40 = (pMVar63->palette_mode_info).palette_size[1];
          iVar50 = av1_allow_palette((uint)(pAVar140->common).features.allow_screen_content_tools,
                                     pMVar63->bsize);
          if ((bVar47 == 0) &&
             ((iVar50 != 0 &&
              (iVar49 = iVar49 + (x->mode_costs).palette_uv_mode_cost
                                 [(pMVar63->palette_mode_info).palette_size[0] != '\0'][bVar40 != 0]
              , bVar40 != 0)))) {
            uVar53 = 0x1f;
            if (bVar40 != 0) {
              for (; bVar40 >> uVar53 == 0; uVar53 = uVar53 - 1) {
              }
            }
            iVar51 = (uVar53 ^ 0xffffffe0) + 0x21;
            iVar52 = iVar51 * 0x200;
            iVar50 = iVar52 + -0x200;
            if ((int)((1 << ((byte)iVar51 & 0x1f)) - (uint)bVar40) <=
                (int)(uint)*(x->e_mbd).plane[1].color_index_map) {
              iVar50 = iVar52;
            }
            iVar51 = (x->mode_costs).palette_y_size_cost[(ulong)local_6200 & 0xffffffff]
                     [(ulong)bVar40 + 5];
            iVar52 = av1_get_palette_cache(xd,1,(uint16_t *)&tmp_dst);
            iVar52 = av1_palette_color_cost_uv
                               (&pMVar63->palette_mode_info,(uint16_t *)&tmp_dst,iVar52,
                                ((pAVar140->common).seq_params)->bit_depth);
            iVar118 = av1_cost_color_map(x,1,bsize_00,pMVar63->tx_size,'\0');
            iVar49 = iVar49 + iVar51 + iVar50 + iVar118 + iVar52;
          }
          if ((2 < (byte)local_6140) && (0xf7 < (byte)(get_uv_mode_uv2y[bVar47] - 9))) {
            iVar49 = iVar49 + (x->mode_costs).angle_delta_cost
                              [(ulong)(byte)get_uv_mode_uv2y[bVar47] - 1]
                              [(long)pMVar63->angle_delta[1] + 3];
          }
          local_6238._0_4_ = iVar49 + iVar55.as_int + ref_mv_match[0];
          ref_mv_match[0] = (int)local_6238;
        }
        local_6178 = local_6178 & 0xffffffffffffff00;
        puVar64 = (uint8_t *)(auStack_6030._0_8_ + (long)puStack_60e0);
        uVar53 = av1_get_skip_txfm_context(xd);
        lVar57 = (long)(int)local_6238 + (long)(x->mode_costs).skip_txfm_cost[uVar53][0];
        ref_mv_match[0] = (int)lVar57;
        puVar64 = (uint8_t *)((long)puVar64 * 0x80 + (x->rdmult * lVar57 + 0x100 >> 9));
        if ((long)puVar64 < (long)local_4a58) {
          local_4a58 = puVar64;
          local_1f08[0x20] = bVar108;
        }
        for (lVar57 = 0xd3; lVar57 != 0xd6; lVar57 = lVar57 + 1) {
          puVar62 = *(uint8_t **)(local_50e0 + lVar57 * 8);
          if ((long)puVar64 <= (long)*(uint8_t **)(local_50e0 + lVar57 * 8)) {
            puVar62 = puVar64;
          }
          *(uint8_t **)(local_50e0 + lVar57 * 8) = puVar62;
        }
        pAVar113 = pAVar140;
        adjust_rdcost(pAVar140,x,(RD_STATS *)ref_mv_match);
        store_winner_mode_stats
                  (cm,x,pMVar63,(RD_STATS *)ref_mv_match,(RD_STATS *)ref_searched,
                   (RD_STATS *)&single_mv.as_mv,bVar45,puVar64,
                   (pAVar140->sf).winner_mode_sf.multi_winner_mode_type,1,(int)pAVar113,(int)p);
        if ((long)puVar64 < (long)local_50e0._0_8_) {
          update_search_state((InterModeSearchState *)local_50e0,rd_cost,local_6108,
                              (RD_STATS *)ref_mv_match,(RD_STATS *)ref_searched,
                              (RD_STATS *)&single_mv.as_mv,bVar45,x,1);
        }
      }
    }
  }
  if ((pAVar113->sf).winner_mode_sf.multi_winner_mode_type != '\0') {
    uVar78 = x->winner_mode_count;
  }
  iVar49 = local_5018.rate;
  iVar50 = local_5018.zero_rate;
  pMVar63 = *(x->e_mbd).mi;
  local_6150 = (MB_MODE_INFO *)
               CONCAT71(local_6150._1_7_,((pAVar113->common).seq_params)->monochrome);
  iVar51 = is_winner_mode_processing_enabled
                     (pAVar113,x,(MB_MODE_INFO *)(local_50e0 + 0x18),(uint)rd_cost->skip_txfm);
  if ((iVar51 != 0) &&
     (set_mode_eval_params(pAVar113,x,'\x02'), (THR_MODES)local_5018.rdcost != 0xff)) {
    local_61a8 = (uint8_t *)
                 (rd_cost->dist * 0x80 + ((long)x->rdmult * (long)rd_cost->rate + 0x100 >> 9));
    local_6120 = (int  [2])pMVar63->inter_tx_size;
    uVar125 = 0;
    uVar124 = (ulong)uVar78;
    if ((int)uVar78 < 1) {
      uVar124 = uVar125;
    }
    lVar57 = 0xa30;
    if ((char)local_6150 == '\0') {
      lVar57 = 0x1e90;
    }
    local_6148 = (uint8_t *)CONCAT44(local_6148._4_4_,iVar49);
    for (; uVar125 != uVar124; uVar125 = uVar125 + 1) {
      piVar73 = &local_5018.rdcost;
      pWVar98 = (WinnerModeStats *)(local_50e0 + 0x18);
      pRVar120 = rd_cost;
      iVar51 = iVar49;
      iVar52 = iVar50;
      if ((pAVar113->sf).winner_mode_sf.multi_winner_mode_type != '\0') {
        pWVar25 = x->winner_mode_stats;
        pWVar98 = pWVar25 + uVar125;
        pRVar120 = &pWVar25[uVar125].rd_cost;
        iVar51 = pWVar25[uVar125].rate_y;
        iVar52 = pWVar25[uVar125].rate_uv;
        piVar73 = (int64_t *)&pWVar25[uVar125].mode_index;
      }
      if (((x->e_mbd).lossless[*(ushort *)&(pWVar98->mbmi).field_0xa7 & 7] == 0) &&
         ((THR_MODES)*piVar73 != 0xff)) {
        local_6200 = (BLOCK_SIZE (*) [2] [2])CONCAT71(local_6200._1_7_,(THR_MODES)*piVar73);
        iVar118 = is_winner_mode_processing_enabled
                            (pAVar113,x,&pWVar98->mbmi,(uint)rd_cost->skip_txfm);
        if (iVar118 != 0) {
          iVar118 = pRVar120->rate;
          uVar78 = av1_get_skip_txfm_context(xd);
          memcpy(pMVar63,pWVar98,0xb0);
          set_ref_ptrs(cm,xd,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
          pbVar71 = yv12_mb[0];
          for (lVar104 = 0; lVar57 != lVar104; lVar104 = lVar104 + 0xa30) {
            uVar27 = pbVar71[(long)pMVar63->ref_frame[0] * 3].buf;
            uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 8);
            uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x18);
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].width + lVar104);
            *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x10);
            puVar6[1] = uVar29;
            puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + lVar104);
            *puVar6 = uVar27;
            puVar6[1] = uVar28;
            lVar109 = (long)pMVar63->ref_frame[1];
            if (0 < lVar109) {
              uVar27 = pbVar71[lVar109 * 3].buf;
              uVar28 = *(undefined8 *)((long)(pbVar71 + lVar109 * 3) + 8);
              uVar29 = *(undefined8 *)((long)(pbVar71 + lVar109 * 3) + 0x18);
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].width + lVar104);
              *puVar6 = *(undefined8 *)((long)(pbVar71 + lVar109 * 3) + 0x10);
              puVar6[1] = uVar29;
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].buf + lVar104);
              *puVar6 = uVar27;
              puVar6[1] = uVar28;
            }
            pbVar71 = pbVar71 + 1;
          }
          bVar45 = pMVar63->mode - 0x19;
          if (bVar45 < 0xf4) {
            av1_pick_uniform_tx_size_type_yrd
                      (pAVar113,x,(RD_STATS *)dst_width1,bsize_00,0x7fffffffffffffff);
          }
          else {
            iVar127 = (x->e_mbd).mi_row;
            iVar49 = (x->e_mbd).mi_col;
            pAVar140 = pAVar113;
            if (((((pAVar113->sf).winner_mode_sf.winner_mode_ifs == 0) ||
                 ((pAVar113->oxcf).mode != '\x01')) ||
                ((pAVar113->common).current_frame.reference_mode != '\0')) ||
               ((0xf7 < bVar45 || (pMVar63->motion_mode != '\0')))) {
LAB_001f6af3:
              av1_enc_build_inter_predictor
                        (cm,xd,iVar127,iVar49,(BUFFER_SET *)0x0,bsize_00,0,
                         (uint)(((pAVar113->common).seq_params)->monochrome == '\0') * 2);
              iVar49 = (int)local_6148;
            }
            else {
              uVar8 = ((pAVar113->common).seq_params)->monochrome;
              local_60b0 = (int (*) [2])CONCAT71(local_60b0._1_7_,uVar8);
              iVar128 = (pAVar113->common).width;
              iVar102 = (pAVar113->common).height;
              if (iVar128 < iVar102) {
                iVar102 = iVar128;
              }
              local_6208 = (uint8_t *)CONCAT44(local_6208._4_4_,iVar102);
              local_6128 = CONCAT44(local_6128._4_4_,iVar49);
              iVar128 = av1_is_interp_needed(xd);
              iVar49 = (int)local_6128;
              if (iVar128 == 0) goto LAB_001f6af3;
              local_6158 = *(x->e_mbd).mi;
              dst_width1._0_8_ = (x->e_mbd).plane[0].dst.buf;
              unique0x00012000 = (x->e_mbd).plane[1].dst.buf;
              local_5bd0 = (uint8_t *)
                           CONCAT44((x->e_mbd).plane[1].dst.stride,(x->e_mbd).plane[0].dst.stride);
              local_5bc8._0_4_ = (x->e_mbd).plane[2].dst.stride;
              local_60f0 = CONCAT44(local_60f0._4_4_,(uVar8 == '\0') + 1 + (uint)(uVar8 == '\0'));
              dst_width2._0_8_ = (uint8_t *)((ulong)x->tmp_pred_bufs[0] >> 1);
              if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
                dst_width2._0_8_ = x->tmp_pred_bufs[0];
              }
              unique0x00004880 = (uint8_t *)(dst_width2._0_8_ + 0x4000);
              local_57d0 = (uint8_t *)0x8000000080;
              local_57c8 = 0x80;
              ref_mv_match = (int  [2])dst_width1;
              piVar107 = (int_interpfilters *)&fast_interp_search_filters_ref_set;
              aiVar99[0] = 0;
              aiVar99[1] = 0;
              local_6110 = 0xffffffff;
              local_6140 = 0x7fffffffffffffff;
              iVar49 = (int)local_6148;
              iVar128 = (int)local_6128;
              for (; aiVar99 != (int  [2])0x3; aiVar99 = (int  [2])((long)aiVar99 + 1)) {
                if ((int)local_6208 < 0xf1) {
                  if (aiVar99 != (int  [2])0x1) {
LAB_001f7000:
                    this_rd_cost.skip_txfm = '\0';
                    this_rd_cost._33_7_ = 0;
                    this_rd_cost.rdcost = 0;
                    this_rd_cost.sse = 0;
                    this_rd_cost.rate = 0;
                    this_rd_cost.zero_rate = 0;
                    this_rd_cost.dist = 0;
                    local_6158->interp_filters = *piVar107;
                    local_60a0 = aiVar99;
                    local_6098 = piVar107;
                    av1_enc_build_inter_predictor_y(xd,iVar127,iVar128);
                    pAVar113 = pAVar140;
                    (*model_rd_sb_fn[(pAVar140->sf).rt_sf.use_simple_rd_model == 0])
                              (pAVar140,bsize_00,x,xd,0,0,&this_rd_cost.rate,&this_rd_cost.dist,
                               &this_rd_cost.skip_txfm,&this_rd_cost.sse,(int *)0x0,(int64_t *)0x0,
                               (int64_t *)0x0);
                    aiVar99 = local_60a0;
                    iVar49 = av1_get_switchable_rate
                                       (x,xd,(pAVar140->common).features.interp_filter,
                                        (uint)((pAVar140->common).seq_params)->enable_dual_filter);
                    lVar104 = (long)this_rd_cost.rate;
                    this_rd_cost.rate = (int)(iVar49 + lVar104);
                    uVar84 = this_rd_cost.dist * 0x80 +
                             ((long)x->rdmult * (iVar49 + lVar104) + 0x100 >> 9);
                    if ((long)uVar84 < (long)local_6140) {
                      swap_dst_buf(xd,(BUFFER_SET **)ref_mv_match,(int)local_60f0);
                      local_6110 = aiVar99[0];
                      local_6140 = uVar84;
                    }
                    piVar107 = local_6098;
                    iVar49 = (int)local_6148;
                    iVar128 = (int)local_6128;
                    pAVar140 = pAVar113;
                  }
                }
                else if (aiVar99 != (int  [2])0x2) goto LAB_001f7000;
                piVar107 = piVar107 + 1;
              }
              local_6158->interp_filters =
                   *(int_interpfilters *)(&fast_interp_search_filters_ref_set + (int)local_6110);
              if (dst_width1 == dst_width2) {
                swap_dst_buf(xd,(BUFFER_SET **)ref_mv_match,(int)local_60f0);
              }
              else {
                if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
                  pp_Var74 = &aom_convolve_copy;
                  puVar91 = (uint16_t *)dst_width1._0_8_;
                  puVar114 = (uint16_t *)dst_width2._0_8_;
                }
                else {
                  puVar114 = (uint16_t *)(dst_width2._0_8_ * 2);
                  puVar91 = (uint16_t *)(dst_width1._0_8_ * 2);
                  pp_Var74 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
                             &aom_highbd_convolve_copy;
                }
                (**pp_Var74)(puVar114,0x80,puVar91,(long)(int)local_5bd0,
                             (uint)block_size_wide[uVar103],(uint)block_size_high[uVar103]);
              }
              if ((char)local_60b0 == '\0') {
                av1_enc_build_inter_predictor
                          (cm,xd,iVar127,(int)local_6128,(BUFFER_SET *)0x0,bsize_00,1,2);
              }
            }
            pAVar113 = pAVar140;
            if (pMVar63->motion_mode == '\x01') {
              av1_build_obmc_inter_predictors_sb(cm,xd);
              pAVar113 = pAVar140;
            }
            av1_subtract_plane(x,bsize_00,0);
            if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
               ((x->e_mbd).lossless[*(ushort *)&pMVar63->field_0xa7 & 7] == 0)) {
              av1_pick_recursive_tx_size_type_yrd
                        (pAVar113,x,(RD_STATS *)dst_width1,bsize_00,0x7fffffffffffffff);
            }
            else {
              av1_pick_uniform_tx_size_type_yrd
                        (pAVar113,x,(RD_STATS *)dst_width1,bsize_00,0x7fffffffffffffff);
              auVar138 = ZEXT216(CONCAT11(pMVar63->tx_size,pMVar63->tx_size));
              auVar138 = pshuflw(auVar138,auVar138,0);
              uVar136 = auVar138._0_4_;
              *(undefined4 *)local_6120 = uVar136;
              *(undefined4 *)((long)local_6120 + 4) = uVar136;
              *(undefined4 *)((long)local_6120 + 8) = uVar136;
              *(undefined4 *)((long)local_6120 + 0xc) = uVar136;
              bVar45 = (x->e_mbd).height;
              bVar108 = (x->e_mbd).width;
              for (lVar104 = 0; (ulong)bVar108 * (ulong)bVar45 - lVar104 != 0; lVar104 = lVar104 + 1
                  ) {
                *(byte *)((long)local_61f8 + lVar104) =
                     *(uint8_t *)((long)local_61f8 + lVar104) & 0xfe | local_5bc8[0] != '\0';
              }
            }
          }
          if ((char)local_6150 == '\0') {
            av1_txfm_uvrd(pAVar113,x,(RD_STATS *)ref_searched,bsize_00,0x7fffffffffffffff);
          }
          else {
            auStack_6030 = (undefined1  [16])0x0;
            local_6020 = 0;
            local_6018 = CONCAT71(local_6018._1_7_,1);
            ref_searched[0] = 0;
            ref_searched[1] = 0;
          }
          iVar127 = (x->mode_costs).skip_txfm_cost[uVar78][0];
          if ((byte)(pMVar63->mode - 0x19) < 0xf4) {
            lVar109 = (long)x->rdmult;
            lVar60 = (long)(auStack_6030._0_8_ + (long)stack0xffffffffffffa420) * 0x80;
LAB_001f6d12:
            iVar128 = dst_width1[0] + iVar127;
            uVar136 = 0;
            lVar104 = lVar60;
            iVar127 = ref_searched[0];
          }
          else {
            lVar109 = (long)x->rdmult;
            lVar60 = (long)(auStack_6030._0_8_ + (long)stack0xffffffffffffa420) * 0x80;
            iVar128 = (x->mode_costs).skip_txfm_cost[uVar78][1];
            lVar104 = (long)(local_5bd0 + local_6020) * 0x80;
            if (((ref_searched[0] + dst_width1[0] + iVar127) * lVar109 + 0x100 >> 9) + lVar60 <=
                (iVar128 * lVar109 + 0x100 >> 9) + lVar104) goto LAB_001f6d12;
            ref_searched = (int  [2])((ulong)ref_searched & 0xffffffff00000000);
            stack0xffffffffffffa420 = local_5bd0;
            auStack_6030._0_8_ = local_6020;
            iVar127 = 0;
            uVar136 = 1;
          }
          dst_width1[0] = iVar128;
          iVar128 = (iVar118 - (iVar52 + iVar51)) + iVar127 + iVar128;
          puVar64 = (uint8_t *)((iVar128 * lVar109 + 0x100 >> 9) + lVar104);
          if ((long)puVar64 < (long)local_61a8) {
            memcpy(local_50e0 + 0x18,pMVar63,0xb0);
            pPVar35 = local_6108;
            local_5018.rdcost._0_1_ = (THR_MODES)local_6200;
            memcpy(local_6108->blk_skip,local_61f8,(long)local_6108->num_4x4_blk);
            iVar49 = (int)local_6148;
            memcpy(pPVar35->tx_type_map,(x->e_mbd).tx_type_map,(long)pPVar35->num_4x4_blk);
            rd_cost->rate = iVar128;
            rd_cost->dist = (int64_t)(auStack_6030._0_8_ + (long)stack0xffffffffffffa420);
            rd_cost->sse = (int64_t)(local_5bd0 + local_6020);
            rd_cost->rdcost = (int64_t)puVar64;
            local_5018.dist = CONCAT44(uVar136,(int)local_5018.dist);
            local_61a8 = puVar64;
          }
        }
      }
    }
  }
  pAVar140 = pAVar113;
  set_mode_eval_params(pAVar113,x,'\0');
  if (((((pAVar113->oxcf).tool_cfg.enable_palette == true) &&
       (iVar49 = av1_allow_palette((uint)(pAVar113->common).features.allow_screen_content_tools,
                                   local_6168->bsize), iVar49 != 0)) &&
      ((byte)(local_50c6 - 0x19) < 0xf4)) && (rd_cost->rate != 0x7fffffff)) {
    uVar78 = av1_search_palette_mode
                       ((IntraModeSearchState *)(local_1f08 + 0x20),pAVar113,x,bsize_00,
                        (uint)local_61c0,local_6108,&this_rd_cost,local_50e0._0_8_);
    if (this_rd_cost.rdcost < (long)local_50e0._0_8_) {
      local_5018.rdcost._0_1_ = 0x9c;
      local_6168->mv[0].as_int = 0;
      rd_cost->rate = this_rd_cost.rate;
      rd_cost->dist = this_rd_cost.dist;
      rd_cost->rdcost = this_rd_cost.rdcost;
      local_50e0._0_8_ = this_rd_cost.rdcost;
      memcpy(local_50e0 + 0x18,local_6168,0xb0);
      pPVar35 = local_6108;
      local_5018.dist = (int64_t)uVar78;
      memcpy(local_6108->blk_skip,local_61f8,(long)local_6108->num_4x4_blk);
      memcpy(pPVar35->tx_type_map,(x->e_mbd).tx_type_map,(long)pPVar35->num_4x4_blk);
    }
  }
  local_5021 = local_5021 & 0xffbf;
  if ((pAVar113->common).current_frame.skip_mode_info.skip_mode_flag != 0) {
    bVar45 = block_size_high[uVar103];
    if (block_size_wide[uVar103] < block_size_high[uVar103]) {
      bVar45 = block_size_wide[uVar103];
    }
    if ((7 < bVar45) &&
       (((pAVar140->common).seg.enabled == '\0' ||
        (((pAVar140->common).seg.feature_mask[*(ushort *)&local_6168->field_0xa7 & 7] & 0x20) == 0))
       )) {
      uVar8 = ((pAVar140->common).seq_params)->monochrome;
      pMVar63 = *(x->e_mbd).mi;
      x->compound_idx = '\x01';
      iVar49 = (pAVar140->common).current_frame.skip_mode_info.ref_frame_idx_0;
      if ((iVar49 != -1) &&
         ((iVar50 = (pAVar140->common).current_frame.skip_mode_info.ref_frame_idx_1, iVar50 != -1 &&
          (cVar77 = (char)iVar50 + '\x01', cVar77 != -1)))) {
        cVar46 = (char)iVar49 + '\x01';
        TVar44 = comp_inter_to_mode_idx[0][cVar46][cVar77];
        if ((TVar44 != 0xff) &&
           ((((pAVar140->oxcf).ref_frm_cfg.enable_onesided_comp == true &&
             ((pAVar140->sf).inter_sf.disable_onesided_comp == 0)) ||
            (pAVar140->all_one_sided_refs == 0)))) {
          pMVar63->mode = '\x11';
          pMVar63->uv_mode = '\0';
          pMVar63->ref_frame[0] = cVar46;
          pMVar63->ref_frame[1] = cVar77;
          bVar45 = av1_ref_frame_type(pMVar63->ref_frame);
          paCVar38 = local_5f98;
          pauVar37 = local_5fa0;
          if (local_6090[bVar45] == 0xff) {
            if ((local_6090[cVar46] == 0xff) || (local_6090[cVar77] == 0xff)) goto LAB_001f7c9c;
            av1_find_mv_refs(cm,xd,pMVar63,bVar45,local_6090,local_5f98,local_5fa0,
                             (int_mv (*) [2])0x0,local_5fa8,local_6040);
            local_5fd0[(char)bVar45] = *(uint16_t (*) [4])pauVar37[(char)bVar45];
            paCVar1 = paCVar38 + (char)bVar45;
            CVar30 = (*paCVar1)[0];
            CVar31 = (*paCVar1)[1];
            pCVar3 = paCVar38[(char)bVar45] + 2;
            CVar32 = pCVar3[1];
            pCVar4 = local_60a8->ref_mv_stack[(char)bVar45] + 2;
            *pCVar4 = *pCVar3;
            pCVar4[1] = CVar32;
            local_60a8->ref_mv_stack[(char)bVar45][0] = CVar30;
            local_60a8->ref_mv_stack[(char)bVar45][1] = CVar31;
          }
          lVar57 = 0;
          iVar49 = build_cur_mv(pMVar63->mv,'\x11',cm,x,0);
          if (iVar49 != 0) {
            (pMVar63->filter_intra_mode_info).use_filter_intra = '\0';
            pMVar63->interintra_mode = 0xff;
            uVar16 = *(ushort *)&pMVar63->field_0xa7;
            *(ushort *)&pMVar63->field_0xa7 = uVar16 & 0xfeff;
            bVar45 = x->compound_idx;
            (pMVar63->interinter_comp).type = '\0';
            pMVar63->motion_mode = '\0';
            pMVar63->skip_txfm = '\x01';
            *(ushort *)&pMVar63->field_0xa7 = (uVar16 & 0xfc8f) + (bVar45 & 1) * 0x200 + 0x40;
            (pMVar63->palette_mode_info).palette_size[0] = '\0';
            (pMVar63->palette_mode_info).palette_size[1] = '\0';
            IVar43 = (pAVar140->common).features.interp_filter;
            if (IVar43 == MULTITAP_SHARP2) {
              IVar43 = EIGHTTAP_REGULAR;
            }
            (pMVar63->interp_filters).as_int = (uint)IVar43 * 0x10001;
            set_ref_ptrs(cm,xd,pMVar63->ref_frame[0],pMVar63->ref_frame[1]);
            lVar104 = (ulong)(uVar8 == '\0') * 2 + 1;
            pbVar71 = yv12_mb[0];
            for (; lVar104 * 0xa30 - lVar57 != 0; lVar57 = lVar57 + 0xa30) {
              uVar27 = pbVar71[(long)pMVar63->ref_frame[0] * 3].buf;
              uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 8);
              uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x18);
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].width + lVar57);
              *puVar6 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[0] * 3) + 0x10);
              puVar6[1] = uVar29;
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + lVar57);
              *puVar6 = uVar27;
              puVar6[1] = uVar28;
              uVar27 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 8);
              uVar28 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x10);
              uVar29 = *(undefined8 *)((long)(pbVar71 + (long)pMVar63->ref_frame[1] * 3) + 0x18);
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].buf + lVar57);
              *puVar6 = pbVar71[(long)pMVar63->ref_frame[1] * 3].buf;
              puVar6[1] = uVar27;
              puVar6 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[1].width + lVar57);
              *puVar6 = uVar28;
              puVar6[1] = uVar29;
              pbVar71 = pbVar71 + 1;
            }
            pmVar34 = (x->e_mbd).plane;
            for (lVar57 = 6; pbVar71 = &pmVar34->dst, lVar57 - lVar104 != 6; lVar57 = lVar57 + 1) {
              auStack_5818[lVar57] = pbVar71->buf;
              dst_width2[lVar57] = pbVar71->stride;
              pmVar34 = (macroblockd_plane *)(pbVar71 + 0x51);
            }
            pAVar113 = pAVar140;
            uVar78 = av1_get_skip_mode_context(xd);
            local_6270 = 0x7fffffffffffffff;
            if (rd_cost->dist != 0x7fffffffffffffff) {
              local_6270 = 0x7fffffffffffffff;
              if ((long)rd_cost->rate != 0x7fffffff) {
                uVar124 = (long)(x->mode_costs).skip_mode_cost[uVar78][0] + (long)rd_cost->rate;
                lVar104 = (long)x->rdmult;
                lVar57 = rd_cost->dist * 0x80;
                local_6270 = ((long)(uVar124 * lVar104 + 0x100) >> 9) + lVar57;
                iVar49 = (int)uVar124;
                rd_cost->rate = iVar49;
                if ((iVar49 == 0x7fffffff) || (rd_cost->rdcost == 0x7fffffffffffffff)) {
                  rd_cost->rate = 0x7fffffff;
                  rd_cost->zero_rate = 0;
                  rd_cost->dist = 0x7fffffffffffffff;
                  rd_cost->rdcost = 0x7fffffffffffffff;
                  rd_cost->sse = 0x7fffffffffffffff;
                  rd_cost->skip_txfm = '\0';
                }
                else {
                  if (iVar49 < 0) {
                    lVar104 = -((long)((ulong)(uint)-iVar49 * lVar104 + 0x100) >> 9);
                  }
                  else {
                    lVar104 = (long)((uVar124 & 0xffffffff) * lVar104 + 0x100) >> 9;
                  }
                  rd_cost->rdcost = lVar104 + lVar57;
                }
              }
            }
            uVar8 = ((pAVar140->common).seq_params)->monochrome;
            iVar49 = (x->e_mbd).mi_row;
            local_61f8 = (scale_factors *)CONCAT44(local_61f8._4_4_,(x->e_mbd).mi_col);
            uVar78 = av1_get_skip_mode_context(xd);
            iVar50 = (x->mode_costs).skip_mode_cost[uVar78][1];
            lVar57 = (ulong)(uVar8 == '\0') * 2 + 1;
            local_61a8 = (uint8_t *)CONCAT44(local_61a8._4_4_,iVar50);
            piVar111 = &(x->e_mbd).plane[0].subsampling_y;
            lVar104 = 0;
            local_6200 = av1_ss_size_lookup + uVar103;
            puVar64 = (uint8_t *)0x7fffffffffffffff;
            lVar109 = 0;
            do {
              pAVar140 = pAVar113;
              if (lVar57 == lVar104) break;
              iVar51 = (int)lVar104;
              av1_enc_build_inter_predictor
                        (cm,xd,iVar49,(uint)local_61f8,(BUFFER_SET *)dst_width2,bsize_00,iVar51,
                         iVar51);
              BVar39 = (*local_6200)[piVar111[-1]][*piVar111];
              av1_subtract_plane(x,BVar39,iVar51);
              lVar60 = av1_pixel_diff_dist(x,iVar51,0,0,BVar39,BVar39,(uint *)0x0);
              if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
                bVar45 = (char)(x->e_mbd).bd * '\x02' - 0x10;
                lVar60 = (long)(lVar60 + (ulong)((uint)(1 << (bVar45 & 0x1f)) >> 1)) >>
                         (bVar45 & 0x3f);
              }
              lVar109 = lVar109 + lVar60 * 0x10;
              puVar64 = (uint8_t *)(lVar109 * 0x80 + ((long)x->rdmult * (long)iVar50 + 0x100 >> 9));
              lVar104 = lVar104 + 1;
              piVar111 = piVar111 + 0x28c;
              pAVar140 = pAVar113;
            } while ((long)puVar64 <= local_6270);
            local_5bc8._4_4_ = uStack_57c4;
            local_5bc8._0_4_ = local_57c8;
            local_5bd0 = local_57d0;
            dst_width1[0] = dst_width2[0];
            dst_width1[1] = dst_width2[1];
            stack0xffffffffffffa420 = stack0xffffffffffffa820;
            pmVar34 = (x->e_mbd).plane;
            for (lVar104 = 0; pbVar71 = &pmVar34->dst, lVar57 != lVar104; lVar104 = lVar104 + 1) {
              pbVar71->buf = *(uint8_t **)(dst_width1 + lVar104 * 2);
              pbVar71->stride = *(int *)(local_5bc8 + lVar104 * 4 + -8);
              pmVar34 = (macroblockd_plane *)(pbVar71 + 0x51);
            }
            if (((long)puVar64 <= local_6270) &&
               ((lVar109 == 0 || ((x->e_mbd).lossless[*(ushort *)&pMVar63->field_0xa7 & 7] == 0))))
            {
              local_5021 = local_5021 | 0x40;
              memcpy(local_50e0 + 0x18,pMVar63,0xb0);
              auVar138 = pshuflw(ZEXT216(CONCAT11(local_5037,local_5037)),
                                 ZEXT216(CONCAT11(local_5037,local_5037)),0);
              local_5036 = auVar138._0_4_;
              bVar45 = (x->e_mbd).width;
              bVar108 = (x->e_mbd).height;
              if (local_5038 == 0) {
                bVar135 = true;
              }
              else if ((pMVar63->field_0xa7 & 0x80) == 0) {
                bVar135 = pMVar63->ref_frame[0] < '\x01';
              }
              else {
                bVar135 = false;
              }
              uVar8 = bVar45 * '\x04';
              if (bVar135) {
                uVar8 = (uint8_t)tx_size_wide[local_5037];
              }
              uVar129 = bVar108 * '\x04';
              if (bVar135) {
                uVar129 = (uint8_t)tx_size_high[local_5037];
              }
              aTStack_5032 = local_5036;
              aTStack_502e = local_5036;
              aTStack_502a._0_4_ = local_5036;
              set_txfm_ctx((x->e_mbd).above_txfm_context,uVar8,(uint)bVar45);
              set_txfm_ctx((x->e_mbd).left_txfm_context,uVar129,(uint)bVar108);
              rd_cost->rate = (int)local_61a8;
              rd_cost->sse = lVar109;
              rd_cost->dist = lVar109;
              rd_cost->rdcost = (int64_t)puVar64;
              local_5018.dist = 0x100000001;
              (x->txfm_search_info).skip_txfm = '\x01';
              local_50e0._0_8_ = puVar64;
              local_5018.rdcost._0_1_ = TVar44;
            }
          }
        }
      }
    }
  }
LAB_001f7c9c:
  if (((local_50c6 & 0xf7) != 0x10 && (local_5021 & 0x30) != 0) &&
     ((0x16 < local_50c6 || ((0x644000U >> (local_50c6 & 0x1f) & 1) == 0)))) {
    local_5021 = local_5021 & 0xffcf;
  }
  if (((THR_MODES)local_5018.rdcost == 0xff) || (best_rd_so_far <= (long)local_50e0._0_8_)) {
    rd_cost->rate = 0x7fffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
  }
  else {
    if ((*local_6048 == 0) && (iVar49 = (pAVar140->sf).inter_sf.adaptive_rd_thresh, iVar49 != 0)) {
      av1_update_rd_thresh_fact
                (cm,x->thresh_freq_fact,iVar49,bsize_00,(THR_MODES)local_5018.rdcost,'\0',
                 (THR_MODES)local_6100,0x9c,0xa9);
    }
    pMVar63 = local_6168;
    memcpy(local_6168,local_50e0 + 0x18,0xb0);
    bVar45 = (x->txfm_search_info).skip_txfm | local_5018.dist._4_1_;
    (x->txfm_search_info).skip_txfm = bVar45;
    if ((pMVar63->mode == '\x17') || (pMVar63->mode == '\x0f')) {
      is_nontrans_global_motion(xd,*(x->e_mbd).mi);
    }
    (x->txfm_search_info).skip_txfm = bVar45 | (byte)local_5018.dist;
    store_coding_context(x,local_6108,(int)local_5018.dist);
    if ((local_6168->palette_mode_info).palette_size[1] != '\0') {
      av1_restore_uv_color_map(pAVar140,x);
    }
  }
  return;
  while (lVar60 = lVar122 + 0x10, bVar40 != *(byte *)((long)*paiVar69 + lVar122)) {
LAB_001f1e5e:
    lVar122 = lVar60;
    if (uVar84 * 0x10 + 0x10 == lVar122 + 0x10) goto LAB_001f1e78;
  }
  if (*(int *)((long)*paiVar69 + lVar122 + 4) != 0) {
LAB_001f1e78:
    uVar93 = (ulong)(iVar52 + 1);
    local_1f08[(long)iVar52 + lVar104 * 4 + (long)pMVar90 * 0x10] = bVar40;
  }
LAB_001f1e90:
  lVar109 = lVar109 + 1;
  goto LAB_001f1e12;
code_r0x001f39d4:
  pMVar2 = pMVar119->ref_frame + lVar109;
  if (((x->e_mbd).global_motion[*pMVar2].wmtype != '\0') ||
     (lVar109 = lVar109 + 1, local_1e58.best_single_sse_in_refs[*pMVar2] == 0x7fffffff))
  goto LAB_001f3be5;
  goto LAB_001f39cb;
}

Assistant:

void av1_rd_pick_inter_mode(struct AV1_COMP *cpi, struct TileDataEnc *tile_data,
                            struct macroblock *x, struct RD_STATS *rd_cost,
                            BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx,
                            int64_t best_rd_so_far) {
  AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  const int num_planes = av1_num_planes(cm);
  const SPEED_FEATURES *const sf = &cpi->sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int i;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *comp_inter_cost =
      mode_costs->comp_inter_cost[av1_get_reference_mode_context(xd)];

  InterModeSearchState search_state;
  init_inter_mode_search_state(&search_state, cpi, x, bsize, best_rd_so_far);
  INTERINTRA_MODE interintra_modes[REF_FRAMES] = {
    INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES,
    INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES
  };
  HandleInterModeArgs args = { { NULL },
                               { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE },
                               { NULL },
                               { MAX_SB_SIZE >> 1, MAX_SB_SIZE >> 1,
                                 MAX_SB_SIZE >> 1 },
                               NULL,
                               NULL,
                               NULL,
                               search_state.modelled_rd,
                               INT_MAX,
                               INT_MAX,
                               search_state.simple_rd,
                               0,
                               false,
                               interintra_modes,
                               { { { 0 }, { { 0 } }, { 0 }, 0, 0, 0, 0 } },
                               { { 0, 0 } },
                               { 0 },
                               0,
                               0,
                               -1,
                               -1,
                               -1,
                               { 0 },
                               { 0 },
                               UINT_MAX };
  // Currently, is_low_temp_var is used in real time encoding.
  const int is_low_temp_var = get_block_temp_var(cpi, x, bsize);

  for (i = 0; i < MODE_CTX_REF_FRAMES; ++i) args.cmp_mode[i] = -1;
  // Indicates the appropriate number of simple translation winner modes for
  // exhaustive motion mode evaluation
  const int max_winner_motion_mode_cand =
      num_winner_motion_modes[sf->winner_mode_sf.motion_mode_for_winner_cand];
  assert(max_winner_motion_mode_cand <= MAX_WINNER_MOTION_MODES);
  motion_mode_candidate motion_mode_cand;
  motion_mode_best_st_candidate best_motion_mode_cands;
  // Initializing the number of motion mode candidates to zero.
  best_motion_mode_cands.num_motion_mode_cand = 0;
  for (i = 0; i < MAX_WINNER_MOTION_MODES; ++i)
    best_motion_mode_cands.motion_mode_cand[i].rd_cost = INT64_MAX;

  for (i = 0; i < REF_FRAMES; ++i) x->pred_sse[i] = INT_MAX;

  av1_invalid_rd_stats(rd_cost);

  for (i = 0; i < REF_FRAMES; ++i) {
    x->warp_sample_info[i].num = -1;
  }

  // Ref frames that are selected by square partition blocks.
  int picked_ref_frames_mask = 0;
  if (sf->inter_sf.prune_ref_frame_for_rect_partitions &&
      mbmi->partition != PARTITION_NONE) {
    // prune_ref_frame_for_rect_partitions = 1 implies prune only extended
    // partition blocks. prune_ref_frame_for_rect_partitions >=2
    // implies prune for vert, horiz and extended partition blocks.
    if ((mbmi->partition != PARTITION_VERT &&
         mbmi->partition != PARTITION_HORZ) ||
        sf->inter_sf.prune_ref_frame_for_rect_partitions >= 2) {
      picked_ref_frames_mask =
          fetch_picked_ref_frames_mask(x, bsize, cm->seq_params->mib_size);
    }
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, set_params_rd_pick_inter_mode_time);
#endif
  // Skip ref frames that never selected by square blocks.
  const int skip_ref_frame_mask =
      picked_ref_frames_mask ? ~picked_ref_frames_mask : 0;
  mode_skip_mask_t mode_skip_mask;
  unsigned int ref_costs_single[REF_FRAMES];
  unsigned int ref_costs_comp[REF_FRAMES][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  // init params, set frame modes, speed features
  set_params_rd_pick_inter_mode(cpi, x, &args, bsize, &mode_skip_mask,
                                skip_ref_frame_mask, ref_costs_single,
                                ref_costs_comp, yv12_mb);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, set_params_rd_pick_inter_mode_time);
#endif

  int64_t best_est_rd = INT64_MAX;
  const InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
  // If do_tx_search is 0, only estimated RD should be computed.
  // If do_tx_search is 1, all modes have TX search performed.
  const int do_tx_search =
      !((sf->inter_sf.inter_mode_rd_model_estimation == 1 && md->ready) ||
        (sf->inter_sf.inter_mode_rd_model_estimation == 2 &&
         num_pels_log2_lookup[bsize] > 8));
  InterModesInfo *inter_modes_info = x->inter_modes_info;
  inter_modes_info->num = 0;

  // Temporary buffers used by handle_inter_mode().
  uint8_t *const tmp_buf = get_buf_by_bd(xd, x->tmp_pred_bufs[0]);

  // The best RD found for the reference frame, among single reference modes.
  // Note that the 0-th element will contain a cut-off that is later used
  // to determine if we should skip a compound mode.
  int64_t ref_frame_rd[REF_FRAMES] = { INT64_MAX, INT64_MAX, INT64_MAX,
                                       INT64_MAX, INT64_MAX, INT64_MAX,
                                       INT64_MAX, INT64_MAX };

  // Prepared stats used later to check if we could skip intra mode eval.
  int64_t inter_cost = -1;
  int64_t intra_cost = -1;
  // Need to tweak the threshold for hdres speed 0 & 1.
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Obtain the relevant tpl stats for pruning inter modes
  PruneInfoFromTpl inter_cost_info_from_tpl;
#if !CONFIG_REALTIME_ONLY
  if (sf->inter_sf.prune_inter_modes_based_on_tpl) {
    // x->tpl_keep_ref_frame[id] = 1 => no pruning in
    // prune_ref_by_selective_ref_frame()
    // x->tpl_keep_ref_frame[id] = 0  => ref frame can be pruned in
    // prune_ref_by_selective_ref_frame()
    // Populating valid_refs[idx] = 1 ensures that
    // 'inter_cost_info_from_tpl.best_inter_cost' does not correspond to a
    // pruned ref frame.
    int valid_refs[INTER_REFS_PER_FRAME];
    for (MV_REFERENCE_FRAME frame = LAST_FRAME; frame < REF_FRAMES; frame++) {
      const MV_REFERENCE_FRAME refs[2] = { frame, NONE_FRAME };
      valid_refs[frame - 1] =
          x->tpl_keep_ref_frame[frame] ||
          !prune_ref_by_selective_ref_frame(
              cpi, x, refs, cm->cur_frame->ref_display_order_hint);
    }
    av1_zero(inter_cost_info_from_tpl);
    get_block_level_tpl_stats(cpi, bsize, mi_row, mi_col, valid_refs,
                              &inter_cost_info_from_tpl);
  }

  const int do_pruning =
      (AOMMIN(cm->width, cm->height) > 480 && cpi->speed <= 1) ? 0 : 1;
  if (do_pruning && sf->intra_sf.skip_intra_in_interframe &&
      cpi->oxcf.algo_cfg.enable_tpl_model)
    calculate_cost_from_tpl_data(cpi, x, bsize, mi_row, mi_col, &inter_cost,
                                 &intra_cost);
#endif  // !CONFIG_REALTIME_ONLY

  // Initialize best mode stats for winner mode processing.
  const int max_winner_mode_count =
      winner_mode_count_allowed[sf->winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;
  store_winner_mode_stats(&cpi->common, x, mbmi, NULL, NULL, NULL, THR_INVALID,
                          NULL, bsize, best_rd_so_far,
                          sf->winner_mode_sf.multi_winner_mode_type, 0);

  int mode_thresh_mul_fact = (1 << MODE_THRESH_QBITS);
  if (sf->inter_sf.prune_inter_modes_if_skippable) {
    // Higher multiplication factor values for lower quantizers.
    mode_thresh_mul_fact = mode_threshold_mul_factor[x->qindex];
  }

  // Initialize arguments for mode loop speed features
  InterModeSFArgs sf_args = { &args.skip_motion_mode,
                              &mode_skip_mask,
                              &search_state,
                              skip_ref_frame_mask,
                              0,
                              mode_thresh_mul_fact,
                              0,
                              0 };
  int64_t best_inter_yrd = INT64_MAX;

  // This is the main loop of this function. It loops over all possible inter
  // modes and calls handle_inter_mode() to compute the RD for each.
  // Here midx is just an iterator index that should not be used by itself
  // except to keep track of the number of modes searched. It should be used
  // with av1_default_mode_order to get the enum that defines the mode, which
  // can be used with av1_mode_defs to get the prediction mode and the ref
  // frames.
  // TODO(yunqing, any): Setting mode_start and mode_end outside for-loop brings
  // good speedup for real time case. If we decide to use compound mode in real
  // time, maybe we can modify av1_default_mode_order table.
  THR_MODES mode_start = THR_INTER_MODE_START;
  THR_MODES mode_end = THR_INTER_MODE_END;
  const CurrentFrame *const current_frame = &cm->current_frame;
  if (current_frame->reference_mode == SINGLE_REFERENCE) {
    mode_start = SINGLE_REF_MODE_START;
    mode_end = SINGLE_REF_MODE_END;
  }

  for (THR_MODES midx = mode_start; midx < mode_end; ++midx) {
    // Get the actual prediction mode we are trying in this iteration
    const THR_MODES mode_enum = av1_default_mode_order[midx];
    const MODE_DEFINITION *mode_def = &av1_mode_defs[mode_enum];
    const PREDICTION_MODE this_mode = mode_def->mode;
    const MV_REFERENCE_FRAME *ref_frames = mode_def->ref_frame;

    const MV_REFERENCE_FRAME ref_frame = ref_frames[0];
    const MV_REFERENCE_FRAME second_ref_frame = ref_frames[1];
    const int is_single_pred =
        ref_frame > INTRA_FRAME && second_ref_frame == NONE_FRAME;
    const int comp_pred = second_ref_frame > INTRA_FRAME;

    init_mbmi(mbmi, this_mode, ref_frames, cm);

    txfm_info->skip_txfm = 0;
    sf_args.num_single_modes_processed += is_single_pred;
    set_ref_ptrs(cm, xd, ref_frame, second_ref_frame);
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, skip_inter_mode_time);
#endif
    // Apply speed features to decide if this inter mode can be skipped
    const int is_skip_inter_mode = skip_inter_mode(
        cpi, x, bsize, ref_frame_rd, midx, &sf_args, is_low_temp_var);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, skip_inter_mode_time);
#endif
    if (is_skip_inter_mode) continue;

    // Select prediction reference frames.
    for (i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = yv12_mb[ref_frame][i];
      if (comp_pred) xd->plane[i].pre[1] = yv12_mb[second_ref_frame][i];
    }

    mbmi->angle_delta[PLANE_TYPE_Y] = 0;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;
    mbmi->ref_mv_idx = 0;

    const int64_t ref_best_rd = search_state.best_rd;
    RD_STATS rd_stats, rd_stats_y, rd_stats_uv;
    av1_init_rd_stats(&rd_stats);

    const int ref_frame_cost = comp_pred
                                   ? ref_costs_comp[ref_frame][second_ref_frame]
                                   : ref_costs_single[ref_frame];
    const int compmode_cost =
        is_comp_ref_allowed(mbmi->bsize) ? comp_inter_cost[comp_pred] : 0;
    const int real_compmode_cost =
        cm->current_frame.reference_mode == REFERENCE_MODE_SELECT
            ? compmode_cost
            : 0;
    // Point to variables that are maintained between loop iterations
    args.single_newmv = search_state.single_newmv;
    args.single_newmv_rate = search_state.single_newmv_rate;
    args.single_newmv_valid = search_state.single_newmv_valid;
    args.single_comp_cost = real_compmode_cost;
    args.ref_frame_cost = ref_frame_cost;
    args.best_pred_sse = search_state.best_pred_sse;
    args.skip_ifs = skip_interp_filter_search(cpi, is_single_pred);

    if (!frame_is_kf_gf_arf(cpi) && cpi->oxcf.algo_cfg.sharpness == 3) {
      if (ref_frame != ALTREF_FRAME && ref_frame != GOLDEN_FRAME &&
          ref_frame != INTRA_FRAME)
        continue;
    }

    int64_t skip_rd[2] = { search_state.best_skip_rd[0],
                           search_state.best_skip_rd[1] };
    int64_t this_yrd = INT64_MAX;
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, handle_inter_mode_time);
#endif
    int64_t this_rd = handle_inter_mode(
        cpi, tile_data, x, bsize, &rd_stats, &rd_stats_y, &rd_stats_uv, &args,
        ref_best_rd, tmp_buf, &x->comp_rd_buffer, &best_est_rd, do_tx_search,
        inter_modes_info, &motion_mode_cand, skip_rd, &inter_cost_info_from_tpl,
        &this_yrd);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, handle_inter_mode_time);
#endif
    if (current_frame->reference_mode != SINGLE_REFERENCE) {
      if (!args.skip_ifs &&
          sf->inter_sf.prune_comp_search_by_single_result > 0 &&
          is_inter_singleref_mode(this_mode)) {
        collect_single_states(x, &search_state, mbmi);
      }

      if (sf->inter_sf.prune_comp_using_best_single_mode_ref > 0 &&
          is_inter_singleref_mode(this_mode))
        update_best_single_mode(&search_state, this_mode, ref_frame, this_rd);
    }

    if (this_rd == INT64_MAX) continue;

    if (mbmi->skip_txfm) {
      rd_stats_y.rate = 0;
      rd_stats_uv.rate = 0;
    }

    if (sf->inter_sf.prune_compound_using_single_ref && is_single_pred &&
        this_rd < ref_frame_rd[ref_frame]) {
      ref_frame_rd[ref_frame] = this_rd;
    }

    adjust_cost(cpi, x, &this_rd);
    adjust_rdcost(cpi, x, &rd_stats);

    // Did this mode help, i.e., is it the new best mode
    if (this_rd < search_state.best_rd) {
      assert(IMPLIES(comp_pred,
                     cm->current_frame.reference_mode != SINGLE_REFERENCE));
      search_state.best_pred_sse = x->pred_sse[ref_frame];
      best_inter_yrd = this_yrd;
      update_search_state(&search_state, rd_cost, ctx, &rd_stats, &rd_stats_y,
                          &rd_stats_uv, mode_enum, x, do_tx_search);
      if (do_tx_search) search_state.best_skip_rd[0] = skip_rd[0];
      // skip_rd[0] is the best total rd for a skip mode so far.
      // skip_rd[1] is the best total rd for a skip mode so far in luma.
      // When do_tx_search = 1, both skip_rd[0] and skip_rd[1] are updated.
      // When do_tx_search = 0, skip_rd[1] is updated.
      search_state.best_skip_rd[1] = skip_rd[1];
    }
    if (sf->winner_mode_sf.motion_mode_for_winner_cand) {
      // Add this mode to motion mode candidate list for motion mode search
      // if using motion_mode_for_winner_cand speed feature
      handle_winner_cand(mbmi, &best_motion_mode_cands,
                         max_winner_motion_mode_cand, this_rd,
                         &motion_mode_cand, args.skip_motion_mode);
    }

    /* keep record of best compound/single-only prediction */
    record_best_compound(cm->current_frame.reference_mode, &rd_stats, comp_pred,
                         x->rdmult, &search_state, compmode_cost);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, evaluate_motion_mode_for_winner_candidates_time);
#endif
  if (sf->winner_mode_sf.motion_mode_for_winner_cand) {
    // For the single ref winner candidates, evaluate other motion modes (non
    // simple translation).
    evaluate_motion_mode_for_winner_candidates(
        cpi, x, rd_cost, &args, tile_data, ctx, yv12_mb,
        &best_motion_mode_cands, do_tx_search, bsize, &best_est_rd,
        &search_state, &best_inter_yrd);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, evaluate_motion_mode_for_winner_candidates_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, do_tx_search_time);
#endif
  if (do_tx_search != 1) {
    // A full tx search has not yet been done, do tx search for
    // top mode candidates
    tx_search_best_inter_candidates(cpi, tile_data, x, best_rd_so_far, bsize,
                                    yv12_mb, mi_row, mi_col, &search_state,
                                    rd_cost, ctx, &best_inter_yrd);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, do_tx_search_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, handle_intra_mode_time);
#endif
  // Gate intra mode evaluation if best of inter is skip except when source
  // variance is extremely low and also based on max intra bsize.
  skip_intra_modes_in_interframe(cm, x, bsize, &search_state, sf, inter_cost,
                                 intra_cost);

  const unsigned int intra_ref_frame_cost = ref_costs_single[INTRA_FRAME];
  search_intra_modes_in_interframe(&search_state, cpi, x, rd_cost, bsize, ctx,
                                   &sf_args, intra_ref_frame_cost,
                                   best_inter_yrd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, handle_intra_mode_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, refine_winner_mode_tx_time);
#endif
  int winner_mode_count =
      sf->winner_mode_sf.multi_winner_mode_type ? x->winner_mode_count : 1;
  // In effect only when fast tx search speed features are enabled.
  refine_winner_mode_tx(
      cpi, x, rd_cost, bsize, ctx, &search_state.best_mode_index,
      &search_state.best_mbmode, yv12_mb, search_state.best_rate_y,
      search_state.best_rate_uv, &search_state.best_skip2, winner_mode_count);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, refine_winner_mode_tx_time);
#endif

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  // Only try palette mode when the best mode so far is an intra mode.
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(features->allow_screen_content_tools, mbmi->bsize) &&
      !is_inter_mode(search_state.best_mbmode.mode) && rd_cost->rate != INT_MAX;
  RD_STATS this_rd_cost;
  int this_skippable = 0;
  if (try_palette) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_search_palette_mode_time);
#endif
    this_skippable = av1_search_palette_mode(
        &search_state.intra_search_state, cpi, x, bsize, intra_ref_frame_cost,
        ctx, &this_rd_cost, search_state.best_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_search_palette_mode_time);
#endif
    if (this_rd_cost.rdcost < search_state.best_rd) {
      search_state.best_mode_index = THR_DC;
      mbmi->mv[0].as_int = 0;
      rd_cost->rate = this_rd_cost.rate;
      rd_cost->dist = this_rd_cost.dist;
      rd_cost->rdcost = this_rd_cost.rdcost;
      search_state.best_rd = rd_cost->rdcost;
      search_state.best_mbmode = *mbmi;
      search_state.best_skip2 = 0;
      search_state.best_mode_skippable = this_skippable;
      memcpy(ctx->blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  search_state.best_mbmode.skip_mode = 0;
  if (cm->current_frame.skip_mode_info.skip_mode_flag &&
      is_comp_ref_allowed(bsize)) {
    const struct segmentation *const seg = &cm->seg;
    unsigned char segment_id = mbmi->segment_id;
    if (!segfeature_active(seg, segment_id, SEG_LVL_REF_FRAME)) {
      rd_pick_skip_mode(rd_cost, &search_state, cpi, x, bsize, yv12_mb);
    }
  }

  // Make sure that the ref_mv_idx is only nonzero when we're
  // using a mode which can support ref_mv_idx
  if (search_state.best_mbmode.ref_mv_idx != 0 &&
      !(search_state.best_mbmode.mode == NEWMV ||
        search_state.best_mbmode.mode == NEW_NEWMV ||
        have_nearmv_in_inter_mode(search_state.best_mbmode.mode))) {
    search_state.best_mbmode.ref_mv_idx = 0;
  }

  if (search_state.best_mode_index == THR_INVALID ||
      search_state.best_rd >= best_rd_so_far) {
    rd_cost->rate = INT_MAX;
    rd_cost->rdcost = INT64_MAX;
    return;
  }

  const InterpFilter interp_filter = features->interp_filter;
  assert((interp_filter == SWITCHABLE) ||
         (interp_filter ==
          search_state.best_mbmode.interp_filters.as_filters.y_filter) ||
         !is_inter_block(&search_state.best_mbmode));
  assert((interp_filter == SWITCHABLE) ||
         (interp_filter ==
          search_state.best_mbmode.interp_filters.as_filters.x_filter) ||
         !is_inter_block(&search_state.best_mbmode));

  if (!cpi->rc.is_src_frame_alt_ref && sf->inter_sf.adaptive_rd_thresh) {
    av1_update_rd_thresh_fact(
        cm, x->thresh_freq_fact, sf->inter_sf.adaptive_rd_thresh, bsize,
        search_state.best_mode_index, mode_start, mode_end, THR_DC, MAX_MODES);
  }

  // macroblock modes
  *mbmi = search_state.best_mbmode;
  txfm_info->skip_txfm |= search_state.best_skip2;

  // Note: this section is needed since the mode may have been forced to
  // GLOBALMV by the all-zero mode handling of ref-mv.
  if (mbmi->mode == GLOBALMV || mbmi->mode == GLOBAL_GLOBALMV) {
    // Correct the interp filters for GLOBALMV
    if (is_nontrans_global_motion(xd, xd->mi[0])) {
      int_interpfilters filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      assert(mbmi->interp_filters.as_int == filters.as_int);
      (void)filters;
    }
  }

  txfm_info->skip_txfm |= search_state.best_mode_skippable;

  assert(search_state.best_mode_index != THR_INVALID);

#if CONFIG_INTERNAL_STATS
  store_coding_context(x, ctx, search_state.best_mode_index,
                       search_state.best_mode_skippable);
#else
  store_coding_context(x, ctx, search_state.best_mode_skippable);
#endif  // CONFIG_INTERNAL_STATS

  if (mbmi->palette_mode_info.palette_size[1] > 0) {
    assert(try_palette);
    av1_restore_uv_color_map(cpi, x);
  }
}